

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  Primitive PVar2;
  uint uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  RTCRayQueryContext *pRVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  int iVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [60];
  undefined1 auVar69 [60];
  undefined1 auVar70 [12];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  byte bVar96;
  byte bVar97;
  byte bVar98;
  ulong uVar99;
  byte bVar100;
  byte bVar101;
  byte bVar102;
  ulong uVar103;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  uint uVar104;
  long lVar105;
  bool bVar106;
  ulong uVar107;
  uint uVar108;
  uint uVar171;
  uint uVar172;
  uint uVar174;
  uint uVar175;
  uint uVar176;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  uint uVar173;
  uint uVar177;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar170 [64];
  float pp;
  float fVar178;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [64];
  float fVar229;
  float fVar230;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [64];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [16];
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  undefined1 auVar252 [32];
  float fVar259;
  float fVar262;
  float fVar263;
  float fVar264;
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar265 [16];
  undefined1 auVar266 [64];
  float t;
  float fVar267;
  float fVar272;
  undefined1 auVar268 [16];
  float fVar270;
  float fVar271;
  undefined1 auVar269 [64];
  float s;
  undefined1 auVar274 [32];
  undefined1 auVar273 [16];
  undefined1 auVar275 [64];
  float s_1;
  undefined1 auVar276 [32];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  float local_bb0;
  RTCFilterFunctionNArguments local_b70;
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [16];
  undefined1 (*local_ae8) [32];
  Primitive *local_ae0;
  ulong local_ad8;
  ulong local_ad0;
  ulong local_ac8;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [16];
  float local_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [64];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined4 local_7c0;
  undefined4 uStack_7bc;
  undefined4 uStack_7b8;
  undefined4 uStack_7b4;
  undefined4 uStack_7b0;
  undefined4 uStack_7ac;
  undefined4 uStack_7a8;
  undefined4 uStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined4 uStack_684;
  undefined4 local_680;
  undefined4 uStack_67c;
  undefined4 uStack_678;
  undefined4 uStack_674;
  undefined4 uStack_670;
  undefined4 uStack_66c;
  undefined4 uStack_668;
  undefined4 uStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined4 local_600;
  undefined4 uStack_5fc;
  undefined4 uStack_5f8;
  undefined4 uStack_5f4;
  undefined4 uStack_5f0;
  undefined4 uStack_5ec;
  undefined4 uStack_5e8;
  undefined4 uStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined4 local_580;
  undefined4 uStack_57c;
  undefined4 uStack_578;
  undefined4 uStack_574;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  undefined4 uStack_568;
  undefined4 uStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  uint auStack_180 [7];
  float fStack_164;
  undefined8 uStack_160;
  float afStack_158 [74];
  undefined1 auVar165 [64];
  undefined1 auVar169 [64];
  
  PVar2 = prim[1];
  uVar103 = (ulong)(byte)PVar2;
  fVar230 = *(float *)(prim + uVar103 * 0x19 + 0x12);
  auVar111 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar111 = vinsertps_avx(auVar111,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar21 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar116 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar251 = vsubps_avx(auVar111,*(undefined1 (*) [16])(prim + uVar103 * 0x19 + 6));
  fVar229 = fVar230 * auVar251._0_4_;
  fVar178 = fVar230 * auVar116._0_4_;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *(ulong *)(prim + uVar103 * 4 + 6);
  auVar126 = vpmovsxbd_avx2(auVar111);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar103 * 5 + 6);
  auVar124 = vpmovsxbd_avx2(auVar21);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + uVar103 * 6 + 6);
  auVar127 = vpmovsxbd_avx2(auVar109);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + uVar103 * 0xb + 6);
  auVar128 = vpmovsxbd_avx2(auVar113);
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6);
  auVar133 = vpmovsxbd_avx2(auVar112);
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar129 = vcvtdq2ps_avx(auVar133);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + (uint)(byte)PVar2 * 0xc + uVar103 + 6);
  auVar125 = vpmovsxbd_avx2(auVar110);
  auVar125 = vcvtdq2ps_avx(auVar125);
  uVar107 = (ulong)(uint)((int)(uVar103 * 9) * 2);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)(prim + uVar107 + 6);
  auVar130 = vpmovsxbd_avx2(auVar114);
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar115._8_8_ = 0;
  auVar115._0_8_ = *(ulong *)(prim + uVar107 + uVar103 + 6);
  auVar131 = vpmovsxbd_avx2(auVar115);
  auVar131 = vcvtdq2ps_avx(auVar131);
  uVar99 = (ulong)(uint)((int)(uVar103 * 5) << 2);
  auVar268._8_8_ = 0;
  auVar268._0_8_ = *(ulong *)(prim + uVar99 + 6);
  auVar123 = vpmovsxbd_avx2(auVar268);
  auVar132 = vcvtdq2ps_avx(auVar123);
  auVar144._4_4_ = fVar178;
  auVar144._0_4_ = fVar178;
  auVar144._8_4_ = fVar178;
  auVar144._12_4_ = fVar178;
  auVar144._16_4_ = fVar178;
  auVar144._20_4_ = fVar178;
  auVar144._24_4_ = fVar178;
  auVar144._28_4_ = fVar178;
  auVar145._8_4_ = 1;
  auVar145._0_8_ = 0x100000001;
  auVar145._12_4_ = 1;
  auVar145._16_4_ = 1;
  auVar145._20_4_ = 1;
  auVar145._24_4_ = 1;
  auVar145._28_4_ = 1;
  auVar121 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar135 = ZEXT1632(CONCAT412(fVar230 * auVar116._12_4_,
                                CONCAT48(fVar230 * auVar116._8_4_,
                                         CONCAT44(fVar230 * auVar116._4_4_,fVar178))));
  auVar134 = vpermps_avx2(auVar145,auVar135);
  auVar122 = vpermps_avx512vl(auVar121,auVar135);
  fVar178 = auVar122._0_4_;
  fVar253 = auVar122._4_4_;
  auVar135._4_4_ = fVar253 * auVar127._4_4_;
  auVar135._0_4_ = fVar178 * auVar127._0_4_;
  fVar254 = auVar122._8_4_;
  auVar135._8_4_ = fVar254 * auVar127._8_4_;
  fVar255 = auVar122._12_4_;
  auVar135._12_4_ = fVar255 * auVar127._12_4_;
  fVar258 = auVar122._16_4_;
  auVar135._16_4_ = fVar258 * auVar127._16_4_;
  fVar256 = auVar122._20_4_;
  auVar135._20_4_ = fVar256 * auVar127._20_4_;
  fVar257 = auVar122._24_4_;
  auVar135._24_4_ = fVar257 * auVar127._24_4_;
  auVar135._28_4_ = auVar133._28_4_;
  auVar133._4_4_ = auVar125._4_4_ * fVar253;
  auVar133._0_4_ = auVar125._0_4_ * fVar178;
  auVar133._8_4_ = auVar125._8_4_ * fVar254;
  auVar133._12_4_ = auVar125._12_4_ * fVar255;
  auVar133._16_4_ = auVar125._16_4_ * fVar258;
  auVar133._20_4_ = auVar125._20_4_ * fVar256;
  auVar133._24_4_ = auVar125._24_4_ * fVar257;
  auVar133._28_4_ = auVar123._28_4_;
  auVar123._4_4_ = auVar132._4_4_ * fVar253;
  auVar123._0_4_ = auVar132._0_4_ * fVar178;
  auVar123._8_4_ = auVar132._8_4_ * fVar254;
  auVar123._12_4_ = auVar132._12_4_ * fVar255;
  auVar123._16_4_ = auVar132._16_4_ * fVar258;
  auVar123._20_4_ = auVar132._20_4_ * fVar256;
  auVar123._24_4_ = auVar132._24_4_ * fVar257;
  auVar123._28_4_ = auVar122._28_4_;
  auVar111 = vfmadd231ps_fma(auVar135,auVar134,auVar124);
  auVar21 = vfmadd231ps_fma(auVar133,auVar134,auVar129);
  auVar109 = vfmadd231ps_fma(auVar123,auVar131,auVar134);
  auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar144,auVar126);
  auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar144,auVar128);
  auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar130,auVar144);
  auVar138._4_4_ = fVar229;
  auVar138._0_4_ = fVar229;
  auVar138._8_4_ = fVar229;
  auVar138._12_4_ = fVar229;
  auVar138._16_4_ = fVar229;
  auVar138._20_4_ = fVar229;
  auVar138._24_4_ = fVar229;
  auVar138._28_4_ = fVar229;
  auVar123 = ZEXT1632(CONCAT412(fVar230 * auVar251._12_4_,
                                CONCAT48(fVar230 * auVar251._8_4_,
                                         CONCAT44(fVar230 * auVar251._4_4_,fVar229))));
  auVar133 = vpermps_avx2(auVar145,auVar123);
  auVar123 = vpermps_avx512vl(auVar121,auVar123);
  fVar230 = auVar123._0_4_;
  fVar178 = auVar123._4_4_;
  auVar134._4_4_ = fVar178 * auVar127._4_4_;
  auVar134._0_4_ = fVar230 * auVar127._0_4_;
  fVar253 = auVar123._8_4_;
  auVar134._8_4_ = fVar253 * auVar127._8_4_;
  fVar254 = auVar123._12_4_;
  auVar134._12_4_ = fVar254 * auVar127._12_4_;
  fVar255 = auVar123._16_4_;
  auVar134._16_4_ = fVar255 * auVar127._16_4_;
  fVar258 = auVar123._20_4_;
  auVar134._20_4_ = fVar258 * auVar127._20_4_;
  fVar256 = auVar123._24_4_;
  auVar134._24_4_ = fVar256 * auVar127._24_4_;
  auVar134._28_4_ = 1;
  auVar121._4_4_ = auVar125._4_4_ * fVar178;
  auVar121._0_4_ = auVar125._0_4_ * fVar230;
  auVar121._8_4_ = auVar125._8_4_ * fVar253;
  auVar121._12_4_ = auVar125._12_4_ * fVar254;
  auVar121._16_4_ = auVar125._16_4_ * fVar255;
  auVar121._20_4_ = auVar125._20_4_ * fVar258;
  auVar121._24_4_ = auVar125._24_4_ * fVar256;
  auVar121._28_4_ = auVar127._28_4_;
  auVar125._4_4_ = auVar132._4_4_ * fVar178;
  auVar125._0_4_ = auVar132._0_4_ * fVar230;
  auVar125._8_4_ = auVar132._8_4_ * fVar253;
  auVar125._12_4_ = auVar132._12_4_ * fVar254;
  auVar125._16_4_ = auVar132._16_4_ * fVar255;
  auVar125._20_4_ = auVar132._20_4_ * fVar258;
  auVar125._24_4_ = auVar132._24_4_ * fVar256;
  auVar125._28_4_ = auVar123._28_4_;
  auVar113 = vfmadd231ps_fma(auVar134,auVar133,auVar124);
  auVar112 = vfmadd231ps_fma(auVar121,auVar133,auVar129);
  auVar110 = vfmadd231ps_fma(auVar125,auVar133,auVar131);
  auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar138,auVar126);
  auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar138,auVar128);
  auVar141._8_4_ = 0x7fffffff;
  auVar141._0_8_ = 0x7fffffff7fffffff;
  auVar141._12_4_ = 0x7fffffff;
  auVar141._16_4_ = 0x7fffffff;
  auVar141._20_4_ = 0x7fffffff;
  auVar141._24_4_ = 0x7fffffff;
  auVar141._28_4_ = 0x7fffffff;
  auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar138,auVar130);
  auVar126 = vandps_avx(ZEXT1632(auVar111),auVar141);
  auVar143._8_4_ = 0x219392ef;
  auVar143._0_8_ = 0x219392ef219392ef;
  auVar143._12_4_ = 0x219392ef;
  auVar143._16_4_ = 0x219392ef;
  auVar143._20_4_ = 0x219392ef;
  auVar143._24_4_ = 0x219392ef;
  auVar143._28_4_ = 0x219392ef;
  uVar107 = vcmpps_avx512vl(auVar126,auVar143,1);
  bVar7 = (bool)((byte)uVar107 & 1);
  auVar122._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar111._0_4_;
  bVar7 = (bool)((byte)(uVar107 >> 1) & 1);
  auVar122._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar111._4_4_;
  bVar7 = (bool)((byte)(uVar107 >> 2) & 1);
  auVar122._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar111._8_4_;
  bVar7 = (bool)((byte)(uVar107 >> 3) & 1);
  auVar122._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar111._12_4_;
  auVar122._16_4_ = (uint)((byte)(uVar107 >> 4) & 1) * 0x219392ef;
  auVar122._20_4_ = (uint)((byte)(uVar107 >> 5) & 1) * 0x219392ef;
  auVar122._24_4_ = (uint)((byte)(uVar107 >> 6) & 1) * 0x219392ef;
  auVar122._28_4_ = (uint)(byte)(uVar107 >> 7) * 0x219392ef;
  auVar126 = vandps_avx(ZEXT1632(auVar21),auVar141);
  uVar107 = vcmpps_avx512vl(auVar126,auVar143,1);
  bVar7 = (bool)((byte)uVar107 & 1);
  auVar136._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar21._0_4_;
  bVar7 = (bool)((byte)(uVar107 >> 1) & 1);
  auVar136._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar21._4_4_;
  bVar7 = (bool)((byte)(uVar107 >> 2) & 1);
  auVar136._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar21._8_4_;
  bVar7 = (bool)((byte)(uVar107 >> 3) & 1);
  auVar136._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar21._12_4_;
  auVar136._16_4_ = (uint)((byte)(uVar107 >> 4) & 1) * 0x219392ef;
  auVar136._20_4_ = (uint)((byte)(uVar107 >> 5) & 1) * 0x219392ef;
  auVar136._24_4_ = (uint)((byte)(uVar107 >> 6) & 1) * 0x219392ef;
  auVar136._28_4_ = (uint)(byte)(uVar107 >> 7) * 0x219392ef;
  auVar126 = vandps_avx(ZEXT1632(auVar109),auVar141);
  uVar107 = vcmpps_avx512vl(auVar126,auVar143,1);
  bVar7 = (bool)((byte)uVar107 & 1);
  auVar126._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar109._0_4_;
  bVar7 = (bool)((byte)(uVar107 >> 1) & 1);
  auVar126._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar109._4_4_;
  bVar7 = (bool)((byte)(uVar107 >> 2) & 1);
  auVar126._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar109._8_4_;
  bVar7 = (bool)((byte)(uVar107 >> 3) & 1);
  auVar126._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar109._12_4_;
  auVar126._16_4_ = (uint)((byte)(uVar107 >> 4) & 1) * 0x219392ef;
  auVar126._20_4_ = (uint)((byte)(uVar107 >> 5) & 1) * 0x219392ef;
  auVar126._24_4_ = (uint)((byte)(uVar107 >> 6) & 1) * 0x219392ef;
  auVar126._28_4_ = (uint)(byte)(uVar107 >> 7) * 0x219392ef;
  auVar124 = vrcp14ps_avx512vl(auVar122);
  auVar142._8_4_ = 0x3f800000;
  auVar142._0_8_ = &DAT_3f8000003f800000;
  auVar142._12_4_ = 0x3f800000;
  auVar142._16_4_ = 0x3f800000;
  auVar142._20_4_ = 0x3f800000;
  auVar142._24_4_ = 0x3f800000;
  auVar142._28_4_ = 0x3f800000;
  auVar111 = vfnmadd213ps_fma(auVar122,auVar124,auVar142);
  auVar111 = vfmadd132ps_fma(ZEXT1632(auVar111),auVar124,auVar124);
  auVar124 = vrcp14ps_avx512vl(auVar136);
  auVar21 = vfnmadd213ps_fma(auVar136,auVar124,auVar142);
  auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar124,auVar124);
  auVar124 = vrcp14ps_avx512vl(auVar126);
  auVar109 = vfnmadd213ps_fma(auVar126,auVar124,auVar142);
  auVar109 = vfmadd132ps_fma(ZEXT1632(auVar109),auVar124,auVar124);
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar103 * 7 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar113));
  auVar130._4_4_ = auVar111._4_4_ * auVar126._4_4_;
  auVar130._0_4_ = auVar111._0_4_ * auVar126._0_4_;
  auVar130._8_4_ = auVar111._8_4_ * auVar126._8_4_;
  auVar130._12_4_ = auVar111._12_4_ * auVar126._12_4_;
  auVar130._16_4_ = auVar126._16_4_ * 0.0;
  auVar130._20_4_ = auVar126._20_4_ * 0.0;
  auVar130._24_4_ = auVar126._24_4_ * 0.0;
  auVar130._28_4_ = auVar126._28_4_;
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar103 * 9 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar113));
  auVar125 = vpbroadcastd_avx512vl();
  auVar124 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar2 * 0x10 + 6));
  auVar140._0_4_ = auVar111._0_4_ * auVar126._0_4_;
  auVar140._4_4_ = auVar111._4_4_ * auVar126._4_4_;
  auVar140._8_4_ = auVar111._8_4_ * auVar126._8_4_;
  auVar140._12_4_ = auVar111._12_4_ * auVar126._12_4_;
  auVar140._16_4_ = auVar126._16_4_ * 0.0;
  auVar140._20_4_ = auVar126._20_4_ * 0.0;
  auVar140._24_4_ = auVar126._24_4_ * 0.0;
  auVar140._28_4_ = 0;
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar2 * 0x10 + uVar103 * -2 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar112));
  auVar131._4_4_ = auVar21._4_4_ * auVar126._4_4_;
  auVar131._0_4_ = auVar21._0_4_ * auVar126._0_4_;
  auVar131._8_4_ = auVar21._8_4_ * auVar126._8_4_;
  auVar131._12_4_ = auVar21._12_4_ * auVar126._12_4_;
  auVar131._16_4_ = auVar126._16_4_ * 0.0;
  auVar131._20_4_ = auVar126._20_4_ * 0.0;
  auVar131._24_4_ = auVar126._24_4_ * 0.0;
  auVar131._28_4_ = auVar126._28_4_;
  auVar126 = vcvtdq2ps_avx(auVar124);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar112));
  auVar139._0_4_ = auVar21._0_4_ * auVar126._0_4_;
  auVar139._4_4_ = auVar21._4_4_ * auVar126._4_4_;
  auVar139._8_4_ = auVar21._8_4_ * auVar126._8_4_;
  auVar139._12_4_ = auVar21._12_4_ * auVar126._12_4_;
  auVar139._16_4_ = auVar126._16_4_ * 0.0;
  auVar139._20_4_ = auVar126._20_4_ * 0.0;
  auVar139._24_4_ = auVar126._24_4_ * 0.0;
  auVar139._28_4_ = 0;
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 + uVar103 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar110));
  auVar132._4_4_ = auVar126._4_4_ * auVar109._4_4_;
  auVar132._0_4_ = auVar126._0_4_ * auVar109._0_4_;
  auVar132._8_4_ = auVar126._8_4_ * auVar109._8_4_;
  auVar132._12_4_ = auVar126._12_4_ * auVar109._12_4_;
  auVar132._16_4_ = auVar126._16_4_ * 0.0;
  auVar132._20_4_ = auVar126._20_4_ * 0.0;
  auVar132._24_4_ = auVar126._24_4_ * 0.0;
  auVar132._28_4_ = auVar126._28_4_;
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar103 * 0x17 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar110));
  auVar137._0_4_ = auVar109._0_4_ * auVar126._0_4_;
  auVar137._4_4_ = auVar109._4_4_ * auVar126._4_4_;
  auVar137._8_4_ = auVar109._8_4_ * auVar126._8_4_;
  auVar137._12_4_ = auVar109._12_4_ * auVar126._12_4_;
  auVar137._16_4_ = auVar126._16_4_ * 0.0;
  auVar137._20_4_ = auVar126._20_4_ * 0.0;
  auVar137._24_4_ = auVar126._24_4_ * 0.0;
  auVar137._28_4_ = 0;
  auVar126 = vpminsd_avx2(auVar130,auVar140);
  auVar124 = vpminsd_avx2(auVar131,auVar139);
  auVar126 = vmaxps_avx(auVar126,auVar124);
  auVar124 = vpminsd_avx2(auVar132,auVar137);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar127._4_4_ = uVar1;
  auVar127._0_4_ = uVar1;
  auVar127._8_4_ = uVar1;
  auVar127._12_4_ = uVar1;
  auVar127._16_4_ = uVar1;
  auVar127._20_4_ = uVar1;
  auVar127._24_4_ = uVar1;
  auVar127._28_4_ = uVar1;
  auVar124 = vmaxps_avx512vl(auVar124,auVar127);
  auVar126 = vmaxps_avx(auVar126,auVar124);
  auVar124._8_4_ = 0x3f7ffffa;
  auVar124._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar124._12_4_ = 0x3f7ffffa;
  auVar124._16_4_ = 0x3f7ffffa;
  auVar124._20_4_ = 0x3f7ffffa;
  auVar124._24_4_ = 0x3f7ffffa;
  auVar124._28_4_ = 0x3f7ffffa;
  local_740 = vmulps_avx512vl(auVar126,auVar124);
  auVar126 = vpmaxsd_avx2(auVar130,auVar140);
  auVar124 = vpmaxsd_avx2(auVar131,auVar139);
  auVar126 = vminps_avx(auVar126,auVar124);
  auVar124 = vpmaxsd_avx2(auVar132,auVar137);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar128._4_4_ = uVar1;
  auVar128._0_4_ = uVar1;
  auVar128._8_4_ = uVar1;
  auVar128._12_4_ = uVar1;
  auVar128._16_4_ = uVar1;
  auVar128._20_4_ = uVar1;
  auVar128._24_4_ = uVar1;
  auVar128._28_4_ = uVar1;
  auVar124 = vminps_avx512vl(auVar124,auVar128);
  auVar126 = vminps_avx(auVar126,auVar124);
  auVar129._8_4_ = 0x3f800003;
  auVar129._0_8_ = 0x3f8000033f800003;
  auVar129._12_4_ = 0x3f800003;
  auVar129._16_4_ = 0x3f800003;
  auVar129._20_4_ = 0x3f800003;
  auVar129._24_4_ = 0x3f800003;
  auVar129._28_4_ = 0x3f800003;
  auVar126 = vmulps_avx512vl(auVar126,auVar129);
  uVar24 = vpcmpgtd_avx512vl(auVar125,_DAT_0205a920);
  uVar22 = vcmpps_avx512vl(local_740,auVar126,2);
  if ((byte)((byte)uVar22 & (byte)uVar24) == 0) {
    return;
  }
  local_ac8 = (ulong)(byte)((byte)uVar22 & (byte)uVar24);
  local_ae8 = (undefined1 (*) [32])local_240;
  auVar196 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar196);
  local_ae0 = prim;
LAB_01db569f:
  lVar105 = 0;
  for (uVar107 = local_ac8; (uVar107 & 1) == 0; uVar107 = uVar107 >> 1 | 0x8000000000000000) {
    lVar105 = lVar105 + 1;
  }
  uVar104 = *(uint *)(prim + 2);
  uVar3 = *(uint *)(prim + lVar105 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar104].ptr;
  uVar107 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                            pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i * (ulong)uVar3);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar105 = *(long *)&pGVar4[1].time_range.upper;
  auVar111 = *(undefined1 (*) [16])(lVar105 + (long)p_Var5 * uVar107);
  auVar21 = *(undefined1 (*) [16])(lVar105 + (uVar107 + 1) * (long)p_Var5);
  local_ac8 = local_ac8 - 1 & local_ac8;
  if (local_ac8 != 0) {
    uVar103 = local_ac8 - 1 & local_ac8;
    for (uVar99 = local_ac8; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x8000000000000000) {
    }
    if (uVar103 != 0) {
      for (; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar109 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x1c);
  auVar113 = vinsertps_avx(auVar109,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  local_a80 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  auVar280 = ZEXT3264(local_a80);
  local_aa0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar281 = ZEXT3264(local_aa0);
  auVar109 = vunpcklps_avx512vl(local_a80._0_16_,local_aa0._0_16_);
  local_ac0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar279 = ZEXT3264(local_ac0);
  auVar114 = local_ac0._0_16_;
  local_a50 = vinsertps_avx512f(auVar109,auVar114,0x28);
  auVar269 = ZEXT1664(local_a50);
  auVar251._0_4_ = auVar111._0_4_ + auVar21._0_4_;
  auVar251._4_4_ = auVar111._4_4_ + auVar21._4_4_;
  auVar251._8_4_ = auVar111._8_4_ + auVar21._8_4_;
  auVar251._12_4_ = auVar111._12_4_ + auVar21._12_4_;
  auVar116._8_4_ = 0x3f000000;
  auVar116._0_8_ = 0x3f0000003f000000;
  auVar116._12_4_ = 0x3f000000;
  auVar109 = vmulps_avx512vl(auVar251,auVar116);
  auVar109 = vsubps_avx(auVar109,auVar113);
  auVar109 = vdpps_avx(auVar109,local_a50,0x7f);
  fVar230 = *(float *)(ray + k * 4 + 0xc0);
  local_a60 = vdpps_avx(local_a50,local_a50,0x7f);
  auVar275 = ZEXT1664(local_a60);
  auVar118._4_12_ = ZEXT812(0) << 0x20;
  auVar118._0_4_ = local_a60._0_4_;
  auVar110 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar118);
  auVar112 = vfnmadd213ss_fma(auVar110,local_a60,ZEXT416(0x40000000));
  local_720 = auVar109._0_4_ * auVar110._0_4_ * auVar112._0_4_;
  auVar117._4_4_ = local_720;
  auVar117._0_4_ = local_720;
  auVar117._8_4_ = local_720;
  auVar117._12_4_ = local_720;
  fStack_930 = local_720;
  _local_940 = auVar117;
  fStack_92c = local_720;
  fStack_928 = local_720;
  fStack_924 = local_720;
  auVar109 = vfmadd231ps_fma(auVar113,local_a50,auVar117);
  auVar109 = vblendps_avx(auVar109,ZEXT816(0) << 0x40,8);
  auVar111 = vsubps_avx(auVar111,auVar109);
  auVar113 = vsubps_avx(*(undefined1 (*) [16])(lVar105 + (uVar107 + 2) * (long)p_Var5),auVar109);
  auVar21 = vsubps_avx(auVar21,auVar109);
  auVar266 = ZEXT1664(auVar21);
  auVar109 = vsubps_avx(*(undefined1 (*) [16])(lVar105 + (uVar107 + 3) * (long)p_Var5),auVar109);
  auVar241 = ZEXT1664(auVar109);
  local_7c0 = auVar111._0_4_;
  uStack_7bc = local_7c0;
  uStack_7b8 = local_7c0;
  uStack_7b4 = local_7c0;
  uStack_7b0 = local_7c0;
  uStack_7ac = local_7c0;
  uStack_7a8 = local_7c0;
  uStack_7a4 = local_7c0;
  auVar150._8_4_ = 1;
  auVar150._0_8_ = 0x100000001;
  auVar150._12_4_ = 1;
  auVar150._16_4_ = 1;
  auVar150._20_4_ = 1;
  auVar150._24_4_ = 1;
  auVar150._28_4_ = 1;
  local_9e0 = ZEXT1632(auVar111);
  local_520 = vpermps_avx2(auVar150,local_9e0);
  auVar151._8_4_ = 2;
  auVar151._0_8_ = 0x200000002;
  auVar151._12_4_ = 2;
  auVar151._16_4_ = 2;
  auVar151._20_4_ = 2;
  auVar151._24_4_ = 2;
  auVar151._28_4_ = 2;
  local_540 = vpermps_avx2(auVar151,local_9e0);
  auVar152._8_4_ = 3;
  auVar152._0_8_ = 0x300000003;
  auVar152._12_4_ = 3;
  auVar152._16_4_ = 3;
  auVar152._20_4_ = 3;
  auVar152._24_4_ = 3;
  auVar152._28_4_ = 3;
  local_560 = vpermps_avx2(auVar152,local_9e0);
  local_580 = auVar21._0_4_;
  uStack_57c = local_580;
  uStack_578 = local_580;
  uStack_574 = local_580;
  uStack_570 = local_580;
  uStack_56c = local_580;
  uStack_568 = local_580;
  uStack_564 = local_580;
  local_a20 = ZEXT1632(auVar21);
  local_5a0 = vpermps_avx2(auVar150,local_a20);
  local_5c0 = vpermps_avx2(auVar151,local_a20);
  local_5e0 = vpermps_avx2(auVar152,local_a20);
  local_600 = auVar113._0_4_;
  uStack_5fc = local_600;
  uStack_5f8 = local_600;
  uStack_5f4 = local_600;
  uStack_5f0 = local_600;
  uStack_5ec = local_600;
  uStack_5e8 = local_600;
  uStack_5e4 = local_600;
  local_a00 = ZEXT1632(auVar113);
  local_620 = vpermps_avx2(auVar150,local_a00);
  local_640 = vpermps_avx2(auVar151,local_a00);
  local_660 = vpermps_avx2(auVar152,local_a00);
  local_680 = auVar109._0_4_;
  uStack_67c = local_680;
  uStack_678 = local_680;
  uStack_674 = local_680;
  uStack_670 = local_680;
  uStack_66c = local_680;
  uStack_668 = local_680;
  uStack_664 = local_680;
  _local_a40 = ZEXT1632(auVar109);
  _local_6a0 = vpermps_avx2(auVar150,_local_a40);
  local_6c0 = vpermps_avx2(auVar151,_local_a40);
  _local_6e0 = vpermps_avx2(auVar152,_local_a40);
  auVar111 = vmulss_avx512f(auVar114,auVar114);
  auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar111),local_aa0,local_aa0);
  local_7e0 = vfmadd231ps_avx512vl(auVar126,local_a80,local_a80);
  local_700._0_4_ = local_7e0._0_4_;
  local_700._4_4_ = local_700._0_4_;
  local_700._8_4_ = local_700._0_4_;
  local_700._12_4_ = local_700._0_4_;
  local_700._16_4_ = local_700._0_4_;
  local_700._20_4_ = local_700._0_4_;
  local_700._24_4_ = local_700._0_4_;
  local_700._28_4_ = local_700._0_4_;
  auVar146._8_4_ = 0x7fffffff;
  auVar146._0_8_ = 0x7fffffff7fffffff;
  auVar146._12_4_ = 0x7fffffff;
  auVar146._16_4_ = 0x7fffffff;
  auVar146._20_4_ = 0x7fffffff;
  auVar146._24_4_ = 0x7fffffff;
  auVar146._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_700,auVar146);
  local_9a0 = ZEXT416((uint)local_720);
  local_720 = fVar230 - local_720;
  fStack_71c = local_720;
  fStack_718 = local_720;
  fStack_714 = local_720;
  fStack_710 = local_720;
  fStack_70c = local_720;
  fStack_708 = local_720;
  fStack_704 = local_720;
  auVar196 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar196);
  local_ad8 = 1;
  local_ad0 = 0;
  auVar196 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar196);
  auVar111 = vsqrtss_avx(local_a60,local_a60);
  auVar21 = vsqrtss_avx(local_a60,local_a60);
  auVar228 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar124 = auVar196._32_32_;
  auVar126 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar196 = ZEXT3264(auVar126);
  do {
    local_b00 = auVar228._0_16_;
    auVar109 = vmovshdup_avx(local_b00);
    fVar253 = auVar228._0_4_;
    fVar178 = auVar109._0_4_ - fVar253;
    fVar258 = fVar178 * 0.04761905;
    auVar246._4_4_ = fVar253;
    auVar246._0_4_ = fVar253;
    auVar246._8_4_ = fVar253;
    auVar246._12_4_ = fVar253;
    auVar246._16_4_ = fVar253;
    auVar246._20_4_ = fVar253;
    auVar246._24_4_ = fVar253;
    auVar246._28_4_ = fVar253;
    auVar186._4_4_ = fVar178;
    auVar186._0_4_ = fVar178;
    auVar186._8_4_ = fVar178;
    auVar186._12_4_ = fVar178;
    auVar186._16_4_ = fVar178;
    auVar186._20_4_ = fVar178;
    auVar186._24_4_ = fVar178;
    auVar186._28_4_ = fVar178;
    auVar109 = vfmadd231ps_fma(auVar246,auVar186,_DAT_02020f20);
    auVar127 = vsubps_avx512vl(auVar196._0_32_,ZEXT1632(auVar109));
    auVar126 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar128 = vxorps_avx512vl(ZEXT1632(auVar109),auVar126);
    fVar256 = auVar127._0_4_;
    fVar257 = auVar127._4_4_;
    fVar229 = auVar127._8_4_;
    fVar262 = auVar127._12_4_;
    fVar259 = auVar127._16_4_;
    fVar263 = auVar127._20_4_;
    fVar264 = auVar127._24_4_;
    auVar46._4_4_ = fVar257 * fVar257 * auVar128._4_4_;
    auVar46._0_4_ = fVar256 * fVar256 * auVar128._0_4_;
    auVar46._8_4_ = fVar229 * fVar229 * auVar128._8_4_;
    auVar46._12_4_ = fVar262 * fVar262 * auVar128._12_4_;
    auVar46._16_4_ = fVar259 * fVar259 * auVar128._16_4_;
    auVar46._20_4_ = fVar263 * fVar263 * auVar128._20_4_;
    auVar46._24_4_ = fVar264 * fVar264 * auVar128._24_4_;
    auVar46._28_4_ = auVar128._28_4_;
    fVar178 = auVar109._0_4_;
    fVar253 = auVar109._4_4_;
    fVar254 = auVar109._8_4_;
    fVar255 = auVar109._12_4_;
    auVar196._28_36_ = auVar241._28_36_;
    auVar196._0_28_ =
         ZEXT1628(CONCAT412(fVar255 * fVar255,
                            CONCAT48(fVar254 * fVar254,CONCAT44(fVar253 * fVar253,fVar178 * fVar178)
                                    )));
    fVar267 = fVar178 * 3.0;
    fVar270 = fVar253 * 3.0;
    fVar271 = fVar254 * 3.0;
    fVar272 = fVar255 * 3.0;
    auVar228._28_36_ = auVar269._28_36_;
    auVar228._0_28_ = ZEXT1628(CONCAT412(fVar272,CONCAT48(fVar271,CONCAT44(fVar270,fVar267))));
    auVar211._0_4_ = (fVar267 + -5.0) * fVar178 * fVar178 + 2.0;
    auVar211._4_4_ = (fVar270 + -5.0) * fVar253 * fVar253 + 2.0;
    auVar211._8_4_ = (fVar271 + -5.0) * fVar254 * fVar254 + 2.0;
    auVar211._12_4_ = (fVar272 + -5.0) * fVar255 * fVar255 + 2.0;
    auVar211._16_4_ = 0x40000000;
    auVar211._20_4_ = 0x40000000;
    auVar211._24_4_ = 0x40000000;
    auVar211._28_4_ = 0x40000000;
    auVar241._0_4_ = fVar256 * fVar256;
    auVar241._4_4_ = fVar257 * fVar257;
    auVar241._8_4_ = fVar229 * fVar229;
    auVar241._12_4_ = fVar262 * fVar262;
    auVar241._16_4_ = fVar259 * fVar259;
    auVar241._20_4_ = fVar263 * fVar263;
    auVar241._28_36_ = auVar275._28_36_;
    auVar241._24_4_ = fVar264 * fVar264;
    auVar226._0_4_ = auVar241._0_4_ * (fVar256 * 3.0 + -5.0) + 2.0;
    auVar226._4_4_ = auVar241._4_4_ * (fVar257 * 3.0 + -5.0) + 2.0;
    auVar226._8_4_ = auVar241._8_4_ * (fVar229 * 3.0 + -5.0) + 2.0;
    auVar226._12_4_ = auVar241._12_4_ * (fVar262 * 3.0 + -5.0) + 2.0;
    auVar226._16_4_ = auVar241._16_4_ * (fVar259 * 3.0 + -5.0) + 2.0;
    auVar226._20_4_ = auVar241._20_4_ * (fVar263 * 3.0 + -5.0) + 2.0;
    auVar226._24_4_ = auVar241._24_4_ * (fVar264 * 3.0 + -5.0) + 2.0;
    auVar226._28_4_ = auVar266._28_4_ + -5.0 + 2.0;
    auVar126 = vxorps_avx512vl(auVar127,auVar126);
    auVar47._4_4_ = fVar253 * fVar253 * auVar126._4_4_;
    auVar47._0_4_ = fVar178 * fVar178 * auVar126._0_4_;
    auVar47._8_4_ = fVar254 * fVar254 * auVar126._8_4_;
    auVar47._12_4_ = fVar255 * fVar255 * auVar126._12_4_;
    auVar47._16_4_ = auVar126._16_4_ * 0.0 * 0.0;
    auVar47._20_4_ = auVar126._20_4_ * 0.0 * 0.0;
    auVar47._24_4_ = auVar126._24_4_ * 0.0 * 0.0;
    auVar47._28_4_ = auVar126._28_4_;
    auVar129 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar126 = vmulps_avx512vl(auVar46,auVar129);
    auVar125 = vmulps_avx512vl(auVar211,auVar129);
    auVar130 = vmulps_avx512vl(auVar226,auVar129);
    auVar131 = vmulps_avx512vl(auVar47,auVar129);
    auVar93._4_4_ = uStack_67c;
    auVar93._0_4_ = local_680;
    auVar93._8_4_ = uStack_678;
    auVar93._12_4_ = uStack_674;
    auVar93._16_4_ = uStack_670;
    auVar93._20_4_ = uStack_66c;
    auVar93._24_4_ = uStack_668;
    auVar93._28_4_ = uStack_664;
    auVar132 = vmulps_avx512vl(auVar93,auVar131);
    auVar48._4_4_ = (float)local_6a0._4_4_ * auVar131._4_4_;
    auVar48._0_4_ = (float)local_6a0._0_4_ * auVar131._0_4_;
    auVar48._8_4_ = fStack_698 * auVar131._8_4_;
    auVar48._12_4_ = fStack_694 * auVar131._12_4_;
    auVar48._16_4_ = fStack_690 * auVar131._16_4_;
    auVar48._20_4_ = fStack_68c * auVar131._20_4_;
    auVar48._24_4_ = fStack_688 * auVar131._24_4_;
    auVar48._28_4_ = auVar128._28_4_;
    auVar128 = vmulps_avx512vl(local_6c0,auVar131);
    auVar49._4_4_ = (float)local_6e0._4_4_ * auVar131._4_4_;
    auVar49._0_4_ = (float)local_6e0._0_4_ * auVar131._0_4_;
    auVar49._8_4_ = fStack_6d8 * auVar131._8_4_;
    auVar49._12_4_ = fStack_6d4 * auVar131._12_4_;
    auVar49._16_4_ = fStack_6d0 * auVar131._16_4_;
    auVar49._20_4_ = fStack_6cc * auVar131._20_4_;
    auVar49._24_4_ = fStack_6c8 * auVar131._24_4_;
    auVar49._28_4_ = auVar131._28_4_;
    auVar94._4_4_ = uStack_5fc;
    auVar94._0_4_ = local_600;
    auVar94._8_4_ = uStack_5f8;
    auVar94._12_4_ = uStack_5f4;
    auVar94._16_4_ = uStack_5f0;
    auVar94._20_4_ = uStack_5ec;
    auVar94._24_4_ = uStack_5e8;
    auVar94._28_4_ = uStack_5e4;
    auVar131 = vfmadd231ps_avx512vl(auVar132,auVar130,auVar94);
    auVar132 = vfmadd231ps_avx512vl(auVar48,auVar130,local_620);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar130,local_640);
    auVar130 = vfmadd231ps_avx512vl(auVar49,local_660,auVar130);
    auVar95._4_4_ = uStack_57c;
    auVar95._0_4_ = local_580;
    auVar95._8_4_ = uStack_578;
    auVar95._12_4_ = uStack_574;
    auVar95._16_4_ = uStack_570;
    auVar95._20_4_ = uStack_56c;
    auVar95._24_4_ = uStack_568;
    auVar95._28_4_ = uStack_564;
    auVar131 = vfmadd231ps_avx512vl(auVar131,auVar125,auVar95);
    auVar132 = vfmadd231ps_avx512vl(auVar132,auVar125,local_5a0);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar125,local_5c0);
    auVar130 = vfmadd231ps_avx512vl(auVar130,local_5e0,auVar125);
    auVar90._4_4_ = uStack_7bc;
    auVar90._0_4_ = local_7c0;
    auVar90._8_4_ = uStack_7b8;
    auVar90._12_4_ = uStack_7b4;
    auVar90._16_4_ = uStack_7b0;
    auVar90._20_4_ = uStack_7ac;
    auVar90._24_4_ = uStack_7a8;
    auVar90._28_4_ = uStack_7a4;
    auVar109 = vfmadd231ps_fma(auVar131,auVar126,auVar90);
    auVar113 = vfmadd231ps_fma(auVar132,auVar126,local_520);
    local_b20 = vfmadd231ps_avx512vl(auVar128,auVar126,local_540);
    auVar130 = vfmadd231ps_avx512vl(auVar130,local_560,auVar126);
    auVar50._4_4_ = (fVar257 + fVar257) * fVar253;
    auVar50._0_4_ = (fVar256 + fVar256) * fVar178;
    auVar50._8_4_ = (fVar229 + fVar229) * fVar254;
    auVar50._12_4_ = (fVar262 + fVar262) * fVar255;
    auVar50._16_4_ = (fVar259 + fVar259) * 0.0;
    auVar50._20_4_ = (fVar263 + fVar263) * 0.0;
    auVar50._24_4_ = (fVar264 + fVar264) * 0.0;
    auVar50._28_4_ = auVar125._28_4_;
    auVar126 = vsubps_avx(auVar50,auVar241._0_32_);
    auVar247._0_28_ =
         ZEXT1628(CONCAT412((fVar255 + fVar255) * (fVar272 + -5.0) + fVar272 * fVar255,
                            CONCAT48((fVar254 + fVar254) * (fVar271 + -5.0) + fVar271 * fVar254,
                                     CONCAT44((fVar253 + fVar253) * (fVar270 + -5.0) +
                                              fVar270 * fVar253,
                                              (fVar178 + fVar178) * (fVar267 + -5.0) +
                                              fVar267 * fVar178))));
    auVar247._28_4_ = auVar269._28_4_ + -5.0 + 0.0;
    auVar153._8_4_ = 0x40000000;
    auVar153._0_8_ = 0x4000000040000000;
    auVar153._12_4_ = 0x40000000;
    auVar153._16_4_ = 0x40000000;
    auVar153._20_4_ = 0x40000000;
    auVar153._24_4_ = 0x40000000;
    auVar153._28_4_ = 0x40000000;
    auVar128 = vaddps_avx512vl(auVar228._0_32_,auVar153);
    auVar51._4_4_ = (fVar257 + fVar257) * auVar128._4_4_;
    auVar51._0_4_ = (fVar256 + fVar256) * auVar128._0_4_;
    auVar51._8_4_ = (fVar229 + fVar229) * auVar128._8_4_;
    auVar51._12_4_ = (fVar262 + fVar262) * auVar128._12_4_;
    auVar51._16_4_ = (fVar259 + fVar259) * auVar128._16_4_;
    auVar51._20_4_ = (fVar263 + fVar263) * auVar128._20_4_;
    auVar51._24_4_ = (fVar264 + fVar264) * auVar128._24_4_;
    auVar51._28_4_ = auVar128._28_4_;
    auVar52._4_4_ = fVar257 * 3.0 * fVar257;
    auVar52._0_4_ = fVar256 * 3.0 * fVar256;
    auVar52._8_4_ = fVar229 * 3.0 * fVar229;
    auVar52._12_4_ = fVar262 * 3.0 * fVar262;
    auVar52._16_4_ = fVar259 * 3.0 * fVar259;
    auVar52._20_4_ = fVar263 * 3.0 * fVar263;
    auVar52._24_4_ = fVar264 * 3.0 * fVar264;
    auVar52._28_4_ = auVar127._28_4_;
    auVar127 = vsubps_avx(auVar51,auVar52);
    auVar128 = vsubps_avx(auVar196._0_32_,auVar50);
    auVar125 = vmulps_avx512vl(auVar126,auVar129);
    auVar131 = vmulps_avx512vl(auVar247,auVar129);
    auVar127 = vmulps_avx512vl(auVar127,auVar129);
    auVar128 = vmulps_avx512vl(auVar128,auVar129);
    auVar129 = vmulps_avx512vl(auVar93,auVar128);
    auVar53._4_4_ = (float)local_6a0._4_4_ * auVar128._4_4_;
    auVar53._0_4_ = (float)local_6a0._0_4_ * auVar128._0_4_;
    auVar53._8_4_ = fStack_698 * auVar128._8_4_;
    auVar53._12_4_ = fStack_694 * auVar128._12_4_;
    auVar53._16_4_ = fStack_690 * auVar128._16_4_;
    auVar53._20_4_ = fStack_68c * auVar128._20_4_;
    auVar53._24_4_ = fStack_688 * auVar128._24_4_;
    auVar53._28_4_ = uStack_684;
    auVar132 = vmulps_avx512vl(local_6c0,auVar128);
    auVar54._4_4_ = auVar128._4_4_ * (float)local_6e0._4_4_;
    auVar54._0_4_ = auVar128._0_4_ * (float)local_6e0._0_4_;
    auVar54._8_4_ = auVar128._8_4_ * fStack_6d8;
    auVar54._12_4_ = auVar128._12_4_ * fStack_6d4;
    auVar54._16_4_ = auVar128._16_4_ * fStack_6d0;
    auVar54._20_4_ = auVar128._20_4_ * fStack_6cc;
    auVar54._24_4_ = auVar128._24_4_ * fStack_6c8;
    auVar54._28_4_ = auVar128._28_4_;
    auVar128 = vfmadd231ps_avx512vl(auVar129,auVar127,auVar94);
    auVar129 = vfmadd231ps_avx512vl(auVar53,auVar127,local_620);
    auVar132 = vfmadd231ps_avx512vl(auVar132,auVar127,local_640);
    auVar127 = vfmadd231ps_avx512vl(auVar54,local_660,auVar127);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar131,auVar95);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar131,local_5a0);
    auVar132 = vfmadd231ps_avx512vl(auVar132,auVar131,local_5c0);
    auVar127 = vfmadd231ps_avx512vl(auVar127,local_5e0,auVar131);
    auVar91._4_4_ = uStack_7bc;
    auVar91._0_4_ = local_7c0;
    auVar91._8_4_ = uStack_7b8;
    auVar91._12_4_ = uStack_7b4;
    auVar91._16_4_ = uStack_7b0;
    auVar91._20_4_ = uStack_7ac;
    auVar91._24_4_ = uStack_7a8;
    auVar91._28_4_ = uStack_7a4;
    auVar112 = vfmadd231ps_fma(auVar128,auVar125,auVar91);
    auVar110 = vfmadd231ps_fma(auVar129,auVar125,local_520);
    auVar128 = vfmadd231ps_avx512vl(auVar132,auVar125,local_540);
    auVar127 = vfmadd231ps_avx512vl(auVar127,local_560,auVar125);
    auVar55._4_4_ = auVar112._4_4_ * fVar258;
    auVar55._0_4_ = auVar112._0_4_ * fVar258;
    auVar55._8_4_ = auVar112._8_4_ * fVar258;
    auVar55._12_4_ = auVar112._12_4_ * fVar258;
    auVar55._16_4_ = fVar258 * 0.0;
    auVar55._20_4_ = fVar258 * 0.0;
    auVar55._24_4_ = fVar258 * 0.0;
    auVar55._28_4_ = auVar126._28_4_;
    auVar275 = ZEXT3264(auVar55);
    auVar276._0_4_ = auVar110._0_4_ * fVar258;
    auVar276._4_4_ = auVar110._4_4_ * fVar258;
    auVar276._8_4_ = auVar110._8_4_ * fVar258;
    auVar276._12_4_ = auVar110._12_4_ * fVar258;
    auVar276._16_4_ = fVar258 * 0.0;
    auVar276._20_4_ = fVar258 * 0.0;
    auVar276._24_4_ = fVar258 * 0.0;
    auVar276._28_4_ = 0;
    auVar56._4_4_ = auVar128._4_4_ * fVar258;
    auVar56._0_4_ = auVar128._0_4_ * fVar258;
    auVar56._8_4_ = auVar128._8_4_ * fVar258;
    auVar56._12_4_ = auVar128._12_4_ * fVar258;
    auVar56._16_4_ = auVar128._16_4_ * fVar258;
    auVar56._20_4_ = auVar128._20_4_ * fVar258;
    auVar56._24_4_ = auVar128._24_4_ * fVar258;
    auVar56._28_4_ = auVar128._28_4_;
    fVar178 = auVar127._0_4_ * fVar258;
    fVar253 = auVar127._4_4_ * fVar258;
    auVar57._4_4_ = fVar253;
    auVar57._0_4_ = fVar178;
    fVar254 = auVar127._8_4_ * fVar258;
    auVar57._8_4_ = fVar254;
    fVar255 = auVar127._12_4_ * fVar258;
    auVar57._12_4_ = fVar255;
    fVar256 = auVar127._16_4_ * fVar258;
    auVar57._16_4_ = fVar256;
    fVar257 = auVar127._20_4_ * fVar258;
    auVar57._20_4_ = fVar257;
    fVar258 = auVar127._24_4_ * fVar258;
    auVar57._24_4_ = fVar258;
    auVar57._28_4_ = fStack_6c4;
    auVar147 = auVar281._0_32_;
    auVar112 = vxorps_avx512vl(auVar281._0_16_,auVar281._0_16_);
    auVar125 = vpermt2ps_avx512vl(ZEXT1632(auVar109),_DAT_0205fd20,ZEXT1632(auVar112));
    auVar131 = vpermt2ps_avx512vl(ZEXT1632(auVar113),_DAT_0205fd20,ZEXT1632(auVar112));
    auVar269 = ZEXT3264(auVar131);
    auVar128 = ZEXT1632(auVar112);
    auVar132 = vpermt2ps_avx512vl(local_b20,_DAT_0205fd20,auVar128);
    auVar248._0_4_ = auVar130._0_4_ + fVar178;
    auVar248._4_4_ = auVar130._4_4_ + fVar253;
    auVar248._8_4_ = auVar130._8_4_ + fVar254;
    auVar248._12_4_ = auVar130._12_4_ + fVar255;
    auVar248._16_4_ = auVar130._16_4_ + fVar256;
    auVar248._20_4_ = auVar130._20_4_ + fVar257;
    auVar248._24_4_ = auVar130._24_4_ + fVar258;
    auVar248._28_4_ = auVar130._28_4_ + fStack_6c4;
    auVar126 = vmaxps_avx(auVar130,auVar248);
    auVar127 = vminps_avx(auVar130,auVar248);
    auVar130 = vpermt2ps_avx512vl(auVar130,_DAT_0205fd20,auVar128);
    auVar133 = vpermt2ps_avx512vl(auVar55,_DAT_0205fd20,auVar128);
    auVar123 = vpermt2ps_avx512vl(auVar276,_DAT_0205fd20,auVar128);
    auVar145 = ZEXT1632(auVar112);
    auVar134 = vpermt2ps_avx512vl(auVar56,_DAT_0205fd20,auVar145);
    auVar128 = vpermt2ps_avx512vl(auVar57,_DAT_0205fd20,auVar145);
    auVar135 = vsubps_avx512vl(auVar130,auVar128);
    auVar128 = vsubps_avx(auVar125,ZEXT1632(auVar109));
    auVar129 = vsubps_avx(auVar131,ZEXT1632(auVar113));
    auVar121 = vsubps_avx512vl(auVar132,local_b20);
    auVar122 = vmulps_avx512vl(auVar129,auVar56);
    auVar122 = vfmsub231ps_avx512vl(auVar122,auVar276,auVar121);
    auVar136 = vmulps_avx512vl(auVar121,auVar55);
    auVar136 = vfmsub231ps_avx512vl(auVar136,auVar56,auVar128);
    auVar137 = vmulps_avx512vl(auVar128,auVar276);
    auVar137 = vfmsub231ps_avx512vl(auVar137,auVar55,auVar129);
    auVar137 = vmulps_avx512vl(auVar137,auVar137);
    auVar136 = vfmadd231ps_avx512vl(auVar137,auVar136,auVar136);
    auVar122 = vfmadd231ps_avx512vl(auVar136,auVar122,auVar122);
    auVar136 = vmulps_avx512vl(auVar121,auVar121);
    auVar136 = vfmadd231ps_avx512vl(auVar136,auVar129,auVar129);
    auVar136 = vfmadd231ps_avx512vl(auVar136,auVar128,auVar128);
    auVar137 = vrcp14ps_avx512vl(auVar136);
    auVar138 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar266 = ZEXT3264(auVar138);
    auVar139 = vfnmadd213ps_avx512vl(auVar137,auVar136,auVar138);
    auVar137 = vfmadd132ps_avx512vl(auVar139,auVar137,auVar137);
    auVar122 = vmulps_avx512vl(auVar122,auVar137);
    auVar139 = vmulps_avx512vl(auVar129,auVar134);
    auVar139 = vfmsub231ps_avx512vl(auVar139,auVar123,auVar121);
    auVar140 = vmulps_avx512vl(auVar121,auVar133);
    auVar140 = vfmsub231ps_avx512vl(auVar140,auVar134,auVar128);
    auVar141 = vmulps_avx512vl(auVar128,auVar123);
    auVar141 = vfmsub231ps_avx512vl(auVar141,auVar133,auVar129);
    auVar141 = vmulps_avx512vl(auVar141,auVar141);
    auVar140 = vfmadd231ps_avx512vl(auVar141,auVar140,auVar140);
    auVar139 = vfmadd231ps_avx512vl(auVar140,auVar139,auVar139);
    auVar137 = vmulps_avx512vl(auVar139,auVar137);
    auVar122 = vmaxps_avx512vl(auVar122,auVar137);
    auVar122 = vsqrtps_avx512vl(auVar122);
    auVar137 = vmaxps_avx512vl(auVar135,auVar130);
    auVar126 = vmaxps_avx512vl(auVar126,auVar137);
    auVar137 = vaddps_avx512vl(auVar122,auVar126);
    auVar126 = vminps_avx512vl(auVar135,auVar130);
    auVar126 = vminps_avx(auVar127,auVar126);
    auVar126 = vsubps_avx512vl(auVar126,auVar122);
    auVar30._8_4_ = 0x3f800002;
    auVar30._0_8_ = 0x3f8000023f800002;
    auVar30._12_4_ = 0x3f800002;
    auVar30._16_4_ = 0x3f800002;
    auVar30._20_4_ = 0x3f800002;
    auVar30._24_4_ = 0x3f800002;
    auVar30._28_4_ = 0x3f800002;
    auVar127 = vmulps_avx512vl(auVar137,auVar30);
    auVar31._8_4_ = 0x3f7ffffc;
    auVar31._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar31._12_4_ = 0x3f7ffffc;
    auVar31._16_4_ = 0x3f7ffffc;
    auVar31._20_4_ = 0x3f7ffffc;
    auVar31._24_4_ = 0x3f7ffffc;
    auVar31._28_4_ = 0x3f7ffffc;
    auVar130 = vmulps_avx512vl(auVar126,auVar31);
    auVar58._4_4_ = auVar127._4_4_ * auVar127._4_4_;
    auVar58._0_4_ = auVar127._0_4_ * auVar127._0_4_;
    auVar58._8_4_ = auVar127._8_4_ * auVar127._8_4_;
    auVar58._12_4_ = auVar127._12_4_ * auVar127._12_4_;
    auVar58._16_4_ = auVar127._16_4_ * auVar127._16_4_;
    auVar58._20_4_ = auVar127._20_4_ * auVar127._20_4_;
    auVar58._24_4_ = auVar127._24_4_ * auVar127._24_4_;
    auVar58._28_4_ = auVar130._28_4_;
    auVar126 = vrsqrt14ps_avx512vl(auVar136);
    auVar32._8_4_ = 0xbf000000;
    auVar32._0_8_ = 0xbf000000bf000000;
    auVar32._12_4_ = 0xbf000000;
    auVar32._16_4_ = 0xbf000000;
    auVar32._20_4_ = 0xbf000000;
    auVar32._24_4_ = 0xbf000000;
    auVar32._28_4_ = 0xbf000000;
    auVar127 = vmulps_avx512vl(auVar136,auVar32);
    auVar59._4_4_ = auVar126._4_4_ * auVar127._4_4_;
    auVar59._0_4_ = auVar126._0_4_ * auVar127._0_4_;
    auVar59._8_4_ = auVar126._8_4_ * auVar127._8_4_;
    auVar59._12_4_ = auVar126._12_4_ * auVar127._12_4_;
    auVar59._16_4_ = auVar126._16_4_ * auVar127._16_4_;
    auVar59._20_4_ = auVar126._20_4_ * auVar127._20_4_;
    auVar59._24_4_ = auVar126._24_4_ * auVar127._24_4_;
    auVar59._28_4_ = auVar127._28_4_;
    auVar127 = vmulps_avx512vl(auVar126,auVar126);
    auVar127 = vmulps_avx512vl(auVar127,auVar59);
    auVar33._8_4_ = 0x3fc00000;
    auVar33._0_8_ = 0x3fc000003fc00000;
    auVar33._12_4_ = 0x3fc00000;
    auVar33._16_4_ = 0x3fc00000;
    auVar33._20_4_ = 0x3fc00000;
    auVar33._24_4_ = 0x3fc00000;
    auVar33._28_4_ = 0x3fc00000;
    auVar127 = vfmadd231ps_avx512vl(auVar127,auVar126,auVar33);
    auVar60._4_4_ = auVar127._4_4_ * auVar128._4_4_;
    auVar60._0_4_ = auVar127._0_4_ * auVar128._0_4_;
    auVar60._8_4_ = auVar127._8_4_ * auVar128._8_4_;
    auVar60._12_4_ = auVar127._12_4_ * auVar128._12_4_;
    auVar60._16_4_ = auVar127._16_4_ * auVar128._16_4_;
    auVar60._20_4_ = auVar127._20_4_ * auVar128._20_4_;
    auVar60._24_4_ = auVar127._24_4_ * auVar128._24_4_;
    auVar60._28_4_ = auVar126._28_4_;
    auVar126 = vmulps_avx512vl(auVar129,auVar127);
    auVar135 = vmulps_avx512vl(auVar121,auVar127);
    local_b40 = ZEXT1632(auVar109);
    auVar122 = vsubps_avx512vl(auVar145,local_b40);
    local_8e0 = ZEXT1632(auVar113);
    auVar136 = vsubps_avx512vl(auVar145,local_8e0);
    auVar137 = vsubps_avx512vl(auVar145,local_b20);
    auVar139 = vmulps_avx512vl(auVar279._0_32_,auVar137);
    auVar139 = vfmadd231ps_avx512vl(auVar139,auVar147,auVar136);
    auVar139 = vfmadd231ps_avx512vl(auVar139,auVar280._0_32_,auVar122);
    auVar140 = vmulps_avx512vl(auVar137,auVar137);
    auVar140 = vfmadd231ps_avx512vl(auVar140,auVar136,auVar136);
    auVar140 = vfmadd231ps_avx512vl(auVar140,auVar122,auVar122);
    auVar141 = vmulps_avx512vl(auVar279._0_32_,auVar135);
    auVar141 = vfmadd231ps_avx512vl(auVar141,auVar126,auVar147);
    auVar141 = vfmadd231ps_avx512vl(auVar141,auVar60,auVar280._0_32_);
    auVar135 = vmulps_avx512vl(auVar137,auVar135);
    auVar126 = vfmadd231ps_avx512vl(auVar135,auVar136,auVar126);
    auVar135 = vfmadd231ps_avx512vl(auVar126,auVar122,auVar60);
    local_920 = vmulps_avx512vl(auVar141,auVar141);
    auVar126 = vsubps_avx(local_700,local_920);
    auVar142 = vmulps_avx512vl(auVar141,auVar135);
    auVar139 = vsubps_avx512vl(auVar139,auVar142);
    auVar139 = vaddps_avx512vl(auVar139,auVar139);
    auVar142 = vmulps_avx512vl(auVar135,auVar135);
    local_900 = vsubps_avx512vl(auVar140,auVar142);
    auVar140 = vsubps_avx512vl(local_900,auVar58);
    auVar142 = vmulps_avx512vl(auVar139,auVar139);
    auVar34._8_4_ = 0x40800000;
    auVar34._0_8_ = 0x4080000040800000;
    auVar34._12_4_ = 0x40800000;
    auVar34._16_4_ = 0x40800000;
    auVar34._20_4_ = 0x40800000;
    auVar34._24_4_ = 0x40800000;
    auVar34._28_4_ = 0x40800000;
    auVar143 = vmulps_avx512vl(auVar126,auVar34);
    auVar144 = vmulps_avx512vl(auVar143,auVar140);
    auVar144 = vsubps_avx512vl(auVar142,auVar144);
    uVar107 = vcmpps_avx512vl(auVar144,auVar145,5);
    bVar96 = (byte)uVar107;
    if (bVar96 == 0) {
      auVar148 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar149 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar144 = vsqrtps_avx512vl(auVar144);
      auVar145 = vaddps_avx512vl(auVar126,auVar126);
      auVar146 = vrcp14ps_avx512vl(auVar145);
      auVar138 = vfnmadd213ps_avx512vl(auVar145,auVar146,auVar138);
      auVar138 = vfmadd132ps_avx512vl(auVar138,auVar146,auVar146);
      auVar35._8_4_ = 0x80000000;
      auVar35._0_8_ = 0x8000000080000000;
      auVar35._12_4_ = 0x80000000;
      auVar35._16_4_ = 0x80000000;
      auVar35._20_4_ = 0x80000000;
      auVar35._24_4_ = 0x80000000;
      auVar35._28_4_ = 0x80000000;
      auVar145 = vxorps_avx512vl(auVar139,auVar35);
      auVar145 = vsubps_avx512vl(auVar145,auVar144);
      auVar145 = vmulps_avx512vl(auVar145,auVar138);
      auVar144 = vsubps_avx512vl(auVar144,auVar139);
      auVar144 = vmulps_avx512vl(auVar144,auVar138);
      auVar138 = vfmadd213ps_avx512vl(auVar141,auVar145,auVar135);
      local_820 = vmulps_avx512vl(auVar127,auVar138);
      auVar138 = vfmadd213ps_avx512vl(auVar141,auVar144,auVar135);
      local_840 = vmulps_avx512vl(auVar127,auVar138);
      auVar138 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar138 = vblendmps_avx512vl(auVar138,auVar145);
      auVar148._0_4_ =
           (uint)(bVar96 & 1) * auVar138._0_4_ | (uint)!(bool)(bVar96 & 1) * local_840._0_4_;
      bVar7 = (bool)((byte)(uVar107 >> 1) & 1);
      auVar148._4_4_ = (uint)bVar7 * auVar138._4_4_ | (uint)!bVar7 * local_840._4_4_;
      bVar7 = (bool)((byte)(uVar107 >> 2) & 1);
      auVar148._8_4_ = (uint)bVar7 * auVar138._8_4_ | (uint)!bVar7 * local_840._8_4_;
      bVar7 = (bool)((byte)(uVar107 >> 3) & 1);
      auVar148._12_4_ = (uint)bVar7 * auVar138._12_4_ | (uint)!bVar7 * local_840._12_4_;
      bVar7 = (bool)((byte)(uVar107 >> 4) & 1);
      auVar148._16_4_ = (uint)bVar7 * auVar138._16_4_ | (uint)!bVar7 * local_840._16_4_;
      bVar7 = (bool)((byte)(uVar107 >> 5) & 1);
      auVar148._20_4_ = (uint)bVar7 * auVar138._20_4_ | (uint)!bVar7 * local_840._20_4_;
      bVar7 = (bool)((byte)(uVar107 >> 6) & 1);
      auVar148._24_4_ = (uint)bVar7 * auVar138._24_4_ | (uint)!bVar7 * local_840._24_4_;
      bVar7 = SUB81(uVar107 >> 7,0);
      auVar148._28_4_ = (uint)bVar7 * auVar138._28_4_ | (uint)!bVar7 * local_840._28_4_;
      auVar237._8_4_ = 0xff800000;
      auVar237._0_8_ = 0xff800000ff800000;
      auVar237._12_4_ = 0xff800000;
      auVar237._16_4_ = 0xff800000;
      auVar237._20_4_ = 0xff800000;
      auVar237._24_4_ = 0xff800000;
      auVar237._28_4_ = 0xff800000;
      auVar138 = vblendmps_avx512vl(auVar237,auVar144);
      auVar149._0_4_ =
           (uint)(bVar96 & 1) * auVar138._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar144._0_4_;
      bVar7 = (bool)((byte)(uVar107 >> 1) & 1);
      auVar149._4_4_ = (uint)bVar7 * auVar138._4_4_ | (uint)!bVar7 * auVar144._4_4_;
      bVar7 = (bool)((byte)(uVar107 >> 2) & 1);
      auVar149._8_4_ = (uint)bVar7 * auVar138._8_4_ | (uint)!bVar7 * auVar144._8_4_;
      bVar7 = (bool)((byte)(uVar107 >> 3) & 1);
      auVar149._12_4_ = (uint)bVar7 * auVar138._12_4_ | (uint)!bVar7 * auVar144._12_4_;
      bVar7 = (bool)((byte)(uVar107 >> 4) & 1);
      auVar149._16_4_ = (uint)bVar7 * auVar138._16_4_ | (uint)!bVar7 * auVar144._16_4_;
      bVar7 = (bool)((byte)(uVar107 >> 5) & 1);
      auVar149._20_4_ = (uint)bVar7 * auVar138._20_4_ | (uint)!bVar7 * auVar144._20_4_;
      bVar7 = (bool)((byte)(uVar107 >> 6) & 1);
      auVar149._24_4_ = (uint)bVar7 * auVar138._24_4_ | (uint)!bVar7 * auVar144._24_4_;
      bVar7 = SUB81(uVar107 >> 7,0);
      auVar149._28_4_ = (uint)bVar7 * auVar138._28_4_ | (uint)!bVar7 * auVar144._28_4_;
      auVar138 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(local_920,auVar138);
      auVar144 = vmaxps_avx(local_7e0,auVar138);
      auVar36._8_4_ = 0x36000000;
      auVar36._0_8_ = 0x3600000036000000;
      auVar36._12_4_ = 0x36000000;
      auVar36._16_4_ = 0x36000000;
      auVar36._20_4_ = 0x36000000;
      auVar36._24_4_ = 0x36000000;
      auVar36._28_4_ = 0x36000000;
      auVar147 = vmulps_avx512vl(auVar144,auVar36);
      vandps_avx512vl(auVar126,auVar138);
      uVar99 = vcmpps_avx512vl(auVar147,auVar147,1);
      uVar107 = uVar107 & uVar99;
      bVar102 = (byte)uVar107;
      if (bVar102 != 0) {
        uVar99 = vcmpps_avx512vl(auVar140,_DAT_02020f00,2);
        auVar250._8_4_ = 0xff800000;
        auVar250._0_8_ = 0xff800000ff800000;
        auVar250._12_4_ = 0xff800000;
        auVar250._16_4_ = 0xff800000;
        auVar250._20_4_ = 0xff800000;
        auVar250._24_4_ = 0xff800000;
        auVar250._28_4_ = 0xff800000;
        auVar140 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar144 = vblendmps_avx512vl(auVar140,auVar250);
        bVar100 = (byte)uVar99;
        uVar108 = (uint)(bVar100 & 1) * auVar144._0_4_ | (uint)!(bool)(bVar100 & 1) * auVar147._0_4_
        ;
        bVar7 = (bool)((byte)(uVar99 >> 1) & 1);
        uVar171 = (uint)bVar7 * auVar144._4_4_ | (uint)!bVar7 * auVar147._4_4_;
        bVar7 = (bool)((byte)(uVar99 >> 2) & 1);
        uVar172 = (uint)bVar7 * auVar144._8_4_ | (uint)!bVar7 * auVar147._8_4_;
        bVar7 = (bool)((byte)(uVar99 >> 3) & 1);
        uVar173 = (uint)bVar7 * auVar144._12_4_ | (uint)!bVar7 * auVar147._12_4_;
        bVar7 = (bool)((byte)(uVar99 >> 4) & 1);
        uVar174 = (uint)bVar7 * auVar144._16_4_ | (uint)!bVar7 * auVar147._16_4_;
        bVar7 = (bool)((byte)(uVar99 >> 5) & 1);
        uVar175 = (uint)bVar7 * auVar144._20_4_ | (uint)!bVar7 * auVar147._20_4_;
        bVar7 = (bool)((byte)(uVar99 >> 6) & 1);
        uVar176 = (uint)bVar7 * auVar144._24_4_ | (uint)!bVar7 * auVar147._24_4_;
        bVar7 = SUB81(uVar99 >> 7,0);
        uVar177 = (uint)bVar7 * auVar144._28_4_ | (uint)!bVar7 * auVar147._28_4_;
        auVar148._0_4_ = (bVar102 & 1) * uVar108 | !(bool)(bVar102 & 1) * auVar148._0_4_;
        bVar7 = (bool)((byte)(uVar107 >> 1) & 1);
        auVar148._4_4_ = bVar7 * uVar171 | !bVar7 * auVar148._4_4_;
        bVar7 = (bool)((byte)(uVar107 >> 2) & 1);
        auVar148._8_4_ = bVar7 * uVar172 | !bVar7 * auVar148._8_4_;
        bVar7 = (bool)((byte)(uVar107 >> 3) & 1);
        auVar148._12_4_ = bVar7 * uVar173 | !bVar7 * auVar148._12_4_;
        bVar7 = (bool)((byte)(uVar107 >> 4) & 1);
        auVar148._16_4_ = bVar7 * uVar174 | !bVar7 * auVar148._16_4_;
        bVar7 = (bool)((byte)(uVar107 >> 5) & 1);
        auVar148._20_4_ = bVar7 * uVar175 | !bVar7 * auVar148._20_4_;
        bVar7 = (bool)((byte)(uVar107 >> 6) & 1);
        auVar148._24_4_ = bVar7 * uVar176 | !bVar7 * auVar148._24_4_;
        bVar7 = SUB81(uVar107 >> 7,0);
        auVar148._28_4_ = bVar7 * uVar177 | !bVar7 * auVar148._28_4_;
        auVar140 = vblendmps_avx512vl(auVar250,auVar140);
        auVar147._0_4_ = (uint)(bVar100 & 1) * auVar140._0_4_ | !(bool)(bVar100 & 1) * uVar108;
        bVar7 = (bool)((byte)(uVar99 >> 1) & 1);
        auVar147._4_4_ = (uint)bVar7 * auVar140._4_4_ | !bVar7 * uVar171;
        bVar7 = (bool)((byte)(uVar99 >> 2) & 1);
        auVar147._8_4_ = (uint)bVar7 * auVar140._8_4_ | !bVar7 * uVar172;
        bVar7 = (bool)((byte)(uVar99 >> 3) & 1);
        auVar147._12_4_ = (uint)bVar7 * auVar140._12_4_ | !bVar7 * uVar173;
        bVar7 = (bool)((byte)(uVar99 >> 4) & 1);
        auVar147._16_4_ = (uint)bVar7 * auVar140._16_4_ | !bVar7 * uVar174;
        bVar7 = (bool)((byte)(uVar99 >> 5) & 1);
        auVar147._20_4_ = (uint)bVar7 * auVar140._20_4_ | !bVar7 * uVar175;
        bVar7 = (bool)((byte)(uVar99 >> 6) & 1);
        auVar147._24_4_ = (uint)bVar7 * auVar140._24_4_ | !bVar7 * uVar176;
        bVar7 = SUB81(uVar99 >> 7,0);
        auVar147._28_4_ = (uint)bVar7 * auVar140._28_4_ | !bVar7 * uVar177;
        auVar149._0_4_ = (bVar102 & 1) * auVar147._0_4_ | !(bool)(bVar102 & 1) * auVar149._0_4_;
        bVar7 = (bool)((byte)(uVar107 >> 1) & 1);
        auVar149._4_4_ = bVar7 * auVar147._4_4_ | !bVar7 * auVar149._4_4_;
        bVar7 = (bool)((byte)(uVar107 >> 2) & 1);
        auVar149._8_4_ = bVar7 * auVar147._8_4_ | !bVar7 * auVar149._8_4_;
        bVar7 = (bool)((byte)(uVar107 >> 3) & 1);
        auVar149._12_4_ = bVar7 * auVar147._12_4_ | !bVar7 * auVar149._12_4_;
        bVar7 = (bool)((byte)(uVar107 >> 4) & 1);
        auVar149._16_4_ = bVar7 * auVar147._16_4_ | !bVar7 * auVar149._16_4_;
        bVar7 = (bool)((byte)(uVar107 >> 5) & 1);
        auVar149._20_4_ = bVar7 * auVar147._20_4_ | !bVar7 * auVar149._20_4_;
        bVar7 = (bool)((byte)(uVar107 >> 6) & 1);
        auVar149._24_4_ = bVar7 * auVar147._24_4_ | !bVar7 * auVar149._24_4_;
        bVar7 = SUB81(uVar107 >> 7,0);
        auVar149._28_4_ = bVar7 * auVar147._28_4_ | !bVar7 * auVar149._28_4_;
        bVar96 = (~bVar102 | bVar100) & bVar96;
      }
      auVar138 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    }
    auVar241 = ZEXT3264(auVar147);
    auVar196 = ZEXT3264(auVar138);
    if ((bVar96 & 0x7f) == 0) {
      auVar280 = ZEXT3264(local_a80);
      auVar281 = ZEXT3264(local_aa0);
      auVar279 = ZEXT3264(local_ac0);
    }
    else {
      fVar178 = *(float *)(ray + k * 4 + 0x200) - (float)local_9a0._0_4_;
      auVar238._4_4_ = fVar178;
      auVar238._0_4_ = fVar178;
      auVar238._8_4_ = fVar178;
      auVar238._12_4_ = fVar178;
      auVar238._16_4_ = fVar178;
      auVar238._20_4_ = fVar178;
      auVar238._24_4_ = fVar178;
      auVar238._28_4_ = fVar178;
      auVar140 = vminps_avx512vl(auVar238,auVar149);
      auVar92._4_4_ = fStack_71c;
      auVar92._0_4_ = local_720;
      auVar92._8_4_ = fStack_718;
      auVar92._12_4_ = fStack_714;
      auVar92._16_4_ = fStack_710;
      auVar92._20_4_ = fStack_70c;
      auVar92._24_4_ = fStack_708;
      auVar92._28_4_ = fStack_704;
      auVar144 = vmaxps_avx512vl(auVar92,auVar148);
      auVar137 = vmulps_avx512vl(auVar137,auVar56);
      auVar136 = vfmadd213ps_avx512vl(auVar136,auVar276,auVar137);
      auVar122 = vfmadd213ps_avx512vl(auVar122,auVar55,auVar136);
      auVar279 = ZEXT3264(local_ac0);
      auVar136 = vmulps_avx512vl(local_ac0,auVar56);
      auVar281 = ZEXT3264(local_aa0);
      auVar136 = vfmadd231ps_avx512vl(auVar136,local_aa0,auVar276);
      auVar280 = ZEXT3264(local_a80);
      auVar136 = vfmadd231ps_avx512vl(auVar136,local_a80,auVar55);
      auVar137 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar136,auVar137);
      auVar145 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar22 = vcmpps_avx512vl(auVar137,auVar145,1);
      auVar146 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar122 = vxorps_avx512vl(auVar122,auVar146);
      auVar150 = vrcp14ps_avx512vl(auVar136);
      auVar151 = vxorps_avx512vl(auVar136,auVar146);
      auVar152 = vfnmadd213ps_avx512vl(auVar150,auVar136,auVar138);
      auVar152 = vfmadd132ps_avx512vl(auVar152,auVar150,auVar150);
      auVar152 = vmulps_avx512vl(auVar152,auVar122);
      uVar24 = vcmpps_avx512vl(auVar136,auVar151,1);
      bVar102 = (byte)uVar22 | (byte)uVar24;
      auVar153 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar122 = vblendmps_avx512vl(auVar152,auVar153);
      auVar154._0_4_ =
           (uint)(bVar102 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar102 & 1) * auVar150._0_4_;
      bVar7 = (bool)(bVar102 >> 1 & 1);
      auVar154._4_4_ = (uint)bVar7 * auVar122._4_4_ | (uint)!bVar7 * auVar150._4_4_;
      bVar7 = (bool)(bVar102 >> 2 & 1);
      auVar154._8_4_ = (uint)bVar7 * auVar122._8_4_ | (uint)!bVar7 * auVar150._8_4_;
      bVar7 = (bool)(bVar102 >> 3 & 1);
      auVar154._12_4_ = (uint)bVar7 * auVar122._12_4_ | (uint)!bVar7 * auVar150._12_4_;
      bVar7 = (bool)(bVar102 >> 4 & 1);
      auVar154._16_4_ = (uint)bVar7 * auVar122._16_4_ | (uint)!bVar7 * auVar150._16_4_;
      bVar7 = (bool)(bVar102 >> 5 & 1);
      auVar154._20_4_ = (uint)bVar7 * auVar122._20_4_ | (uint)!bVar7 * auVar150._20_4_;
      bVar7 = (bool)(bVar102 >> 6 & 1);
      auVar154._24_4_ = (uint)bVar7 * auVar122._24_4_ | (uint)!bVar7 * auVar150._24_4_;
      auVar154._28_4_ =
           (uint)(bVar102 >> 7) * auVar122._28_4_ | (uint)!(bool)(bVar102 >> 7) * auVar150._28_4_;
      auVar122 = vmaxps_avx(auVar144,auVar154);
      uVar24 = vcmpps_avx512vl(auVar136,auVar151,6);
      bVar102 = (byte)uVar22 | (byte)uVar24;
      auVar155._0_4_ =
           (uint)(bVar102 & 1) * 0x7f800000 | (uint)!(bool)(bVar102 & 1) * auVar152._0_4_;
      bVar7 = (bool)(bVar102 >> 1 & 1);
      auVar155._4_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * auVar152._4_4_;
      bVar7 = (bool)(bVar102 >> 2 & 1);
      auVar155._8_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * auVar152._8_4_;
      bVar7 = (bool)(bVar102 >> 3 & 1);
      auVar155._12_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * auVar152._12_4_;
      bVar7 = (bool)(bVar102 >> 4 & 1);
      auVar155._16_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * auVar152._16_4_;
      bVar7 = (bool)(bVar102 >> 5 & 1);
      auVar155._20_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * auVar152._20_4_;
      bVar7 = (bool)(bVar102 >> 6 & 1);
      auVar155._24_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * auVar152._24_4_;
      auVar155._28_4_ =
           (uint)(bVar102 >> 7) * 0x7f800000 | (uint)!(bool)(bVar102 >> 7) * auVar152._28_4_;
      auVar136 = vminps_avx(auVar140,auVar155);
      auVar241 = ZEXT3264(auVar136);
      auVar109 = vxorps_avx512vl(auVar151._0_16_,auVar151._0_16_);
      auVar125 = vsubps_avx512vl(ZEXT1632(auVar109),auVar125);
      auVar131 = vsubps_avx512vl(ZEXT1632(auVar109),auVar131);
      auVar140 = ZEXT1632(auVar109);
      auVar132 = vsubps_avx512vl(auVar140,auVar132);
      auVar61._4_4_ = auVar132._4_4_ * auVar134._4_4_;
      auVar61._0_4_ = auVar132._0_4_ * auVar134._0_4_;
      auVar61._8_4_ = auVar132._8_4_ * auVar134._8_4_;
      auVar61._12_4_ = auVar132._12_4_ * auVar134._12_4_;
      auVar61._16_4_ = auVar132._16_4_ * auVar134._16_4_;
      auVar61._20_4_ = auVar132._20_4_ * auVar134._20_4_;
      auVar61._24_4_ = auVar132._24_4_ * auVar134._24_4_;
      auVar61._28_4_ = auVar132._28_4_;
      auVar131 = vfnmsub231ps_avx512vl(auVar61,auVar123,auVar131);
      auVar125 = vfnmadd231ps_avx512vl(auVar131,auVar133,auVar125);
      auVar131 = vmulps_avx512vl(local_ac0,auVar134);
      auVar131 = vfnmsub231ps_avx512vl(auVar131,local_aa0,auVar123);
      auVar131 = vfnmadd231ps_avx512vl(auVar131,local_a80,auVar133);
      vandps_avx512vl(auVar131,auVar137);
      uVar22 = vcmpps_avx512vl(auVar131,auVar145,1);
      auVar125 = vxorps_avx512vl(auVar125,auVar146);
      auVar132 = vrcp14ps_avx512vl(auVar131);
      auVar133 = vxorps_avx512vl(auVar131,auVar146);
      auVar275 = ZEXT3264(auVar133);
      auVar134 = vfnmadd213ps_avx512vl(auVar132,auVar131,auVar138);
      auVar109 = vfmadd132ps_fma(auVar134,auVar132,auVar132);
      fVar178 = auVar109._0_4_ * auVar125._0_4_;
      fVar253 = auVar109._4_4_ * auVar125._4_4_;
      auVar62._4_4_ = fVar253;
      auVar62._0_4_ = fVar178;
      fVar254 = auVar109._8_4_ * auVar125._8_4_;
      auVar62._8_4_ = fVar254;
      fVar255 = auVar109._12_4_ * auVar125._12_4_;
      auVar62._12_4_ = fVar255;
      fVar258 = auVar125._16_4_ * 0.0;
      auVar62._16_4_ = fVar258;
      fVar256 = auVar125._20_4_ * 0.0;
      auVar62._20_4_ = fVar256;
      fVar257 = auVar125._24_4_ * 0.0;
      auVar62._24_4_ = fVar257;
      auVar62._28_4_ = auVar125._28_4_;
      uVar24 = vcmpps_avx512vl(auVar131,auVar133,1);
      bVar102 = (byte)uVar22 | (byte)uVar24;
      auVar134 = vblendmps_avx512vl(auVar62,auVar153);
      auVar156._0_4_ =
           (uint)(bVar102 & 1) * auVar134._0_4_ | (uint)!(bool)(bVar102 & 1) * auVar132._0_4_;
      bVar7 = (bool)(bVar102 >> 1 & 1);
      auVar156._4_4_ = (uint)bVar7 * auVar134._4_4_ | (uint)!bVar7 * auVar132._4_4_;
      bVar7 = (bool)(bVar102 >> 2 & 1);
      auVar156._8_4_ = (uint)bVar7 * auVar134._8_4_ | (uint)!bVar7 * auVar132._8_4_;
      bVar7 = (bool)(bVar102 >> 3 & 1);
      auVar156._12_4_ = (uint)bVar7 * auVar134._12_4_ | (uint)!bVar7 * auVar132._12_4_;
      bVar7 = (bool)(bVar102 >> 4 & 1);
      auVar156._16_4_ = (uint)bVar7 * auVar134._16_4_ | (uint)!bVar7 * auVar132._16_4_;
      bVar7 = (bool)(bVar102 >> 5 & 1);
      auVar156._20_4_ = (uint)bVar7 * auVar134._20_4_ | (uint)!bVar7 * auVar132._20_4_;
      bVar7 = (bool)(bVar102 >> 6 & 1);
      auVar156._24_4_ = (uint)bVar7 * auVar134._24_4_ | (uint)!bVar7 * auVar132._24_4_;
      auVar156._28_4_ =
           (uint)(bVar102 >> 7) * auVar134._28_4_ | (uint)!(bool)(bVar102 >> 7) * auVar132._28_4_;
      _local_960 = vmaxps_avx(auVar122,auVar156);
      uVar24 = vcmpps_avx512vl(auVar131,auVar133,6);
      bVar102 = (byte)uVar22 | (byte)uVar24;
      auVar157._0_4_ = (uint)(bVar102 & 1) * 0x7f800000 | (uint)!(bool)(bVar102 & 1) * (int)fVar178;
      bVar7 = (bool)(bVar102 >> 1 & 1);
      auVar157._4_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar253;
      bVar7 = (bool)(bVar102 >> 2 & 1);
      auVar157._8_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar254;
      bVar7 = (bool)(bVar102 >> 3 & 1);
      auVar157._12_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar255;
      bVar7 = (bool)(bVar102 >> 4 & 1);
      auVar157._16_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar258;
      bVar7 = (bool)(bVar102 >> 5 & 1);
      auVar157._20_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar256;
      bVar7 = (bool)(bVar102 >> 6 & 1);
      auVar157._24_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar257;
      auVar157._28_4_ =
           (uint)(bVar102 >> 7) * 0x7f800000 | (uint)!(bool)(bVar102 >> 7) * auVar125._28_4_;
      auVar269 = ZEXT3264(auVar157);
      local_780 = vminps_avx(auVar136,auVar157);
      auVar266 = ZEXT3264(local_780);
      uVar22 = vcmpps_avx512vl(_local_960,local_780,2);
      bVar96 = bVar96 & 0x7f & (byte)uVar22;
      if (bVar96 != 0) {
        auVar131 = vmaxps_avx512vl(auVar140,auVar130);
        auVar125 = vminps_avx512vl(local_820,auVar138);
        auVar70 = ZEXT412(0);
        auVar130 = ZEXT1232(auVar70) << 0x20;
        auVar125 = vmaxps_avx(auVar125,ZEXT1232(auVar70) << 0x20);
        auVar132 = vminps_avx512vl(local_840,auVar138);
        auVar63._4_4_ = (auVar125._4_4_ + 1.0) * 0.125;
        auVar63._0_4_ = (auVar125._0_4_ + 0.0) * 0.125;
        auVar63._8_4_ = (auVar125._8_4_ + 2.0) * 0.125;
        auVar63._12_4_ = (auVar125._12_4_ + 3.0) * 0.125;
        auVar63._16_4_ = (auVar125._16_4_ + 4.0) * 0.125;
        auVar63._20_4_ = (auVar125._20_4_ + 5.0) * 0.125;
        auVar63._24_4_ = (auVar125._24_4_ + 6.0) * 0.125;
        auVar63._28_4_ = auVar125._28_4_ + 7.0;
        auVar109 = vfmadd213ps_fma(auVar63,auVar186,auVar246);
        local_820 = ZEXT1632(auVar109);
        auVar125 = vmaxps_avx(auVar132,ZEXT1232(auVar70) << 0x20);
        auVar64._4_4_ = (auVar125._4_4_ + 1.0) * 0.125;
        auVar64._0_4_ = (auVar125._0_4_ + 0.0) * 0.125;
        auVar64._8_4_ = (auVar125._8_4_ + 2.0) * 0.125;
        auVar64._12_4_ = (auVar125._12_4_ + 3.0) * 0.125;
        auVar64._16_4_ = (auVar125._16_4_ + 4.0) * 0.125;
        auVar64._20_4_ = (auVar125._20_4_ + 5.0) * 0.125;
        auVar64._24_4_ = (auVar125._24_4_ + 6.0) * 0.125;
        auVar64._28_4_ = auVar125._28_4_ + 7.0;
        auVar109 = vfmadd213ps_fma(auVar64,auVar186,auVar246);
        local_840 = ZEXT1632(auVar109);
        auVar239._0_4_ = auVar131._0_4_ * auVar131._0_4_;
        auVar239._4_4_ = auVar131._4_4_ * auVar131._4_4_;
        auVar239._8_4_ = auVar131._8_4_ * auVar131._8_4_;
        auVar239._12_4_ = auVar131._12_4_ * auVar131._12_4_;
        auVar239._16_4_ = auVar131._16_4_ * auVar131._16_4_;
        auVar239._20_4_ = auVar131._20_4_ * auVar131._20_4_;
        auVar239._24_4_ = auVar131._24_4_ * auVar131._24_4_;
        auVar239._28_4_ = 0;
        auVar125 = vsubps_avx(local_900,auVar239);
        auVar131 = vmulps_avx512vl(auVar143,auVar125);
        auVar131 = vsubps_avx512vl(auVar142,auVar131);
        uVar22 = vcmpps_avx512vl(auVar131,ZEXT1232(auVar70) << 0x20,5);
        bVar102 = (byte)uVar22;
        if (bVar102 == 0) {
          auVar127 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar128 = ZEXT832(0) << 0x20;
          auVar241 = ZEXT864(0) << 0x20;
          auVar131 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar269 = ZEXT864(0) << 0x20;
          auVar158._8_4_ = 0x7f800000;
          auVar158._0_8_ = 0x7f8000007f800000;
          auVar158._12_4_ = 0x7f800000;
          auVar158._16_4_ = 0x7f800000;
          auVar158._20_4_ = 0x7f800000;
          auVar158._24_4_ = 0x7f800000;
          auVar158._28_4_ = 0x7f800000;
          auVar159._8_4_ = 0xff800000;
          auVar159._0_8_ = 0xff800000ff800000;
          auVar159._12_4_ = 0xff800000;
          auVar159._16_4_ = 0xff800000;
          auVar159._20_4_ = 0xff800000;
          auVar159._24_4_ = 0xff800000;
          auVar159._28_4_ = 0xff800000;
        }
        else {
          auVar113 = vxorps_avx512vl(auVar123._0_16_,auVar123._0_16_);
          uVar107 = vcmpps_avx512vl(auVar131,auVar140,5);
          auVar130 = vsqrtps_avx(auVar131);
          auVar249._0_4_ = auVar126._0_4_ + auVar126._0_4_;
          auVar249._4_4_ = auVar126._4_4_ + auVar126._4_4_;
          auVar249._8_4_ = auVar126._8_4_ + auVar126._8_4_;
          auVar249._12_4_ = auVar126._12_4_ + auVar126._12_4_;
          auVar249._16_4_ = auVar126._16_4_ + auVar126._16_4_;
          auVar249._20_4_ = auVar126._20_4_ + auVar126._20_4_;
          auVar249._24_4_ = auVar126._24_4_ + auVar126._24_4_;
          auVar249._28_4_ = auVar126._28_4_ + auVar126._28_4_;
          auVar131 = vrcp14ps_avx512vl(auVar249);
          auVar132 = vfnmadd213ps_avx512vl(auVar249,auVar131,auVar138);
          auVar109 = vfmadd132ps_fma(auVar132,auVar131,auVar131);
          auVar37._8_4_ = 0x80000000;
          auVar37._0_8_ = 0x8000000080000000;
          auVar37._12_4_ = 0x80000000;
          auVar37._16_4_ = 0x80000000;
          auVar37._20_4_ = 0x80000000;
          auVar37._24_4_ = 0x80000000;
          auVar37._28_4_ = 0x80000000;
          auVar131 = vxorps_avx512vl(auVar139,auVar37);
          auVar131 = vsubps_avx(auVar131,auVar130);
          auVar65._4_4_ = auVar131._4_4_ * auVar109._4_4_;
          auVar65._0_4_ = auVar131._0_4_ * auVar109._0_4_;
          auVar65._8_4_ = auVar131._8_4_ * auVar109._8_4_;
          auVar65._12_4_ = auVar131._12_4_ * auVar109._12_4_;
          auVar65._16_4_ = auVar131._16_4_ * 0.0;
          auVar65._20_4_ = auVar131._20_4_ * 0.0;
          auVar65._24_4_ = auVar131._24_4_ * 0.0;
          auVar65._28_4_ = 0x3e000000;
          auVar130 = vsubps_avx512vl(auVar130,auVar139);
          auVar66._4_4_ = auVar130._4_4_ * auVar109._4_4_;
          auVar66._0_4_ = auVar130._0_4_ * auVar109._0_4_;
          auVar66._8_4_ = auVar130._8_4_ * auVar109._8_4_;
          auVar66._12_4_ = auVar130._12_4_ * auVar109._12_4_;
          auVar66._16_4_ = auVar130._16_4_ * 0.0;
          auVar66._20_4_ = auVar130._20_4_ * 0.0;
          auVar66._24_4_ = auVar130._24_4_ * 0.0;
          auVar66._28_4_ = 0x7f800000;
          auVar130 = vfmadd213ps_avx512vl(auVar141,auVar65,auVar135);
          auVar67._4_4_ = auVar127._4_4_ * auVar130._4_4_;
          auVar67._0_4_ = auVar127._0_4_ * auVar130._0_4_;
          auVar67._8_4_ = auVar127._8_4_ * auVar130._8_4_;
          auVar67._12_4_ = auVar127._12_4_ * auVar130._12_4_;
          auVar67._16_4_ = auVar127._16_4_ * auVar130._16_4_;
          auVar67._20_4_ = auVar127._20_4_ * auVar130._20_4_;
          auVar67._24_4_ = auVar127._24_4_ * auVar130._24_4_;
          auVar67._28_4_ = auVar131._28_4_;
          auVar130 = vmulps_avx512vl(local_a80,auVar65);
          auVar131 = vmulps_avx512vl(local_aa0,auVar65);
          auVar132 = vmulps_avx512vl(local_ac0,auVar65);
          auVar133 = vfmadd213ps_avx512vl(auVar128,auVar67,local_b40);
          auVar130 = vsubps_avx512vl(auVar130,auVar133);
          auVar241 = ZEXT3264(auVar130);
          auVar130 = vfmadd213ps_avx512vl(auVar129,auVar67,local_8e0);
          auVar131 = vsubps_avx512vl(auVar131,auVar130);
          auVar109 = vfmadd213ps_fma(auVar67,auVar121,local_b20);
          auVar130 = vsubps_avx(auVar132,ZEXT1632(auVar109));
          auVar269 = ZEXT3264(auVar130);
          auVar130 = vfmadd213ps_avx512vl(auVar141,auVar66,auVar135);
          auVar132 = vmulps_avx512vl(auVar127,auVar130);
          auVar127 = vmulps_avx512vl(local_a80,auVar66);
          auVar133 = vmulps_avx512vl(local_aa0,auVar66);
          auVar123 = vmulps_avx512vl(local_ac0,auVar66);
          auVar109 = vfmadd213ps_fma(auVar128,auVar132,local_b40);
          auVar130 = vsubps_avx(auVar127,ZEXT1632(auVar109));
          auVar109 = vfmadd213ps_fma(auVar129,auVar132,local_8e0);
          auVar127 = vsubps_avx512vl(auVar133,ZEXT1632(auVar109));
          auVar109 = vfmadd213ps_fma(auVar121,auVar132,local_b20);
          auVar128 = vsubps_avx512vl(auVar123,ZEXT1632(auVar109));
          auVar187._8_4_ = 0x7f800000;
          auVar187._0_8_ = 0x7f8000007f800000;
          auVar187._12_4_ = 0x7f800000;
          auVar187._16_4_ = 0x7f800000;
          auVar187._20_4_ = 0x7f800000;
          auVar187._24_4_ = 0x7f800000;
          auVar187._28_4_ = 0x7f800000;
          auVar129 = vblendmps_avx512vl(auVar187,auVar65);
          bVar7 = (bool)((byte)uVar107 & 1);
          auVar158._0_4_ = (uint)bVar7 * auVar129._0_4_ | (uint)!bVar7 * local_b20._0_4_;
          bVar7 = (bool)((byte)(uVar107 >> 1) & 1);
          auVar158._4_4_ = (uint)bVar7 * auVar129._4_4_ | (uint)!bVar7 * local_b20._4_4_;
          bVar7 = (bool)((byte)(uVar107 >> 2) & 1);
          auVar158._8_4_ = (uint)bVar7 * auVar129._8_4_ | (uint)!bVar7 * local_b20._8_4_;
          bVar7 = (bool)((byte)(uVar107 >> 3) & 1);
          auVar158._12_4_ = (uint)bVar7 * auVar129._12_4_ | (uint)!bVar7 * local_b20._12_4_;
          bVar7 = (bool)((byte)(uVar107 >> 4) & 1);
          auVar158._16_4_ = (uint)bVar7 * auVar129._16_4_ | (uint)!bVar7 * local_b20._16_4_;
          bVar7 = (bool)((byte)(uVar107 >> 5) & 1);
          auVar158._20_4_ = (uint)bVar7 * auVar129._20_4_ | (uint)!bVar7 * local_b20._20_4_;
          bVar7 = (bool)((byte)(uVar107 >> 6) & 1);
          auVar158._24_4_ = (uint)bVar7 * auVar129._24_4_ | (uint)!bVar7 * local_b20._24_4_;
          bVar7 = SUB81(uVar107 >> 7,0);
          auVar158._28_4_ = (uint)bVar7 * auVar129._28_4_ | (uint)!bVar7 * local_b20._28_4_;
          auVar188._8_4_ = 0xff800000;
          auVar188._0_8_ = 0xff800000ff800000;
          auVar188._12_4_ = 0xff800000;
          auVar188._16_4_ = 0xff800000;
          auVar188._20_4_ = 0xff800000;
          auVar188._24_4_ = 0xff800000;
          auVar188._28_4_ = 0xff800000;
          auVar129 = vblendmps_avx512vl(auVar188,auVar66);
          bVar7 = (bool)((byte)uVar107 & 1);
          auVar159._0_4_ = (uint)bVar7 * auVar129._0_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = (bool)((byte)(uVar107 >> 1) & 1);
          auVar159._4_4_ = (uint)bVar7 * auVar129._4_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = (bool)((byte)(uVar107 >> 2) & 1);
          auVar159._8_4_ = (uint)bVar7 * auVar129._8_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = (bool)((byte)(uVar107 >> 3) & 1);
          auVar159._12_4_ = (uint)bVar7 * auVar129._12_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = (bool)((byte)(uVar107 >> 4) & 1);
          auVar159._16_4_ = (uint)bVar7 * auVar129._16_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = (bool)((byte)(uVar107 >> 5) & 1);
          auVar159._20_4_ = (uint)bVar7 * auVar129._20_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = (bool)((byte)(uVar107 >> 6) & 1);
          auVar159._24_4_ = (uint)bVar7 * auVar129._24_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = SUB81(uVar107 >> 7,0);
          auVar159._28_4_ = (uint)bVar7 * auVar129._28_4_ | (uint)!bVar7 * -0x800000;
          auVar260._8_4_ = 0x7fffffff;
          auVar260._0_8_ = 0x7fffffff7fffffff;
          auVar260._12_4_ = 0x7fffffff;
          auVar260._16_4_ = 0x7fffffff;
          auVar260._20_4_ = 0x7fffffff;
          auVar260._24_4_ = 0x7fffffff;
          auVar260._28_4_ = 0x7fffffff;
          auVar129 = vandps_avx(auVar260,local_920);
          auVar129 = vmaxps_avx(local_7e0,auVar129);
          auVar38._8_4_ = 0x36000000;
          auVar38._0_8_ = 0x3600000036000000;
          auVar38._12_4_ = 0x36000000;
          auVar38._16_4_ = 0x36000000;
          auVar38._20_4_ = 0x36000000;
          auVar38._24_4_ = 0x36000000;
          auVar38._28_4_ = 0x36000000;
          auVar129 = vmulps_avx512vl(auVar129,auVar38);
          auVar126 = vandps_avx(auVar126,auVar260);
          uVar99 = vcmpps_avx512vl(auVar126,auVar129,1);
          uVar107 = uVar107 & uVar99;
          bVar100 = (byte)uVar107;
          if (bVar100 != 0) {
            uVar99 = vcmpps_avx512vl(auVar125,ZEXT1632(auVar113),2);
            auVar261._8_4_ = 0xff800000;
            auVar261._0_8_ = 0xff800000ff800000;
            auVar261._12_4_ = 0xff800000;
            auVar261._16_4_ = 0xff800000;
            auVar261._20_4_ = 0xff800000;
            auVar261._24_4_ = 0xff800000;
            auVar261._28_4_ = 0xff800000;
            auVar274._8_4_ = 0x7f800000;
            auVar274._0_8_ = 0x7f8000007f800000;
            auVar274._12_4_ = 0x7f800000;
            auVar274._16_4_ = 0x7f800000;
            auVar274._20_4_ = 0x7f800000;
            auVar274._24_4_ = 0x7f800000;
            auVar274._28_4_ = 0x7f800000;
            auVar126 = vblendmps_avx512vl(auVar274,auVar261);
            bVar101 = (byte)uVar99;
            uVar108 = (uint)(bVar101 & 1) * auVar126._0_4_ |
                      (uint)!(bool)(bVar101 & 1) * auVar129._0_4_;
            bVar7 = (bool)((byte)(uVar99 >> 1) & 1);
            uVar171 = (uint)bVar7 * auVar126._4_4_ | (uint)!bVar7 * auVar129._4_4_;
            bVar7 = (bool)((byte)(uVar99 >> 2) & 1);
            uVar172 = (uint)bVar7 * auVar126._8_4_ | (uint)!bVar7 * auVar129._8_4_;
            bVar7 = (bool)((byte)(uVar99 >> 3) & 1);
            uVar173 = (uint)bVar7 * auVar126._12_4_ | (uint)!bVar7 * auVar129._12_4_;
            bVar7 = (bool)((byte)(uVar99 >> 4) & 1);
            uVar174 = (uint)bVar7 * auVar126._16_4_ | (uint)!bVar7 * auVar129._16_4_;
            bVar7 = (bool)((byte)(uVar99 >> 5) & 1);
            uVar175 = (uint)bVar7 * auVar126._20_4_ | (uint)!bVar7 * auVar129._20_4_;
            bVar7 = (bool)((byte)(uVar99 >> 6) & 1);
            uVar176 = (uint)bVar7 * auVar126._24_4_ | (uint)!bVar7 * auVar129._24_4_;
            bVar7 = SUB81(uVar99 >> 7,0);
            uVar177 = (uint)bVar7 * auVar126._28_4_ | (uint)!bVar7 * auVar129._28_4_;
            auVar158._0_4_ = (bVar100 & 1) * uVar108 | !(bool)(bVar100 & 1) * auVar158._0_4_;
            bVar7 = (bool)((byte)(uVar107 >> 1) & 1);
            auVar158._4_4_ = bVar7 * uVar171 | !bVar7 * auVar158._4_4_;
            bVar7 = (bool)((byte)(uVar107 >> 2) & 1);
            auVar158._8_4_ = bVar7 * uVar172 | !bVar7 * auVar158._8_4_;
            bVar7 = (bool)((byte)(uVar107 >> 3) & 1);
            auVar158._12_4_ = bVar7 * uVar173 | !bVar7 * auVar158._12_4_;
            bVar7 = (bool)((byte)(uVar107 >> 4) & 1);
            auVar158._16_4_ = bVar7 * uVar174 | !bVar7 * auVar158._16_4_;
            bVar7 = (bool)((byte)(uVar107 >> 5) & 1);
            auVar158._20_4_ = bVar7 * uVar175 | !bVar7 * auVar158._20_4_;
            bVar7 = (bool)((byte)(uVar107 >> 6) & 1);
            auVar158._24_4_ = bVar7 * uVar176 | !bVar7 * auVar158._24_4_;
            bVar7 = SUB81(uVar107 >> 7,0);
            auVar158._28_4_ = bVar7 * uVar177 | !bVar7 * auVar158._28_4_;
            auVar126 = vblendmps_avx512vl(auVar261,auVar274);
            bVar7 = (bool)((byte)(uVar99 >> 1) & 1);
            bVar8 = (bool)((byte)(uVar99 >> 2) & 1);
            bVar9 = (bool)((byte)(uVar99 >> 3) & 1);
            bVar10 = (bool)((byte)(uVar99 >> 4) & 1);
            bVar11 = (bool)((byte)(uVar99 >> 5) & 1);
            bVar12 = (bool)((byte)(uVar99 >> 6) & 1);
            bVar13 = SUB81(uVar99 >> 7,0);
            auVar159._0_4_ =
                 (uint)(bVar100 & 1) *
                 ((uint)(bVar101 & 1) * auVar126._0_4_ | !(bool)(bVar101 & 1) * uVar108) |
                 !(bool)(bVar100 & 1) * auVar159._0_4_;
            bVar106 = (bool)((byte)(uVar107 >> 1) & 1);
            auVar159._4_4_ =
                 (uint)bVar106 * ((uint)bVar7 * auVar126._4_4_ | !bVar7 * uVar171) |
                 !bVar106 * auVar159._4_4_;
            bVar7 = (bool)((byte)(uVar107 >> 2) & 1);
            auVar159._8_4_ =
                 (uint)bVar7 * ((uint)bVar8 * auVar126._8_4_ | !bVar8 * uVar172) |
                 !bVar7 * auVar159._8_4_;
            bVar7 = (bool)((byte)(uVar107 >> 3) & 1);
            auVar159._12_4_ =
                 (uint)bVar7 * ((uint)bVar9 * auVar126._12_4_ | !bVar9 * uVar173) |
                 !bVar7 * auVar159._12_4_;
            bVar7 = (bool)((byte)(uVar107 >> 4) & 1);
            auVar159._16_4_ =
                 (uint)bVar7 * ((uint)bVar10 * auVar126._16_4_ | !bVar10 * uVar174) |
                 !bVar7 * auVar159._16_4_;
            bVar7 = (bool)((byte)(uVar107 >> 5) & 1);
            auVar159._20_4_ =
                 (uint)bVar7 * ((uint)bVar11 * auVar126._20_4_ | !bVar11 * uVar175) |
                 !bVar7 * auVar159._20_4_;
            bVar7 = (bool)((byte)(uVar107 >> 6) & 1);
            auVar159._24_4_ =
                 (uint)bVar7 * ((uint)bVar12 * auVar126._24_4_ | !bVar12 * uVar176) |
                 !bVar7 * auVar159._24_4_;
            bVar7 = SUB81(uVar107 >> 7,0);
            auVar159._28_4_ =
                 (uint)bVar7 * ((uint)bVar13 * auVar126._28_4_ | !bVar13 * uVar177) |
                 !bVar7 * auVar159._28_4_;
            bVar102 = (~bVar100 | bVar101) & bVar102;
          }
        }
        auVar119._8_4_ = 0x7fffffff;
        auVar119._0_8_ = 0x7fffffff7fffffff;
        auVar119._12_4_ = 0x7fffffff;
        auVar275 = ZEXT1664(auVar119);
        auVar126 = vmulps_avx512vl(local_ac0,auVar128);
        auVar126 = vfmadd231ps_avx512vl(auVar126,local_aa0,auVar127);
        auVar126 = vfmadd231ps_avx512vl(auVar126,local_a80,auVar130);
        _local_500 = _local_960;
        local_4e0 = vminps_avx(local_780,auVar158);
        auVar252._8_4_ = 0x7fffffff;
        auVar252._0_8_ = 0x7fffffff7fffffff;
        auVar252._12_4_ = 0x7fffffff;
        auVar252._16_4_ = 0x7fffffff;
        auVar252._20_4_ = 0x7fffffff;
        auVar252._24_4_ = 0x7fffffff;
        auVar252._28_4_ = 0x7fffffff;
        auVar126 = vandps_avx(auVar126,auVar252);
        _local_880 = vmaxps_avx(_local_960,auVar159);
        _local_7a0 = _local_880;
        auVar189._8_4_ = 0x3e99999a;
        auVar189._0_8_ = 0x3e99999a3e99999a;
        auVar189._12_4_ = 0x3e99999a;
        auVar189._16_4_ = 0x3e99999a;
        auVar189._20_4_ = 0x3e99999a;
        auVar189._24_4_ = 0x3e99999a;
        auVar189._28_4_ = 0x3e99999a;
        uVar22 = vcmpps_avx512vl(auVar126,auVar189,1);
        uVar24 = vcmpps_avx512vl(_local_960,local_4e0,2);
        bVar100 = (byte)uVar24 & bVar96;
        uVar23 = vcmpps_avx512vl(_local_880,local_780,2);
        if ((bVar96 & ((byte)uVar23 | (byte)uVar24)) == 0) {
          auVar126 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar196 = ZEXT3264(auVar126);
        }
        else {
          auVar126 = vmulps_avx512vl(local_ac0,auVar269._0_32_);
          auVar126 = vfmadd213ps_avx512vl(auVar131,local_aa0,auVar126);
          auVar126 = vfmadd213ps_avx512vl(auVar241._0_32_,local_a80,auVar126);
          auVar126 = vandps_avx(auVar126,auVar252);
          uVar24 = vcmpps_avx512vl(auVar126,auVar189,1);
          bVar101 = (byte)uVar24 | ~bVar102;
          auVar190._8_4_ = 2;
          auVar190._0_8_ = 0x200000002;
          auVar190._12_4_ = 2;
          auVar190._16_4_ = 2;
          auVar190._20_4_ = 2;
          auVar190._24_4_ = 2;
          auVar190._28_4_ = 2;
          auVar39._8_4_ = 3;
          auVar39._0_8_ = 0x300000003;
          auVar39._12_4_ = 3;
          auVar39._16_4_ = 3;
          auVar39._20_4_ = 3;
          auVar39._24_4_ = 3;
          auVar39._28_4_ = 3;
          auVar126 = vpblendmd_avx512vl(auVar190,auVar39);
          local_760._0_4_ = (uint)(bVar101 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar101 & 1) * 2;
          bVar7 = (bool)(bVar101 >> 1 & 1);
          local_760._4_4_ = (uint)bVar7 * auVar126._4_4_ | (uint)!bVar7 * 2;
          bVar7 = (bool)(bVar101 >> 2 & 1);
          local_760._8_4_ = (uint)bVar7 * auVar126._8_4_ | (uint)!bVar7 * 2;
          bVar7 = (bool)(bVar101 >> 3 & 1);
          local_760._12_4_ = (uint)bVar7 * auVar126._12_4_ | (uint)!bVar7 * 2;
          bVar7 = (bool)(bVar101 >> 4 & 1);
          local_760._16_4_ = (uint)bVar7 * auVar126._16_4_ | (uint)!bVar7 * 2;
          bVar7 = (bool)(bVar101 >> 5 & 1);
          local_760._20_4_ = (uint)bVar7 * auVar126._20_4_ | (uint)!bVar7 * 2;
          bVar7 = (bool)(bVar101 >> 6 & 1);
          local_760._24_4_ = (uint)bVar7 * auVar126._24_4_ | (uint)!bVar7 * 2;
          local_760._28_4_ =
               (uint)(bVar101 >> 7) * auVar126._28_4_ | (uint)!(bool)(bVar101 >> 7) * 2;
          auVar166._0_32_ = vpbroadcastd_avx512vl();
          auVar166._32_32_ = auVar124;
          local_800 = auVar166._0_32_;
          uVar24 = vpcmpd_avx512vl(auVar166._0_32_,local_760,5);
          bVar101 = (byte)uVar24 & bVar100;
          if (bVar101 != 0) {
            auVar113 = vminps_avx(local_9e0._0_16_,local_a20._0_16_);
            auVar109 = vmaxps_avx(local_9e0._0_16_,local_a20._0_16_);
            auVar112 = vminps_avx(local_a00._0_16_,local_a40._0_16_);
            auVar110 = vminps_avx(auVar113,auVar112);
            auVar113 = vmaxps_avx(local_a00._0_16_,local_a40._0_16_);
            auVar112 = vmaxps_avx(auVar109,auVar113);
            auVar109 = vandps_avx(auVar119,auVar110);
            auVar113 = vandps_avx(auVar119,auVar112);
            auVar109 = vmaxps_avx(auVar109,auVar113);
            auVar113 = vmovshdup_avx(auVar109);
            auVar113 = vmaxss_avx(auVar113,auVar109);
            auVar109 = vshufpd_avx(auVar109,auVar109,1);
            auVar109 = vmaxss_avx(auVar109,auVar113);
            fVar178 = auVar109._0_4_ * 1.9073486e-06;
            local_9b0 = vshufps_avx(auVar112,auVar112,0xff);
            local_860 = (float)local_960._0_4_ + (float)local_940._0_4_;
            fStack_85c = (float)local_960._4_4_ + (float)local_940._4_4_;
            fStack_858 = fStack_958 + fStack_938;
            fStack_854 = fStack_954 + fStack_934;
            fStack_850 = fStack_950 + fStack_930;
            fStack_84c = fStack_94c + fStack_92c;
            fStack_848 = fStack_948 + fStack_928;
            fStack_844 = fStack_944 + fStack_924;
            do {
              auVar191._8_4_ = 0x7f800000;
              auVar191._0_8_ = 0x7f8000007f800000;
              auVar191._12_4_ = 0x7f800000;
              auVar191._16_4_ = 0x7f800000;
              auVar191._20_4_ = 0x7f800000;
              auVar191._24_4_ = 0x7f800000;
              auVar191._28_4_ = 0x7f800000;
              auVar126 = vblendmps_avx512vl(auVar191,_local_960);
              auVar160._0_4_ =
                   (uint)(bVar101 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar101 & 1) * 0x7f800000;
              bVar7 = (bool)(bVar101 >> 1 & 1);
              auVar160._4_4_ = (uint)bVar7 * auVar126._4_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar101 >> 2 & 1);
              auVar160._8_4_ = (uint)bVar7 * auVar126._8_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar101 >> 3 & 1);
              auVar160._12_4_ = (uint)bVar7 * auVar126._12_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar101 >> 4 & 1);
              auVar160._16_4_ = (uint)bVar7 * auVar126._16_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar101 >> 5 & 1);
              auVar160._20_4_ = (uint)bVar7 * auVar126._20_4_ | (uint)!bVar7 * 0x7f800000;
              auVar160._24_4_ =
                   (uint)(bVar101 >> 6) * auVar126._24_4_ | (uint)!(bool)(bVar101 >> 6) * 0x7f800000
              ;
              auVar160._28_4_ = 0x7f800000;
              auVar166._0_32_ = auVar160;
              auVar126 = vshufps_avx(auVar160,auVar160,0xb1);
              auVar126 = vminps_avx(auVar160,auVar126);
              auVar124 = vshufpd_avx(auVar126,auVar126,5);
              auVar126 = vminps_avx(auVar126,auVar124);
              auVar124 = vpermpd_avx2(auVar126,0x4e);
              auVar126 = vminps_avx(auVar126,auVar124);
              uVar24 = vcmpps_avx512vl(auVar160,auVar126,0);
              bVar97 = (byte)uVar24 & bVar101;
              bVar98 = bVar101;
              if (bVar97 != 0) {
                bVar98 = bVar97;
              }
              iVar25 = 0;
              for (uVar108 = (uint)bVar98; (uVar108 & 1) == 0; uVar108 = uVar108 >> 1 | 0x80000000)
              {
                iVar25 = iVar25 + 1;
              }
              uVar108 = *(uint *)(local_820 + (uint)(iVar25 << 2));
              uVar171 = *(uint *)(local_500 + (uint)(iVar25 << 2));
              fVar253 = auVar21._0_4_;
              if ((float)local_a60._0_4_ < 0.0) {
                fVar253 = sqrtf((float)local_a60._0_4_);
              }
              auVar269 = ZEXT464(uVar108);
              auVar266 = ZEXT464(uVar171);
              lVar105 = 4;
              do {
                auVar126 = auVar166._32_32_;
                fVar254 = auVar266._0_4_;
                auVar120._4_4_ = fVar254;
                auVar120._0_4_ = fVar254;
                auVar120._8_4_ = fVar254;
                auVar120._12_4_ = fVar254;
                auVar109 = vfmadd132ps_fma(auVar120,ZEXT816(0) << 0x40,local_a50);
                fVar262 = auVar269._0_4_;
                fVar229 = 1.0 - fVar262;
                auVar115 = SUB6416(ZEXT464(0x40400000),0);
                auVar114 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar268 = auVar269._0_16_;
                auVar112 = vfmadd213ss_fma(auVar115,auVar268,auVar114);
                auVar113 = vfmadd213ss_fma(auVar112,ZEXT416((uint)(fVar262 * fVar262)),
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar110 = vfmadd213ss_fma(auVar115,ZEXT416((uint)fVar229),auVar114);
                auVar110 = vfmadd213ss_fma(auVar110,ZEXT416((uint)(fVar229 * fVar229)),
                                           SUB6416(ZEXT464(0x40000000),0));
                fVar255 = fVar229 * fVar229 * -fVar262 * 0.5;
                fVar258 = auVar113._0_4_ * 0.5;
                fVar256 = auVar110._0_4_ * 0.5;
                fVar257 = fVar262 * fVar262 * -fVar229 * 0.5;
                auVar231._0_4_ = fVar257 * (float)local_a40._0_4_;
                auVar231._4_4_ = fVar257 * (float)local_a40._4_4_;
                auVar231._8_4_ = fVar257 * fStack_a38;
                auVar231._12_4_ = fVar257 * fStack_a34;
                auVar242._4_4_ = fVar256;
                auVar242._0_4_ = fVar256;
                auVar242._8_4_ = fVar256;
                auVar242._12_4_ = fVar256;
                auVar113 = vfmadd132ps_fma(auVar242,auVar231,local_a00._0_16_);
                auVar216._4_4_ = fVar258;
                auVar216._0_4_ = fVar258;
                auVar216._8_4_ = fVar258;
                auVar216._12_4_ = fVar258;
                auVar113 = vfmadd132ps_fma(auVar216,auVar113,local_a20._0_16_);
                auVar232._4_4_ = fVar255;
                auVar232._0_4_ = fVar255;
                auVar232._8_4_ = fVar255;
                auVar232._12_4_ = fVar255;
                auVar113 = vfmadd132ps_fma(auVar232,auVar113,local_9e0._0_16_);
                auVar110 = vfmadd231ss_fma(auVar114,auVar268,ZEXT416(0x41100000));
                local_900._0_16_ = auVar110;
                auVar110 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar268,
                                           ZEXT416(0x40800000));
                local_920._0_16_ = auVar110;
                local_970 = vfmadd213ss_fma(auVar115,auVar268,ZEXT416(0xbf800000));
                local_8e0._0_16_ = auVar113;
                auVar113 = vsubps_avx(auVar109,auVar113);
                auVar109 = vdpps_avx(auVar113,auVar113,0x7f);
                fVar255 = auVar109._0_4_;
                if (fVar255 < 0.0) {
                  local_b20._0_4_ = auVar112._0_4_;
                  local_b40._0_16_ = ZEXT416((uint)fVar229);
                  auVar266._0_4_ = sqrtf(fVar255);
                  auVar266._4_60_ = extraout_var;
                  auVar112 = ZEXT416((uint)local_b20._0_4_);
                  auVar110 = auVar266._0_16_;
                  auVar114 = local_b40._0_16_;
                }
                else {
                  auVar110 = vsqrtss_avx(auVar109,auVar109);
                  auVar114 = ZEXT416((uint)fVar229);
                }
                fVar258 = auVar114._0_4_;
                auVar116 = vfnmadd231ss_fma(ZEXT416((uint)(fVar262 * (fVar258 + fVar258))),auVar114,
                                            auVar114);
                auVar112 = vfmadd213ss_fma(auVar112,ZEXT416((uint)(fVar262 + fVar262)),
                                           ZEXT416((uint)(fVar262 * fVar262 * 3.0)));
                auVar114 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar268,
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar115 = vfmadd231ss_fma(ZEXT416((uint)(fVar258 * fVar258 * -3.0)),
                                           ZEXT416((uint)(fVar258 + fVar258)),auVar114);
                auVar114 = vfmadd213ss_fma(ZEXT416((uint)(fVar229 * -2.0)),auVar268,
                                           ZEXT416((uint)(fVar262 * fVar262)));
                fVar258 = auVar116._0_4_ * 0.5;
                fVar256 = auVar112._0_4_ * 0.5;
                fVar257 = auVar115._0_4_ * 0.5;
                fVar229 = auVar114._0_4_ * 0.5;
                auVar233._0_4_ = fVar229 * (float)local_a40._0_4_;
                auVar233._4_4_ = fVar229 * (float)local_a40._4_4_;
                auVar233._8_4_ = fVar229 * fStack_a38;
                auVar233._12_4_ = fVar229 * fStack_a34;
                auVar217._4_4_ = fVar257;
                auVar217._0_4_ = fVar257;
                auVar217._8_4_ = fVar257;
                auVar217._12_4_ = fVar257;
                auVar112 = vfmadd132ps_fma(auVar217,auVar233,local_a00._0_16_);
                auVar197._4_4_ = fVar256;
                auVar197._0_4_ = fVar256;
                auVar197._8_4_ = fVar256;
                auVar197._12_4_ = fVar256;
                auVar112 = vfmadd132ps_fma(auVar197,auVar112,local_a20._0_16_);
                auVar277._4_4_ = fVar258;
                auVar277._0_4_ = fVar258;
                auVar277._8_4_ = fVar258;
                auVar277._12_4_ = fVar258;
                local_b20._0_16_ = vfmadd132ps_fma(auVar277,auVar112,local_9e0._0_16_);
                auVar112 = vdpps_avx(local_b20._0_16_,local_b20._0_16_,0x7f);
                auVar71._12_4_ = 0;
                auVar71._0_12_ = ZEXT812(0);
                fVar258 = auVar112._0_4_;
                auVar114 = vrsqrt14ss_avx512f(auVar71 << 0x20,ZEXT416((uint)fVar258));
                fVar256 = auVar114._0_4_;
                auVar115 = vrcp14ss_avx512f(auVar71 << 0x20,ZEXT416((uint)fVar258));
                auVar26._8_4_ = 0x80000000;
                auVar26._0_8_ = 0x8000000080000000;
                auVar26._12_4_ = 0x80000000;
                auVar116 = vxorps_avx512vl(auVar112,auVar26);
                auVar114 = vfnmadd213ss_fma(auVar115,auVar112,SUB6416(ZEXT464(0x40000000),0));
                local_b40._0_4_ = auVar110._0_4_;
                if (fVar258 < auVar116._0_4_) {
                  auVar269._0_4_ = sqrtf(fVar258);
                  auVar269._4_60_ = extraout_var_00;
                  auVar110 = ZEXT416((uint)local_b40._0_4_);
                  auVar116 = auVar269._0_16_;
                  auVar112 = local_b20._0_16_;
                }
                else {
                  auVar116 = vsqrtss_avx512f(auVar112,auVar112);
                  auVar112 = local_b20._0_16_;
                }
                fVar256 = fVar256 * 1.5 + fVar258 * -0.5 * fVar256 * fVar256 * fVar256;
                auVar179._0_4_ = auVar112._0_4_ * fVar256;
                auVar179._4_4_ = auVar112._4_4_ * fVar256;
                auVar179._8_4_ = auVar112._8_4_ * fVar256;
                auVar179._12_4_ = auVar112._12_4_ * fVar256;
                auVar251 = vdpps_avx(auVar113,auVar179,0x7f);
                fVar259 = auVar110._0_4_;
                fVar257 = auVar251._0_4_;
                auVar180._0_4_ = fVar257 * fVar257;
                auVar180._4_4_ = auVar251._4_4_ * auVar251._4_4_;
                auVar180._8_4_ = auVar251._8_4_ * auVar251._8_4_;
                auVar180._12_4_ = auVar251._12_4_ * auVar251._12_4_;
                auVar117 = vsubps_avx512vl(auVar109,auVar180);
                fVar229 = auVar117._0_4_;
                auVar198._4_12_ = ZEXT812(0) << 0x20;
                auVar198._0_4_ = fVar229;
                auVar118 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar198);
                auVar119 = vmulss_avx512f(auVar118,ZEXT416(0x3fc00000));
                auVar120 = vmulss_avx512f(auVar117,ZEXT416(0xbf000000));
                if (fVar229 < 0.0) {
                  local_990 = fVar256;
                  fStack_98c = fVar256;
                  fStack_988 = fVar256;
                  fStack_984 = fVar256;
                  local_980 = auVar118;
                  fVar229 = sqrtf(fVar229);
                  auVar120 = ZEXT416(auVar120._0_4_);
                  auVar119 = ZEXT416(auVar119._0_4_);
                  auVar116 = ZEXT416(auVar116._0_4_);
                  auVar110 = ZEXT416((uint)local_b40._0_4_);
                  auVar112 = local_b20._0_16_;
                  auVar118 = local_980;
                  fVar256 = local_990;
                  fVar263 = fStack_98c;
                  fVar264 = fStack_988;
                  fVar267 = fStack_984;
                }
                else {
                  auVar117 = vsqrtss_avx(auVar117,auVar117);
                  fVar229 = auVar117._0_4_;
                  fVar263 = fVar256;
                  fVar264 = fVar256;
                  fVar267 = fVar256;
                }
                auVar273._8_4_ = 0x7fffffff;
                auVar273._0_8_ = 0x7fffffff7fffffff;
                auVar273._12_4_ = 0x7fffffff;
                auVar275 = ZEXT1664(auVar273);
                auVar280 = ZEXT3264(local_a80);
                auVar281 = ZEXT3264(local_aa0);
                auVar163._32_32_ = auVar126;
                auVar163._0_32_ = local_ac0;
                auVar279 = ZEXT3264(local_ac0);
                auVar199._0_4_ = (float)local_970._0_4_ * (float)local_a40._0_4_;
                auVar199._4_4_ = (float)local_970._0_4_ * (float)local_a40._4_4_;
                auVar199._8_4_ = (float)local_970._0_4_ * fStack_a38;
                auVar199._12_4_ = (float)local_970._0_4_ * fStack_a34;
                auVar218._4_4_ = local_920._0_4_;
                auVar218._0_4_ = local_920._0_4_;
                auVar218._8_4_ = local_920._0_4_;
                auVar218._12_4_ = local_920._0_4_;
                auVar117 = vfmadd132ps_fma(auVar218,auVar199,local_a00._0_16_);
                auVar200._4_4_ = local_900._0_4_;
                auVar200._0_4_ = local_900._0_4_;
                auVar200._8_4_ = local_900._0_4_;
                auVar200._12_4_ = local_900._0_4_;
                auVar117 = vfmadd132ps_fma(auVar200,auVar117,local_a20._0_16_);
                auVar268 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar268,
                                           ZEXT416(0x40000000));
                auVar219._0_4_ = auVar268._0_4_;
                auVar219._4_4_ = auVar219._0_4_;
                auVar219._8_4_ = auVar219._0_4_;
                auVar219._12_4_ = auVar219._0_4_;
                auVar268 = vfmadd132ps_fma(auVar219,auVar117,local_9e0._0_16_);
                auVar201._0_4_ = auVar268._0_4_ * fVar258;
                auVar201._4_4_ = auVar268._4_4_ * fVar258;
                auVar201._8_4_ = auVar268._8_4_ * fVar258;
                auVar201._12_4_ = auVar268._12_4_ * fVar258;
                auVar268 = vdpps_avx(auVar112,auVar268,0x7f);
                fVar258 = auVar268._0_4_;
                auVar220._0_4_ = auVar112._0_4_ * fVar258;
                auVar220._4_4_ = auVar112._4_4_ * fVar258;
                auVar220._8_4_ = auVar112._8_4_ * fVar258;
                auVar220._12_4_ = auVar112._12_4_ * fVar258;
                auVar268 = vsubps_avx(auVar201,auVar220);
                local_bb0 = auVar115._0_4_;
                local_bb0 = auVar114._0_4_ * local_bb0;
                auVar27._8_4_ = 0x80000000;
                auVar27._0_8_ = 0x8000000080000000;
                auVar27._12_4_ = 0x80000000;
                auVar166._16_48_ = auVar163._16_48_;
                auVar117 = vxorps_avx512vl(auVar112,auVar27);
                auVar243._0_4_ = fVar256 * auVar268._0_4_ * local_bb0;
                auVar243._4_4_ = fVar263 * auVar268._4_4_ * local_bb0;
                auVar243._8_4_ = fVar264 * auVar268._8_4_ * local_bb0;
                auVar243._12_4_ = fVar267 * auVar268._12_4_ * local_bb0;
                auVar114 = vdpps_avx(auVar117,auVar179,0x7f);
                auVar268 = vmaxss_avx(ZEXT416((uint)fVar178),
                                      ZEXT416((uint)(fVar254 * fVar253 * 1.9073486e-06)));
                auVar116 = vdivss_avx512f(ZEXT416((uint)fVar178),auVar116);
                auVar115 = vdpps_avx(auVar113,auVar243,0x7f);
                auVar110 = vfmadd213ss_fma(auVar110,ZEXT416((uint)fVar178),auVar268);
                auVar116 = vfmadd213ss_fma(ZEXT416((uint)(fVar259 + 1.0)),auVar116,auVar110);
                auVar110 = vdpps_avx(local_a50,auVar179,0x7f);
                fVar258 = auVar114._0_4_ + auVar115._0_4_;
                auVar114 = vdpps_avx(auVar113,auVar117,0x7f);
                auVar117 = vmulss_avx512f(auVar120,auVar118);
                auVar118 = vmulss_avx512f(auVar118,auVar118);
                auVar115 = vdpps_avx(auVar113,local_a50,0x7f);
                auVar166._0_16_ =
                     vaddss_avx512f(auVar119,ZEXT416((uint)(auVar117._0_4_ * auVar118._0_4_)));
                auVar118 = vfnmadd231ss_fma(auVar114,auVar251,ZEXT416((uint)fVar258));
                auVar117 = vfnmadd231ss_fma(auVar115,auVar251,auVar110);
                auVar114 = vpermilps_avx(local_8e0._0_16_,0xff);
                fVar229 = fVar229 - auVar114._0_4_;
                auVar114 = vshufps_avx(auVar112,auVar112,0xff);
                auVar115 = vfmsub213ss_fma(auVar118,auVar166._0_16_,auVar114);
                fVar256 = auVar117._0_4_ * auVar166._0_4_;
                auVar118 = vfmsub231ss_fma(ZEXT416((uint)(auVar110._0_4_ * auVar115._0_4_)),
                                           ZEXT416((uint)fVar258),ZEXT416((uint)fVar256));
                fVar259 = auVar118._0_4_;
                fVar262 = fVar262 - (fVar257 * (fVar256 / fVar259) -
                                    fVar229 * (auVar110._0_4_ / fVar259));
                auVar269 = ZEXT464((uint)fVar262);
                fVar254 = fVar254 - (fVar229 * (fVar258 / fVar259) -
                                    fVar257 * (auVar115._0_4_ / fVar259));
                auVar266 = ZEXT464((uint)fVar254);
                auVar110 = vandps_avx(auVar251,auVar273);
                if (auVar116._0_4_ <= auVar110._0_4_) {
LAB_01db6ee4:
                  bVar7 = false;
                }
                else {
                  auVar115 = vfmadd231ss_fma(ZEXT416((uint)(auVar116._0_4_ + auVar268._0_4_)),
                                             local_9b0,ZEXT416(0x36000000));
                  auVar110 = vandps_avx(auVar273,ZEXT416((uint)fVar229));
                  if (auVar115._0_4_ <= auVar110._0_4_) goto LAB_01db6ee4;
                  fVar254 = fVar254 + (float)local_9a0._0_4_;
                  auVar266 = ZEXT464((uint)fVar254);
                  bVar7 = true;
                  if ((((fVar230 <= fVar254) &&
                       (fVar258 = *(float *)(ray + k * 4 + 0x200), fVar254 <= fVar258)) &&
                      (0.0 <= fVar262)) && (fVar262 <= 1.0)) {
                    auVar165._16_48_ = auVar166._16_48_;
                    auVar165._0_16_ = ZEXT816(0) << 0x20;
                    auVar164._4_60_ = auVar165._4_60_;
                    auVar164._0_4_ = fVar255;
                    auVar110 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar164._0_16_);
                    fVar255 = auVar110._0_4_;
                    auVar166._0_16_ = vmulss_avx512f(auVar109,ZEXT416(0xbf000000));
                    pGVar4 = (context->scene->geometries).items[uVar104].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      fVar255 = fVar255 * 1.5 + auVar166._0_4_ * fVar255 * fVar255 * fVar255;
                      auVar202._0_4_ = auVar113._0_4_ * fVar255;
                      auVar202._4_4_ = auVar113._4_4_ * fVar255;
                      auVar202._8_4_ = auVar113._8_4_ * fVar255;
                      auVar202._12_4_ = auVar113._12_4_ * fVar255;
                      auVar110 = vfmadd213ps_fma(auVar114,auVar202,auVar112);
                      auVar109 = vshufps_avx(auVar202,auVar202,0xc9);
                      auVar113 = vshufps_avx(auVar112,auVar112,0xc9);
                      auVar203._0_4_ = auVar202._0_4_ * auVar113._0_4_;
                      auVar203._4_4_ = auVar202._4_4_ * auVar113._4_4_;
                      auVar203._8_4_ = auVar202._8_4_ * auVar113._8_4_;
                      auVar203._12_4_ = auVar202._12_4_ * auVar113._12_4_;
                      auVar112 = vfmsub231ps_fma(auVar203,auVar112,auVar109);
                      auVar109 = vshufps_avx(auVar112,auVar112,0xc9);
                      auVar113 = vshufps_avx(auVar110,auVar110,0xc9);
                      auVar112 = vshufps_avx(auVar112,auVar112,0xd2);
                      auVar181._0_4_ = auVar110._0_4_ * auVar112._0_4_;
                      auVar181._4_4_ = auVar110._4_4_ * auVar112._4_4_;
                      auVar181._8_4_ = auVar110._8_4_ * auVar112._8_4_;
                      auVar181._12_4_ = auVar110._12_4_ * auVar112._12_4_;
                      auVar109 = vfmsub231ps_fma(auVar181,auVar109,auVar113);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x200) = fVar254;
                        uVar1 = vextractps_avx(auVar109,1);
                        *(undefined4 *)(ray + k * 4 + 0x300) = uVar1;
                        uVar1 = vextractps_avx(auVar109,2);
                        *(undefined4 *)(ray + k * 4 + 0x340) = uVar1;
                        *(int *)(ray + k * 4 + 0x380) = auVar109._0_4_;
                        *(float *)(ray + k * 4 + 0x3c0) = fVar262;
                        *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                        *(uint *)(ray + k * 4 + 0x440) = uVar3;
                        *(uint *)(ray + k * 4 + 0x480) = uVar104;
                        *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar6 = context->user;
                        auVar113 = ZEXT416((uint)fVar262);
                        local_340 = vbroadcastss_avx512f(auVar113);
                        auVar196 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar196 = vpermps_avx512f(auVar196,ZEXT1664(auVar109));
                        auVar228 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar228,ZEXT1664(auVar109));
                        local_380 = vbroadcastss_avx512f(auVar109);
                        local_400[0] = (RTCHitN)auVar196[0];
                        local_400[1] = (RTCHitN)auVar196[1];
                        local_400[2] = (RTCHitN)auVar196[2];
                        local_400[3] = (RTCHitN)auVar196[3];
                        local_400[4] = (RTCHitN)auVar196[4];
                        local_400[5] = (RTCHitN)auVar196[5];
                        local_400[6] = (RTCHitN)auVar196[6];
                        local_400[7] = (RTCHitN)auVar196[7];
                        local_400[8] = (RTCHitN)auVar196[8];
                        local_400[9] = (RTCHitN)auVar196[9];
                        local_400[10] = (RTCHitN)auVar196[10];
                        local_400[0xb] = (RTCHitN)auVar196[0xb];
                        local_400[0xc] = (RTCHitN)auVar196[0xc];
                        local_400[0xd] = (RTCHitN)auVar196[0xd];
                        local_400[0xe] = (RTCHitN)auVar196[0xe];
                        local_400[0xf] = (RTCHitN)auVar196[0xf];
                        local_400[0x10] = (RTCHitN)auVar196[0x10];
                        local_400[0x11] = (RTCHitN)auVar196[0x11];
                        local_400[0x12] = (RTCHitN)auVar196[0x12];
                        local_400[0x13] = (RTCHitN)auVar196[0x13];
                        local_400[0x14] = (RTCHitN)auVar196[0x14];
                        local_400[0x15] = (RTCHitN)auVar196[0x15];
                        local_400[0x16] = (RTCHitN)auVar196[0x16];
                        local_400[0x17] = (RTCHitN)auVar196[0x17];
                        local_400[0x18] = (RTCHitN)auVar196[0x18];
                        local_400[0x19] = (RTCHitN)auVar196[0x19];
                        local_400[0x1a] = (RTCHitN)auVar196[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar196[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar196[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar196[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar196[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar196[0x1f];
                        local_400[0x20] = (RTCHitN)auVar196[0x20];
                        local_400[0x21] = (RTCHitN)auVar196[0x21];
                        local_400[0x22] = (RTCHitN)auVar196[0x22];
                        local_400[0x23] = (RTCHitN)auVar196[0x23];
                        local_400[0x24] = (RTCHitN)auVar196[0x24];
                        local_400[0x25] = (RTCHitN)auVar196[0x25];
                        local_400[0x26] = (RTCHitN)auVar196[0x26];
                        local_400[0x27] = (RTCHitN)auVar196[0x27];
                        local_400[0x28] = (RTCHitN)auVar196[0x28];
                        local_400[0x29] = (RTCHitN)auVar196[0x29];
                        local_400[0x2a] = (RTCHitN)auVar196[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar196[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar196[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar196[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar196[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar196[0x2f];
                        local_400[0x30] = (RTCHitN)auVar196[0x30];
                        local_400[0x31] = (RTCHitN)auVar196[0x31];
                        local_400[0x32] = (RTCHitN)auVar196[0x32];
                        local_400[0x33] = (RTCHitN)auVar196[0x33];
                        local_400[0x34] = (RTCHitN)auVar196[0x34];
                        local_400[0x35] = (RTCHitN)auVar196[0x35];
                        local_400[0x36] = (RTCHitN)auVar196[0x36];
                        local_400[0x37] = (RTCHitN)auVar196[0x37];
                        local_400[0x38] = (RTCHitN)auVar196[0x38];
                        local_400[0x39] = (RTCHitN)auVar196[0x39];
                        local_400[0x3a] = (RTCHitN)auVar196[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar196[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar196[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar196[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar196[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar196[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_480._0_8_;
                        uStack_2b8 = local_480._8_8_;
                        uStack_2b0 = local_480._16_8_;
                        uStack_2a8 = local_480._24_8_;
                        uStack_2a0 = local_480._32_8_;
                        uStack_298 = local_480._40_8_;
                        uStack_290 = local_480._48_8_;
                        uStack_288 = local_480._56_8_;
                        auVar196 = vmovdqa64_avx512f(local_440);
                        local_280 = vmovdqa64_avx512f(auVar196);
                        auVar126 = vpcmpeqd_avx2(auVar196._0_32_,auVar196._0_32_);
                        local_ae8[3] = auVar126;
                        local_ae8[2] = auVar126;
                        local_ae8[1] = auVar126;
                        *local_ae8 = auVar126;
                        local_240 = vbroadcastss_avx512f(ZEXT416(pRVar6->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(pRVar6->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar254;
                        local_8c0 = local_4c0;
                        local_b70.valid = (int *)local_8c0;
                        local_b70.geometryUserPtr = pGVar4->userPtr;
                        local_b70.context = context->user;
                        local_b70.hit = local_400;
                        local_b70.N = 0x10;
                        local_b70.ray = (RTCRayN *)ray;
                        if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar4->intersectionFilterN)(&local_b70);
                          auVar266 = ZEXT1664(ZEXT416((uint)fVar254));
                          auVar269 = ZEXT1664(auVar113);
                          auVar279 = ZEXT3264(local_ac0);
                          auVar281 = ZEXT3264(local_aa0);
                          auVar280 = ZEXT3264(local_a80);
                          auVar275 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        auVar166 = vmovdqa64_avx512f(local_8c0);
                        uVar24 = vptestmd_avx512f(auVar166,auVar166);
                        if ((short)uVar24 != 0) {
                          p_Var5 = context->args->filter;
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var5)(&local_b70);
                            auVar266 = ZEXT1664(ZEXT416((uint)fVar254));
                            auVar269 = ZEXT1664(auVar113);
                            auVar279 = ZEXT3264(local_ac0);
                            auVar281 = ZEXT3264(local_aa0);
                            auVar280 = ZEXT3264(local_a80);
                            auVar275 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar166 = vmovdqa64_avx512f(local_8c0);
                          uVar107 = vptestmd_avx512f(auVar166,auVar166);
                          if ((short)uVar107 != 0) {
                            iVar73 = *(int *)(local_b70.hit + 4);
                            iVar74 = *(int *)(local_b70.hit + 8);
                            iVar75 = *(int *)(local_b70.hit + 0xc);
                            iVar76 = *(int *)(local_b70.hit + 0x10);
                            iVar77 = *(int *)(local_b70.hit + 0x14);
                            iVar78 = *(int *)(local_b70.hit + 0x18);
                            iVar79 = *(int *)(local_b70.hit + 0x1c);
                            iVar80 = *(int *)(local_b70.hit + 0x20);
                            iVar81 = *(int *)(local_b70.hit + 0x24);
                            iVar82 = *(int *)(local_b70.hit + 0x28);
                            iVar83 = *(int *)(local_b70.hit + 0x2c);
                            iVar84 = *(int *)(local_b70.hit + 0x30);
                            iVar85 = *(int *)(local_b70.hit + 0x34);
                            iVar86 = *(int *)(local_b70.hit + 0x38);
                            iVar87 = *(int *)(local_b70.hit + 0x3c);
                            bVar98 = (byte)uVar107;
                            bVar106 = (bool)((byte)(uVar107 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar107 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar107 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar107 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar107 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar107 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar107 >> 7) & 1);
                            bVar97 = (byte)(uVar107 >> 8);
                            bVar14 = (bool)((byte)(uVar107 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar107 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar107 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar107 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar107 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar107 >> 0xe) & 1);
                            bVar20 = SUB81(uVar107 >> 0xf,0);
                            *(uint *)(local_b70.ray + 0x300) =
                                 (uint)(bVar98 & 1) * *(int *)local_b70.hit |
                                 (uint)!(bool)(bVar98 & 1) * *(int *)(local_b70.ray + 0x300);
                            *(uint *)(local_b70.ray + 0x304) =
                                 (uint)bVar106 * iVar73 |
                                 (uint)!bVar106 * *(int *)(local_b70.ray + 0x304);
                            *(uint *)(local_b70.ray + 0x308) =
                                 (uint)bVar8 * iVar74 |
                                 (uint)!bVar8 * *(int *)(local_b70.ray + 0x308);
                            *(uint *)(local_b70.ray + 0x30c) =
                                 (uint)bVar9 * iVar75 |
                                 (uint)!bVar9 * *(int *)(local_b70.ray + 0x30c);
                            *(uint *)(local_b70.ray + 0x310) =
                                 (uint)bVar10 * iVar76 |
                                 (uint)!bVar10 * *(int *)(local_b70.ray + 0x310);
                            *(uint *)(local_b70.ray + 0x314) =
                                 (uint)bVar11 * iVar77 |
                                 (uint)!bVar11 * *(int *)(local_b70.ray + 0x314);
                            *(uint *)(local_b70.ray + 0x318) =
                                 (uint)bVar12 * iVar78 |
                                 (uint)!bVar12 * *(int *)(local_b70.ray + 0x318);
                            *(uint *)(local_b70.ray + 0x31c) =
                                 (uint)bVar13 * iVar79 |
                                 (uint)!bVar13 * *(int *)(local_b70.ray + 0x31c);
                            *(uint *)(local_b70.ray + 800) =
                                 (uint)(bVar97 & 1) * iVar80 |
                                 (uint)!(bool)(bVar97 & 1) * *(int *)(local_b70.ray + 800);
                            *(uint *)(local_b70.ray + 0x324) =
                                 (uint)bVar14 * iVar81 |
                                 (uint)!bVar14 * *(int *)(local_b70.ray + 0x324);
                            *(uint *)(local_b70.ray + 0x328) =
                                 (uint)bVar15 * iVar82 |
                                 (uint)!bVar15 * *(int *)(local_b70.ray + 0x328);
                            *(uint *)(local_b70.ray + 0x32c) =
                                 (uint)bVar16 * iVar83 |
                                 (uint)!bVar16 * *(int *)(local_b70.ray + 0x32c);
                            *(uint *)(local_b70.ray + 0x330) =
                                 (uint)bVar17 * iVar84 |
                                 (uint)!bVar17 * *(int *)(local_b70.ray + 0x330);
                            *(uint *)(local_b70.ray + 0x334) =
                                 (uint)bVar18 * iVar85 |
                                 (uint)!bVar18 * *(int *)(local_b70.ray + 0x334);
                            *(uint *)(local_b70.ray + 0x338) =
                                 (uint)bVar19 * iVar86 |
                                 (uint)!bVar19 * *(int *)(local_b70.ray + 0x338);
                            *(uint *)(local_b70.ray + 0x33c) =
                                 (uint)bVar20 * iVar87 |
                                 (uint)!bVar20 * *(int *)(local_b70.ray + 0x33c);
                            iVar73 = *(int *)(local_b70.hit + 0x44);
                            iVar74 = *(int *)(local_b70.hit + 0x48);
                            iVar75 = *(int *)(local_b70.hit + 0x4c);
                            iVar76 = *(int *)(local_b70.hit + 0x50);
                            iVar77 = *(int *)(local_b70.hit + 0x54);
                            iVar78 = *(int *)(local_b70.hit + 0x58);
                            iVar79 = *(int *)(local_b70.hit + 0x5c);
                            iVar80 = *(int *)(local_b70.hit + 0x60);
                            iVar81 = *(int *)(local_b70.hit + 100);
                            iVar82 = *(int *)(local_b70.hit + 0x68);
                            iVar83 = *(int *)(local_b70.hit + 0x6c);
                            iVar84 = *(int *)(local_b70.hit + 0x70);
                            iVar85 = *(int *)(local_b70.hit + 0x74);
                            iVar86 = *(int *)(local_b70.hit + 0x78);
                            iVar87 = *(int *)(local_b70.hit + 0x7c);
                            bVar106 = (bool)((byte)(uVar107 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar107 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar107 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar107 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar107 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar107 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar107 >> 7) & 1);
                            bVar14 = (bool)((byte)(uVar107 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar107 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar107 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar107 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar107 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar107 >> 0xe) & 1);
                            bVar20 = SUB81(uVar107 >> 0xf,0);
                            *(uint *)(local_b70.ray + 0x340) =
                                 (uint)(bVar98 & 1) * *(int *)(local_b70.hit + 0x40) |
                                 (uint)!(bool)(bVar98 & 1) * *(int *)(local_b70.ray + 0x340);
                            *(uint *)(local_b70.ray + 0x344) =
                                 (uint)bVar106 * iVar73 |
                                 (uint)!bVar106 * *(int *)(local_b70.ray + 0x344);
                            *(uint *)(local_b70.ray + 0x348) =
                                 (uint)bVar8 * iVar74 |
                                 (uint)!bVar8 * *(int *)(local_b70.ray + 0x348);
                            *(uint *)(local_b70.ray + 0x34c) =
                                 (uint)bVar9 * iVar75 |
                                 (uint)!bVar9 * *(int *)(local_b70.ray + 0x34c);
                            *(uint *)(local_b70.ray + 0x350) =
                                 (uint)bVar10 * iVar76 |
                                 (uint)!bVar10 * *(int *)(local_b70.ray + 0x350);
                            *(uint *)(local_b70.ray + 0x354) =
                                 (uint)bVar11 * iVar77 |
                                 (uint)!bVar11 * *(int *)(local_b70.ray + 0x354);
                            *(uint *)(local_b70.ray + 0x358) =
                                 (uint)bVar12 * iVar78 |
                                 (uint)!bVar12 * *(int *)(local_b70.ray + 0x358);
                            *(uint *)(local_b70.ray + 0x35c) =
                                 (uint)bVar13 * iVar79 |
                                 (uint)!bVar13 * *(int *)(local_b70.ray + 0x35c);
                            *(uint *)(local_b70.ray + 0x360) =
                                 (uint)(bVar97 & 1) * iVar80 |
                                 (uint)!(bool)(bVar97 & 1) * *(int *)(local_b70.ray + 0x360);
                            *(uint *)(local_b70.ray + 0x364) =
                                 (uint)bVar14 * iVar81 |
                                 (uint)!bVar14 * *(int *)(local_b70.ray + 0x364);
                            *(uint *)(local_b70.ray + 0x368) =
                                 (uint)bVar15 * iVar82 |
                                 (uint)!bVar15 * *(int *)(local_b70.ray + 0x368);
                            *(uint *)(local_b70.ray + 0x36c) =
                                 (uint)bVar16 * iVar83 |
                                 (uint)!bVar16 * *(int *)(local_b70.ray + 0x36c);
                            *(uint *)(local_b70.ray + 0x370) =
                                 (uint)bVar17 * iVar84 |
                                 (uint)!bVar17 * *(int *)(local_b70.ray + 0x370);
                            *(uint *)(local_b70.ray + 0x374) =
                                 (uint)bVar18 * iVar85 |
                                 (uint)!bVar18 * *(int *)(local_b70.ray + 0x374);
                            *(uint *)(local_b70.ray + 0x378) =
                                 (uint)bVar19 * iVar86 |
                                 (uint)!bVar19 * *(int *)(local_b70.ray + 0x378);
                            *(uint *)(local_b70.ray + 0x37c) =
                                 (uint)bVar20 * iVar87 |
                                 (uint)!bVar20 * *(int *)(local_b70.ray + 0x37c);
                            iVar73 = *(int *)(local_b70.hit + 0x84);
                            iVar74 = *(int *)(local_b70.hit + 0x88);
                            iVar75 = *(int *)(local_b70.hit + 0x8c);
                            iVar76 = *(int *)(local_b70.hit + 0x90);
                            iVar77 = *(int *)(local_b70.hit + 0x94);
                            iVar78 = *(int *)(local_b70.hit + 0x98);
                            iVar79 = *(int *)(local_b70.hit + 0x9c);
                            iVar80 = *(int *)(local_b70.hit + 0xa0);
                            iVar81 = *(int *)(local_b70.hit + 0xa4);
                            iVar82 = *(int *)(local_b70.hit + 0xa8);
                            iVar83 = *(int *)(local_b70.hit + 0xac);
                            iVar84 = *(int *)(local_b70.hit + 0xb0);
                            iVar85 = *(int *)(local_b70.hit + 0xb4);
                            iVar86 = *(int *)(local_b70.hit + 0xb8);
                            iVar87 = *(int *)(local_b70.hit + 0xbc);
                            bVar106 = (bool)((byte)(uVar107 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar107 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar107 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar107 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar107 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar107 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar107 >> 7) & 1);
                            bVar14 = (bool)((byte)(uVar107 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar107 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar107 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar107 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar107 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar107 >> 0xe) & 1);
                            bVar20 = SUB81(uVar107 >> 0xf,0);
                            *(uint *)(local_b70.ray + 0x380) =
                                 (uint)(bVar98 & 1) * *(int *)(local_b70.hit + 0x80) |
                                 (uint)!(bool)(bVar98 & 1) * *(int *)(local_b70.ray + 0x380);
                            *(uint *)(local_b70.ray + 900) =
                                 (uint)bVar106 * iVar73 |
                                 (uint)!bVar106 * *(int *)(local_b70.ray + 900);
                            *(uint *)(local_b70.ray + 0x388) =
                                 (uint)bVar8 * iVar74 |
                                 (uint)!bVar8 * *(int *)(local_b70.ray + 0x388);
                            *(uint *)(local_b70.ray + 0x38c) =
                                 (uint)bVar9 * iVar75 |
                                 (uint)!bVar9 * *(int *)(local_b70.ray + 0x38c);
                            *(uint *)(local_b70.ray + 0x390) =
                                 (uint)bVar10 * iVar76 |
                                 (uint)!bVar10 * *(int *)(local_b70.ray + 0x390);
                            *(uint *)(local_b70.ray + 0x394) =
                                 (uint)bVar11 * iVar77 |
                                 (uint)!bVar11 * *(int *)(local_b70.ray + 0x394);
                            *(uint *)(local_b70.ray + 0x398) =
                                 (uint)bVar12 * iVar78 |
                                 (uint)!bVar12 * *(int *)(local_b70.ray + 0x398);
                            *(uint *)(local_b70.ray + 0x39c) =
                                 (uint)bVar13 * iVar79 |
                                 (uint)!bVar13 * *(int *)(local_b70.ray + 0x39c);
                            *(uint *)(local_b70.ray + 0x3a0) =
                                 (uint)(bVar97 & 1) * iVar80 |
                                 (uint)!(bool)(bVar97 & 1) * *(int *)(local_b70.ray + 0x3a0);
                            *(uint *)(local_b70.ray + 0x3a4) =
                                 (uint)bVar14 * iVar81 |
                                 (uint)!bVar14 * *(int *)(local_b70.ray + 0x3a4);
                            *(uint *)(local_b70.ray + 0x3a8) =
                                 (uint)bVar15 * iVar82 |
                                 (uint)!bVar15 * *(int *)(local_b70.ray + 0x3a8);
                            *(uint *)(local_b70.ray + 0x3ac) =
                                 (uint)bVar16 * iVar83 |
                                 (uint)!bVar16 * *(int *)(local_b70.ray + 0x3ac);
                            *(uint *)(local_b70.ray + 0x3b0) =
                                 (uint)bVar17 * iVar84 |
                                 (uint)!bVar17 * *(int *)(local_b70.ray + 0x3b0);
                            *(uint *)(local_b70.ray + 0x3b4) =
                                 (uint)bVar18 * iVar85 |
                                 (uint)!bVar18 * *(int *)(local_b70.ray + 0x3b4);
                            *(uint *)(local_b70.ray + 0x3b8) =
                                 (uint)bVar19 * iVar86 |
                                 (uint)!bVar19 * *(int *)(local_b70.ray + 0x3b8);
                            *(uint *)(local_b70.ray + 0x3bc) =
                                 (uint)bVar20 * iVar87 |
                                 (uint)!bVar20 * *(int *)(local_b70.ray + 0x3bc);
                            iVar73 = *(int *)(local_b70.hit + 0xc4);
                            iVar74 = *(int *)(local_b70.hit + 200);
                            iVar75 = *(int *)(local_b70.hit + 0xcc);
                            iVar76 = *(int *)(local_b70.hit + 0xd0);
                            iVar77 = *(int *)(local_b70.hit + 0xd4);
                            iVar78 = *(int *)(local_b70.hit + 0xd8);
                            iVar79 = *(int *)(local_b70.hit + 0xdc);
                            iVar80 = *(int *)(local_b70.hit + 0xe0);
                            iVar81 = *(int *)(local_b70.hit + 0xe4);
                            iVar82 = *(int *)(local_b70.hit + 0xe8);
                            iVar83 = *(int *)(local_b70.hit + 0xec);
                            iVar84 = *(int *)(local_b70.hit + 0xf0);
                            iVar85 = *(int *)(local_b70.hit + 0xf4);
                            iVar86 = *(int *)(local_b70.hit + 0xf8);
                            iVar87 = *(int *)(local_b70.hit + 0xfc);
                            bVar106 = (bool)((byte)(uVar107 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar107 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar107 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar107 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar107 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar107 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar107 >> 7) & 1);
                            bVar14 = (bool)((byte)(uVar107 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar107 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar107 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar107 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar107 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar107 >> 0xe) & 1);
                            bVar20 = SUB81(uVar107 >> 0xf,0);
                            *(uint *)(local_b70.ray + 0x3c0) =
                                 (uint)(bVar98 & 1) * *(int *)(local_b70.hit + 0xc0) |
                                 (uint)!(bool)(bVar98 & 1) * *(int *)(local_b70.ray + 0x3c0);
                            *(uint *)(local_b70.ray + 0x3c4) =
                                 (uint)bVar106 * iVar73 |
                                 (uint)!bVar106 * *(int *)(local_b70.ray + 0x3c4);
                            *(uint *)(local_b70.ray + 0x3c8) =
                                 (uint)bVar8 * iVar74 |
                                 (uint)!bVar8 * *(int *)(local_b70.ray + 0x3c8);
                            *(uint *)(local_b70.ray + 0x3cc) =
                                 (uint)bVar9 * iVar75 |
                                 (uint)!bVar9 * *(int *)(local_b70.ray + 0x3cc);
                            *(uint *)(local_b70.ray + 0x3d0) =
                                 (uint)bVar10 * iVar76 |
                                 (uint)!bVar10 * *(int *)(local_b70.ray + 0x3d0);
                            *(uint *)(local_b70.ray + 0x3d4) =
                                 (uint)bVar11 * iVar77 |
                                 (uint)!bVar11 * *(int *)(local_b70.ray + 0x3d4);
                            *(uint *)(local_b70.ray + 0x3d8) =
                                 (uint)bVar12 * iVar78 |
                                 (uint)!bVar12 * *(int *)(local_b70.ray + 0x3d8);
                            *(uint *)(local_b70.ray + 0x3dc) =
                                 (uint)bVar13 * iVar79 |
                                 (uint)!bVar13 * *(int *)(local_b70.ray + 0x3dc);
                            *(uint *)(local_b70.ray + 0x3e0) =
                                 (uint)(bVar97 & 1) * iVar80 |
                                 (uint)!(bool)(bVar97 & 1) * *(int *)(local_b70.ray + 0x3e0);
                            *(uint *)(local_b70.ray + 0x3e4) =
                                 (uint)bVar14 * iVar81 |
                                 (uint)!bVar14 * *(int *)(local_b70.ray + 0x3e4);
                            *(uint *)(local_b70.ray + 1000) =
                                 (uint)bVar15 * iVar82 |
                                 (uint)!bVar15 * *(int *)(local_b70.ray + 1000);
                            *(uint *)(local_b70.ray + 0x3ec) =
                                 (uint)bVar16 * iVar83 |
                                 (uint)!bVar16 * *(int *)(local_b70.ray + 0x3ec);
                            *(uint *)(local_b70.ray + 0x3f0) =
                                 (uint)bVar17 * iVar84 |
                                 (uint)!bVar17 * *(int *)(local_b70.ray + 0x3f0);
                            *(uint *)(local_b70.ray + 0x3f4) =
                                 (uint)bVar18 * iVar85 |
                                 (uint)!bVar18 * *(int *)(local_b70.ray + 0x3f4);
                            *(uint *)(local_b70.ray + 0x3f8) =
                                 (uint)bVar19 * iVar86 |
                                 (uint)!bVar19 * *(int *)(local_b70.ray + 0x3f8);
                            *(uint *)(local_b70.ray + 0x3fc) =
                                 (uint)bVar20 * iVar87 |
                                 (uint)!bVar20 * *(int *)(local_b70.ray + 0x3fc);
                            iVar73 = *(int *)(local_b70.hit + 0x104);
                            iVar74 = *(int *)(local_b70.hit + 0x108);
                            iVar75 = *(int *)(local_b70.hit + 0x10c);
                            iVar76 = *(int *)(local_b70.hit + 0x110);
                            iVar77 = *(int *)(local_b70.hit + 0x114);
                            iVar78 = *(int *)(local_b70.hit + 0x118);
                            iVar79 = *(int *)(local_b70.hit + 0x11c);
                            iVar80 = *(int *)(local_b70.hit + 0x120);
                            iVar81 = *(int *)(local_b70.hit + 0x124);
                            iVar82 = *(int *)(local_b70.hit + 0x128);
                            iVar83 = *(int *)(local_b70.hit + 300);
                            iVar84 = *(int *)(local_b70.hit + 0x130);
                            iVar85 = *(int *)(local_b70.hit + 0x134);
                            iVar86 = *(int *)(local_b70.hit + 0x138);
                            iVar87 = *(int *)(local_b70.hit + 0x13c);
                            bVar106 = (bool)((byte)(uVar107 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar107 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar107 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar107 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar107 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar107 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar107 >> 7) & 1);
                            bVar14 = (bool)((byte)(uVar107 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar107 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar107 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar107 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar107 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar107 >> 0xe) & 1);
                            bVar20 = SUB81(uVar107 >> 0xf,0);
                            *(uint *)(local_b70.ray + 0x400) =
                                 (uint)(bVar98 & 1) * *(int *)(local_b70.hit + 0x100) |
                                 (uint)!(bool)(bVar98 & 1) * *(int *)(local_b70.ray + 0x400);
                            *(uint *)(local_b70.ray + 0x404) =
                                 (uint)bVar106 * iVar73 |
                                 (uint)!bVar106 * *(int *)(local_b70.ray + 0x404);
                            *(uint *)(local_b70.ray + 0x408) =
                                 (uint)bVar8 * iVar74 |
                                 (uint)!bVar8 * *(int *)(local_b70.ray + 0x408);
                            *(uint *)(local_b70.ray + 0x40c) =
                                 (uint)bVar9 * iVar75 |
                                 (uint)!bVar9 * *(int *)(local_b70.ray + 0x40c);
                            *(uint *)(local_b70.ray + 0x410) =
                                 (uint)bVar10 * iVar76 |
                                 (uint)!bVar10 * *(int *)(local_b70.ray + 0x410);
                            *(uint *)(local_b70.ray + 0x414) =
                                 (uint)bVar11 * iVar77 |
                                 (uint)!bVar11 * *(int *)(local_b70.ray + 0x414);
                            *(uint *)(local_b70.ray + 0x418) =
                                 (uint)bVar12 * iVar78 |
                                 (uint)!bVar12 * *(int *)(local_b70.ray + 0x418);
                            *(uint *)(local_b70.ray + 0x41c) =
                                 (uint)bVar13 * iVar79 |
                                 (uint)!bVar13 * *(int *)(local_b70.ray + 0x41c);
                            *(uint *)(local_b70.ray + 0x420) =
                                 (uint)(bVar97 & 1) * iVar80 |
                                 (uint)!(bool)(bVar97 & 1) * *(int *)(local_b70.ray + 0x420);
                            *(uint *)(local_b70.ray + 0x424) =
                                 (uint)bVar14 * iVar81 |
                                 (uint)!bVar14 * *(int *)(local_b70.ray + 0x424);
                            *(uint *)(local_b70.ray + 0x428) =
                                 (uint)bVar15 * iVar82 |
                                 (uint)!bVar15 * *(int *)(local_b70.ray + 0x428);
                            *(uint *)(local_b70.ray + 0x42c) =
                                 (uint)bVar16 * iVar83 |
                                 (uint)!bVar16 * *(int *)(local_b70.ray + 0x42c);
                            *(uint *)(local_b70.ray + 0x430) =
                                 (uint)bVar17 * iVar84 |
                                 (uint)!bVar17 * *(int *)(local_b70.ray + 0x430);
                            *(uint *)(local_b70.ray + 0x434) =
                                 (uint)bVar18 * iVar85 |
                                 (uint)!bVar18 * *(int *)(local_b70.ray + 0x434);
                            *(uint *)(local_b70.ray + 0x438) =
                                 (uint)bVar19 * iVar86 |
                                 (uint)!bVar19 * *(int *)(local_b70.ray + 0x438);
                            *(uint *)(local_b70.ray + 0x43c) =
                                 (uint)bVar20 * iVar87 |
                                 (uint)!bVar20 * *(int *)(local_b70.ray + 0x43c);
                            auVar196 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b70.hit + 0x140));
                            auVar196 = vmovdqu32_avx512f(auVar196);
                            *(undefined1 (*) [64])(local_b70.ray + 0x440) = auVar196;
                            auVar196 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b70.hit + 0x180));
                            auVar196 = vmovdqu32_avx512f(auVar196);
                            *(undefined1 (*) [64])(local_b70.ray + 0x480) = auVar196;
                            auVar228 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b70.hit + 0x1c0));
                            auVar196 = vmovdqa32_avx512f(auVar228);
                            *(undefined1 (*) [64])(local_b70.ray + 0x4c0) = auVar196;
                            auVar196 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b70.hit + 0x200));
                            bVar106 = (bool)((byte)(uVar107 >> 1) & 1);
                            auVar68._4_56_ = auVar196._8_56_;
                            auVar68._0_4_ =
                                 (uint)bVar106 * auVar196._4_4_ | (uint)!bVar106 * auVar228._4_4_;
                            auVar166._0_8_ = auVar68._0_8_ << 0x20;
                            bVar106 = (bool)((byte)(uVar107 >> 2) & 1);
                            auVar166._8_4_ =
                                 (uint)bVar106 * auVar196._8_4_ | (uint)!bVar106 * auVar228._8_4_;
                            bVar106 = (bool)((byte)(uVar107 >> 3) & 1);
                            auVar166._12_4_ =
                                 (uint)bVar106 * auVar196._12_4_ | (uint)!bVar106 * auVar228._12_4_;
                            bVar106 = (bool)((byte)(uVar107 >> 4) & 1);
                            auVar166._16_4_ =
                                 (uint)bVar106 * auVar196._16_4_ | (uint)!bVar106 * auVar228._16_4_;
                            bVar106 = (bool)((byte)(uVar107 >> 5) & 1);
                            auVar166._20_4_ =
                                 (uint)bVar106 * auVar196._20_4_ | (uint)!bVar106 * auVar228._20_4_;
                            bVar106 = (bool)((byte)(uVar107 >> 6) & 1);
                            auVar166._24_4_ =
                                 (uint)bVar106 * auVar196._24_4_ | (uint)!bVar106 * auVar228._24_4_;
                            bVar106 = (bool)((byte)(uVar107 >> 7) & 1);
                            auVar166._28_4_ =
                                 (uint)bVar106 * auVar196._28_4_ | (uint)!bVar106 * auVar228._28_4_;
                            auVar166._32_4_ =
                                 (uint)(bVar97 & 1) * auVar196._32_4_ |
                                 (uint)!(bool)(bVar97 & 1) * auVar228._32_4_;
                            bVar106 = (bool)((byte)(uVar107 >> 9) & 1);
                            auVar166._36_4_ =
                                 (uint)bVar106 * auVar196._36_4_ | (uint)!bVar106 * auVar228._36_4_;
                            bVar106 = (bool)((byte)(uVar107 >> 10) & 1);
                            auVar166._40_4_ =
                                 (uint)bVar106 * auVar196._40_4_ | (uint)!bVar106 * auVar228._40_4_;
                            bVar106 = (bool)((byte)(uVar107 >> 0xb) & 1);
                            auVar166._44_4_ =
                                 (uint)bVar106 * auVar196._44_4_ | (uint)!bVar106 * auVar228._44_4_;
                            bVar106 = (bool)((byte)(uVar107 >> 0xc) & 1);
                            auVar166._48_4_ =
                                 (uint)bVar106 * auVar196._48_4_ | (uint)!bVar106 * auVar228._48_4_;
                            bVar106 = (bool)((byte)(uVar107 >> 0xd) & 1);
                            auVar166._52_4_ =
                                 (uint)bVar106 * auVar196._52_4_ | (uint)!bVar106 * auVar228._52_4_;
                            bVar106 = (bool)((byte)(uVar107 >> 0xe) & 1);
                            auVar166._56_4_ =
                                 (uint)bVar106 * auVar196._56_4_ | (uint)!bVar106 * auVar228._56_4_;
                            bVar106 = SUB81(uVar107 >> 0xf,0);
                            auVar166._60_4_ =
                                 (uint)bVar106 * auVar196._60_4_ | (uint)!bVar106 * auVar228._60_4_;
                            auVar196 = vmovdqa32_avx512f(auVar196);
                            *(undefined1 (*) [64])(local_b70.ray + 0x500) = auVar196;
                            goto LAB_01db6ee7;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x200) = fVar258;
                      }
                    }
                  }
                }
LAB_01db6ee7:
                auVar124 = auVar166._32_32_;
                bVar106 = lVar105 != 0;
                lVar105 = lVar105 + -1;
              } while ((!bVar7) && (bVar106));
              auVar88._4_4_ = fStack_85c;
              auVar88._0_4_ = local_860;
              auVar88._8_4_ = fStack_858;
              auVar88._12_4_ = fStack_854;
              auVar88._16_4_ = fStack_850;
              auVar88._20_4_ = fStack_84c;
              auVar88._24_4_ = fStack_848;
              auVar88._28_4_ = fStack_844;
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar40._4_4_ = uVar1;
              auVar40._0_4_ = uVar1;
              auVar40._8_4_ = uVar1;
              auVar40._12_4_ = uVar1;
              auVar40._16_4_ = uVar1;
              auVar40._20_4_ = uVar1;
              auVar40._24_4_ = uVar1;
              auVar40._28_4_ = uVar1;
              uVar24 = vcmpps_avx512vl(auVar88,auVar40,2);
              bVar101 = ~('\x01' << ((byte)iVar25 & 0x1f)) & bVar101 & (byte)uVar24;
            } while (bVar101 != 0);
          }
          auVar192._0_4_ = (float)local_880._0_4_ + (float)local_940._0_4_;
          auVar192._4_4_ = (float)local_880._4_4_ + (float)local_940._4_4_;
          auVar192._8_4_ = fStack_878 + fStack_938;
          auVar192._12_4_ = fStack_874 + fStack_934;
          auVar192._16_4_ = fStack_870 + fStack_930;
          auVar192._20_4_ = fStack_86c + fStack_92c;
          auVar192._24_4_ = fStack_868 + fStack_928;
          auVar192._28_4_ = fStack_864 + fStack_924;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar41._4_4_ = uVar1;
          auVar41._0_4_ = uVar1;
          auVar41._8_4_ = uVar1;
          auVar41._12_4_ = uVar1;
          auVar41._16_4_ = uVar1;
          auVar41._20_4_ = uVar1;
          auVar41._24_4_ = uVar1;
          auVar41._28_4_ = uVar1;
          uVar24 = vcmpps_avx512vl(auVar192,auVar41,2);
          bVar102 = (byte)uVar22 | ~bVar102;
          bVar96 = (byte)uVar23 & bVar96 & (byte)uVar24;
          auVar193._8_4_ = 2;
          auVar193._0_8_ = 0x200000002;
          auVar193._12_4_ = 2;
          auVar193._16_4_ = 2;
          auVar193._20_4_ = 2;
          auVar193._24_4_ = 2;
          auVar193._28_4_ = 2;
          auVar42._8_4_ = 3;
          auVar42._0_8_ = 0x300000003;
          auVar42._12_4_ = 3;
          auVar42._16_4_ = 3;
          auVar42._20_4_ = 3;
          auVar42._24_4_ = 3;
          auVar42._28_4_ = 3;
          auVar126 = vpblendmd_avx512vl(auVar193,auVar42);
          local_880._0_4_ = (uint)(bVar102 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar102 & 1) * 2;
          bVar7 = (bool)(bVar102 >> 1 & 1);
          local_880._4_4_ = (uint)bVar7 * auVar126._4_4_ | (uint)!bVar7 * 2;
          bVar7 = (bool)(bVar102 >> 2 & 1);
          fStack_878 = (float)((uint)bVar7 * auVar126._8_4_ | (uint)!bVar7 * 2);
          bVar7 = (bool)(bVar102 >> 3 & 1);
          fStack_874 = (float)((uint)bVar7 * auVar126._12_4_ | (uint)!bVar7 * 2);
          bVar7 = (bool)(bVar102 >> 4 & 1);
          fStack_870 = (float)((uint)bVar7 * auVar126._16_4_ | (uint)!bVar7 * 2);
          bVar7 = (bool)(bVar102 >> 5 & 1);
          fStack_86c = (float)((uint)bVar7 * auVar126._20_4_ | (uint)!bVar7 * 2);
          bVar7 = (bool)(bVar102 >> 6 & 1);
          fStack_868 = (float)((uint)bVar7 * auVar126._24_4_ | (uint)!bVar7 * 2);
          fStack_864 = (float)((uint)(bVar102 >> 7) * auVar126._28_4_ |
                              (uint)!(bool)(bVar102 >> 7) * 2);
          auVar170._32_32_ = auVar124;
          auVar170._0_32_ = _local_880;
          uVar22 = vpcmpd_avx512vl(_local_880,local_800,2);
          bVar102 = (byte)uVar22 & bVar96;
          if (bVar102 != 0) {
            auVar113 = vminps_avx(local_9e0._0_16_,local_a20._0_16_);
            auVar109 = vmaxps_avx(local_9e0._0_16_,local_a20._0_16_);
            auVar112 = vminps_avx(local_a00._0_16_,local_a40._0_16_);
            auVar110 = vminps_avx(auVar113,auVar112);
            auVar113 = vmaxps_avx(local_a00._0_16_,local_a40._0_16_);
            auVar112 = vmaxps_avx(auVar109,auVar113);
            auVar109 = vandps_avx(auVar275._0_16_,auVar110);
            auVar113 = vandps_avx(auVar275._0_16_,auVar112);
            auVar109 = vmaxps_avx(auVar109,auVar113);
            auVar113 = vmovshdup_avx(auVar109);
            auVar113 = vmaxss_avx(auVar113,auVar109);
            auVar109 = vshufpd_avx(auVar109,auVar109,1);
            auVar109 = vmaxss_avx(auVar109,auVar113);
            fVar178 = auVar109._0_4_ * 1.9073486e-06;
            local_9b0 = vshufps_avx(auVar112,auVar112,0xff);
            _local_960 = _local_7a0;
            local_860 = (float)local_7a0._0_4_ + (float)local_940._0_4_;
            fStack_85c = (float)local_7a0._4_4_ + (float)local_940._4_4_;
            fStack_858 = fStack_798 + fStack_938;
            fStack_854 = fStack_794 + fStack_934;
            fStack_850 = fStack_790 + fStack_930;
            fStack_84c = fStack_78c + fStack_92c;
            fStack_848 = fStack_788 + fStack_928;
            fStack_844 = fStack_784 + fStack_924;
            do {
              auVar194._8_4_ = 0x7f800000;
              auVar194._0_8_ = 0x7f8000007f800000;
              auVar194._12_4_ = 0x7f800000;
              auVar194._16_4_ = 0x7f800000;
              auVar194._20_4_ = 0x7f800000;
              auVar194._24_4_ = 0x7f800000;
              auVar194._28_4_ = 0x7f800000;
              auVar126 = vblendmps_avx512vl(auVar194,_local_960);
              auVar161._0_4_ =
                   (uint)(bVar102 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar102 & 1) * 0x7f800000;
              bVar7 = (bool)(bVar102 >> 1 & 1);
              auVar161._4_4_ = (uint)bVar7 * auVar126._4_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar102 >> 2 & 1);
              auVar161._8_4_ = (uint)bVar7 * auVar126._8_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar102 >> 3 & 1);
              auVar161._12_4_ = (uint)bVar7 * auVar126._12_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar102 >> 4 & 1);
              auVar161._16_4_ = (uint)bVar7 * auVar126._16_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar102 >> 5 & 1);
              auVar161._20_4_ = (uint)bVar7 * auVar126._20_4_ | (uint)!bVar7 * 0x7f800000;
              auVar161._24_4_ =
                   (uint)(bVar102 >> 6) * auVar126._24_4_ | (uint)!(bool)(bVar102 >> 6) * 0x7f800000
              ;
              auVar161._28_4_ = 0x7f800000;
              auVar170._0_32_ = auVar161;
              auVar126 = vshufps_avx(auVar161,auVar161,0xb1);
              auVar126 = vminps_avx(auVar161,auVar126);
              auVar124 = vshufpd_avx(auVar126,auVar126,5);
              auVar126 = vminps_avx(auVar126,auVar124);
              auVar124 = vpermpd_avx2(auVar126,0x4e);
              auVar126 = vminps_avx(auVar126,auVar124);
              uVar22 = vcmpps_avx512vl(auVar161,auVar126,0);
              bVar98 = (byte)uVar22 & bVar102;
              bVar101 = bVar102;
              if (bVar98 != 0) {
                bVar101 = bVar98;
              }
              iVar25 = 0;
              for (uVar108 = (uint)bVar101; (uVar108 & 1) == 0; uVar108 = uVar108 >> 1 | 0x80000000)
              {
                iVar25 = iVar25 + 1;
              }
              uVar108 = *(uint *)(local_840 + (uint)(iVar25 << 2));
              fVar253 = *(float *)(local_780 + (uint)(iVar25 << 2));
              fVar254 = auVar111._0_4_;
              if ((float)local_a60._0_4_ < 0.0) {
                fVar254 = sqrtf((float)local_a60._0_4_);
              }
              auVar269 = ZEXT464(uVar108);
              lVar105 = 4;
              do {
                auVar126 = auVar170._32_32_;
                auVar182._4_4_ = fVar253;
                auVar182._0_4_ = fVar253;
                auVar182._8_4_ = fVar253;
                auVar182._12_4_ = fVar253;
                auVar109 = vfmadd132ps_fma(auVar182,ZEXT816(0) << 0x40,local_a50);
                fVar262 = auVar269._0_4_;
                fVar229 = 1.0 - fVar262;
                auVar115 = SUB6416(ZEXT464(0x40400000),0);
                auVar114 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar268 = auVar269._0_16_;
                auVar112 = vfmadd213ss_fma(auVar115,auVar268,auVar114);
                auVar113 = vfmadd213ss_fma(auVar112,ZEXT416((uint)(fVar262 * fVar262)),
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar110 = vfmadd213ss_fma(auVar115,ZEXT416((uint)fVar229),auVar114);
                auVar110 = vfmadd213ss_fma(auVar110,ZEXT416((uint)(fVar229 * fVar229)),
                                           SUB6416(ZEXT464(0x40000000),0));
                fVar255 = fVar229 * fVar229 * -fVar262 * 0.5;
                fVar258 = auVar113._0_4_ * 0.5;
                fVar256 = auVar110._0_4_ * 0.5;
                fVar257 = fVar262 * fVar262 * -fVar229 * 0.5;
                auVar234._0_4_ = fVar257 * (float)local_a40._0_4_;
                auVar234._4_4_ = fVar257 * (float)local_a40._4_4_;
                auVar234._8_4_ = fVar257 * fStack_a38;
                auVar234._12_4_ = fVar257 * fStack_a34;
                auVar244._4_4_ = fVar256;
                auVar244._0_4_ = fVar256;
                auVar244._8_4_ = fVar256;
                auVar244._12_4_ = fVar256;
                auVar113 = vfmadd132ps_fma(auVar244,auVar234,local_a00._0_16_);
                auVar221._4_4_ = fVar258;
                auVar221._0_4_ = fVar258;
                auVar221._8_4_ = fVar258;
                auVar221._12_4_ = fVar258;
                auVar113 = vfmadd132ps_fma(auVar221,auVar113,local_a20._0_16_);
                auVar235._4_4_ = fVar255;
                auVar235._0_4_ = fVar255;
                auVar235._8_4_ = fVar255;
                auVar235._12_4_ = fVar255;
                auVar113 = vfmadd132ps_fma(auVar235,auVar113,local_9e0._0_16_);
                auVar110 = vfmadd231ss_fma(auVar114,auVar268,ZEXT416(0x41100000));
                local_900._0_16_ = auVar110;
                auVar110 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar268,
                                           ZEXT416(0x40800000));
                local_920._0_16_ = auVar110;
                local_970 = vfmadd213ss_fma(auVar115,auVar268,ZEXT416(0xbf800000));
                local_8e0._0_16_ = auVar113;
                auVar113 = vsubps_avx(auVar109,auVar113);
                auVar109 = vdpps_avx(auVar113,auVar113,0x7f);
                fVar255 = auVar109._0_4_;
                if (fVar255 < 0.0) {
                  local_b20._0_4_ = auVar112._0_4_;
                  local_b40._0_16_ = ZEXT416((uint)fVar229);
                  auVar275._0_4_ = sqrtf(fVar255);
                  auVar275._4_60_ = extraout_var_01;
                  auVar112 = ZEXT416((uint)local_b20._0_4_);
                  auVar110 = auVar275._0_16_;
                  auVar114 = local_b40._0_16_;
                }
                else {
                  auVar110 = vsqrtss_avx(auVar109,auVar109);
                  auVar114 = ZEXT416((uint)fVar229);
                }
                fVar258 = auVar114._0_4_;
                auVar116 = vfnmadd231ss_fma(ZEXT416((uint)(fVar262 * (fVar258 + fVar258))),auVar114,
                                            auVar114);
                auVar112 = vfmadd213ss_fma(auVar112,ZEXT416((uint)(fVar262 + fVar262)),
                                           ZEXT416((uint)(fVar262 * fVar262 * 3.0)));
                auVar114 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar268,
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar115 = vfmadd231ss_fma(ZEXT416((uint)(fVar258 * fVar258 * -3.0)),
                                           ZEXT416((uint)(fVar258 + fVar258)),auVar114);
                auVar114 = vfmadd213ss_fma(ZEXT416((uint)(fVar229 * -2.0)),auVar268,
                                           ZEXT416((uint)(fVar262 * fVar262)));
                fVar258 = auVar116._0_4_ * 0.5;
                fVar256 = auVar112._0_4_ * 0.5;
                fVar257 = auVar115._0_4_ * 0.5;
                fVar229 = auVar114._0_4_ * 0.5;
                auVar236._0_4_ = fVar229 * (float)local_a40._0_4_;
                auVar236._4_4_ = fVar229 * (float)local_a40._4_4_;
                auVar236._8_4_ = fVar229 * fStack_a38;
                auVar236._12_4_ = fVar229 * fStack_a34;
                auVar222._4_4_ = fVar257;
                auVar222._0_4_ = fVar257;
                auVar222._8_4_ = fVar257;
                auVar222._12_4_ = fVar257;
                auVar112 = vfmadd132ps_fma(auVar222,auVar236,local_a00._0_16_);
                auVar204._4_4_ = fVar256;
                auVar204._0_4_ = fVar256;
                auVar204._8_4_ = fVar256;
                auVar204._12_4_ = fVar256;
                auVar112 = vfmadd132ps_fma(auVar204,auVar112,local_a20._0_16_);
                auVar278._4_4_ = fVar258;
                auVar278._0_4_ = fVar258;
                auVar278._8_4_ = fVar258;
                auVar278._12_4_ = fVar258;
                local_b20._0_16_ = vfmadd132ps_fma(auVar278,auVar112,local_9e0._0_16_);
                auVar112 = vdpps_avx(local_b20._0_16_,local_b20._0_16_,0x7f);
                auVar72._12_4_ = 0;
                auVar72._0_12_ = ZEXT812(0);
                fVar258 = auVar112._0_4_;
                auVar114 = vrsqrt14ss_avx512f(auVar72 << 0x20,ZEXT416((uint)fVar258));
                fVar256 = auVar114._0_4_;
                auVar115 = vrcp14ss_avx512f(auVar72 << 0x20,ZEXT416((uint)fVar258));
                auVar28._8_4_ = 0x80000000;
                auVar28._0_8_ = 0x8000000080000000;
                auVar28._12_4_ = 0x80000000;
                auVar116 = vxorps_avx512vl(auVar112,auVar28);
                auVar114 = vfnmadd213ss_fma(auVar115,auVar112,SUB6416(ZEXT464(0x40000000),0));
                local_b40._0_4_ = auVar110._0_4_;
                if (fVar258 < auVar116._0_4_) {
                  auVar279._0_4_ = sqrtf(fVar258);
                  auVar279._4_60_ = extraout_var_02;
                  auVar110 = ZEXT416((uint)local_b40._0_4_);
                  auVar116 = auVar279._0_16_;
                  auVar112 = local_b20._0_16_;
                }
                else {
                  auVar116 = vsqrtss_avx512f(auVar112,auVar112);
                  auVar112 = local_b20._0_16_;
                }
                fVar256 = fVar256 * 1.5 + fVar258 * -0.5 * fVar256 * fVar256 * fVar256;
                auVar183._0_4_ = auVar112._0_4_ * fVar256;
                auVar183._4_4_ = auVar112._4_4_ * fVar256;
                auVar183._8_4_ = auVar112._8_4_ * fVar256;
                auVar183._12_4_ = auVar112._12_4_ * fVar256;
                auVar251 = vdpps_avx(auVar113,auVar183,0x7f);
                fVar259 = auVar110._0_4_;
                fVar257 = auVar251._0_4_;
                auVar184._0_4_ = fVar257 * fVar257;
                auVar184._4_4_ = auVar251._4_4_ * auVar251._4_4_;
                auVar184._8_4_ = auVar251._8_4_ * auVar251._8_4_;
                auVar184._12_4_ = auVar251._12_4_ * auVar251._12_4_;
                auVar117 = vsubps_avx512vl(auVar109,auVar184);
                fVar229 = auVar117._0_4_;
                auVar205._4_12_ = ZEXT812(0) << 0x20;
                auVar205._0_4_ = fVar229;
                auVar118 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar205);
                auVar119 = vmulss_avx512f(auVar118,ZEXT416(0x3fc00000));
                auVar120 = vmulss_avx512f(auVar117,ZEXT416(0xbf000000));
                if (fVar229 < 0.0) {
                  local_990 = fVar256;
                  fStack_98c = fVar256;
                  fStack_988 = fVar256;
                  fStack_984 = fVar256;
                  local_980 = auVar118;
                  fVar229 = sqrtf(fVar229);
                  auVar120 = ZEXT416(auVar120._0_4_);
                  auVar119 = ZEXT416(auVar119._0_4_);
                  auVar116 = ZEXT416(auVar116._0_4_);
                  auVar110 = ZEXT416((uint)local_b40._0_4_);
                  auVar112 = local_b20._0_16_;
                  auVar118 = local_980;
                  fVar256 = local_990;
                  fVar263 = fStack_98c;
                  fVar264 = fStack_988;
                  fVar267 = fStack_984;
                }
                else {
                  auVar117 = vsqrtss_avx(auVar117,auVar117);
                  fVar229 = auVar117._0_4_;
                  fVar263 = fVar256;
                  fVar264 = fVar256;
                  fVar267 = fVar256;
                }
                auVar275 = ZEXT1664(auVar113);
                auVar265._8_4_ = 0x7fffffff;
                auVar265._0_8_ = 0x7fffffff7fffffff;
                auVar265._12_4_ = 0x7fffffff;
                auVar266 = ZEXT1664(auVar265);
                auVar280 = ZEXT3264(local_a80);
                auVar281 = ZEXT3264(local_aa0);
                auVar167._32_32_ = auVar126;
                auVar167._0_32_ = local_ac0;
                auVar279 = ZEXT3264(local_ac0);
                auVar206._0_4_ = (float)local_970._0_4_ * (float)local_a40._0_4_;
                auVar206._4_4_ = (float)local_970._0_4_ * (float)local_a40._4_4_;
                auVar206._8_4_ = (float)local_970._0_4_ * fStack_a38;
                auVar206._12_4_ = (float)local_970._0_4_ * fStack_a34;
                auVar223._4_4_ = local_920._0_4_;
                auVar223._0_4_ = local_920._0_4_;
                auVar223._8_4_ = local_920._0_4_;
                auVar223._12_4_ = local_920._0_4_;
                auVar117 = vfmadd132ps_fma(auVar223,auVar206,local_a00._0_16_);
                auVar207._4_4_ = local_900._0_4_;
                auVar207._0_4_ = local_900._0_4_;
                auVar207._8_4_ = local_900._0_4_;
                auVar207._12_4_ = local_900._0_4_;
                auVar117 = vfmadd132ps_fma(auVar207,auVar117,local_a20._0_16_);
                auVar268 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar268,
                                           ZEXT416(0x40000000));
                auVar224._0_4_ = auVar268._0_4_;
                auVar224._4_4_ = auVar224._0_4_;
                auVar224._8_4_ = auVar224._0_4_;
                auVar224._12_4_ = auVar224._0_4_;
                auVar268 = vfmadd132ps_fma(auVar224,auVar117,local_9e0._0_16_);
                auVar208._0_4_ = auVar268._0_4_ * fVar258;
                auVar208._4_4_ = auVar268._4_4_ * fVar258;
                auVar208._8_4_ = auVar268._8_4_ * fVar258;
                auVar208._12_4_ = auVar268._12_4_ * fVar258;
                auVar268 = vdpps_avx(auVar112,auVar268,0x7f);
                fVar258 = auVar268._0_4_;
                auVar225._0_4_ = auVar112._0_4_ * fVar258;
                auVar225._4_4_ = auVar112._4_4_ * fVar258;
                auVar225._8_4_ = auVar112._8_4_ * fVar258;
                auVar225._12_4_ = auVar112._12_4_ * fVar258;
                auVar268 = vsubps_avx(auVar208,auVar225);
                local_bb0 = auVar115._0_4_;
                local_bb0 = auVar114._0_4_ * local_bb0;
                auVar29._8_4_ = 0x80000000;
                auVar29._0_8_ = 0x8000000080000000;
                auVar29._12_4_ = 0x80000000;
                auVar170._16_48_ = auVar167._16_48_;
                auVar117 = vxorps_avx512vl(auVar112,auVar29);
                auVar245._0_4_ = fVar256 * auVar268._0_4_ * local_bb0;
                auVar245._4_4_ = fVar263 * auVar268._4_4_ * local_bb0;
                auVar245._8_4_ = fVar264 * auVar268._8_4_ * local_bb0;
                auVar245._12_4_ = fVar267 * auVar268._12_4_ * local_bb0;
                auVar114 = vdpps_avx(auVar117,auVar183,0x7f);
                auVar268 = vmaxss_avx(ZEXT416((uint)fVar178),
                                      ZEXT416((uint)(fVar253 * fVar254 * 1.9073486e-06)));
                auVar116 = vdivss_avx512f(ZEXT416((uint)fVar178),auVar116);
                auVar115 = vdpps_avx(auVar113,auVar245,0x7f);
                auVar110 = vfmadd213ss_fma(auVar110,ZEXT416((uint)fVar178),auVar268);
                auVar116 = vfmadd213ss_fma(ZEXT416((uint)(fVar259 + 1.0)),auVar116,auVar110);
                auVar110 = vdpps_avx(local_a50,auVar183,0x7f);
                fVar258 = auVar114._0_4_ + auVar115._0_4_;
                auVar114 = vdpps_avx(auVar113,auVar117,0x7f);
                auVar117 = vmulss_avx512f(auVar120,auVar118);
                auVar118 = vmulss_avx512f(auVar118,auVar118);
                auVar115 = vdpps_avx(auVar113,local_a50,0x7f);
                auVar170._0_16_ =
                     vaddss_avx512f(auVar119,ZEXT416((uint)(auVar117._0_4_ * auVar118._0_4_)));
                auVar118 = vfnmadd231ss_fma(auVar114,auVar251,ZEXT416((uint)fVar258));
                auVar117 = vfnmadd231ss_fma(auVar115,auVar251,auVar110);
                auVar114 = vpermilps_avx(local_8e0._0_16_,0xff);
                fVar229 = fVar229 - auVar114._0_4_;
                auVar114 = vshufps_avx(auVar112,auVar112,0xff);
                auVar115 = vfmsub213ss_fma(auVar118,auVar170._0_16_,auVar114);
                fVar256 = auVar117._0_4_ * auVar170._0_4_;
                auVar118 = vfmsub231ss_fma(ZEXT416((uint)(auVar110._0_4_ * auVar115._0_4_)),
                                           ZEXT416((uint)fVar258),ZEXT416((uint)fVar256));
                fVar259 = auVar118._0_4_;
                fVar262 = fVar262 - (fVar257 * (fVar256 / fVar259) -
                                    fVar229 * (auVar110._0_4_ / fVar259));
                auVar269 = ZEXT464((uint)fVar262);
                fVar253 = fVar253 - (fVar229 * (fVar258 / fVar259) -
                                    fVar257 * (auVar115._0_4_ / fVar259));
                auVar110 = vandps_avx(auVar251,auVar265);
                if (auVar116._0_4_ <= auVar110._0_4_) {
LAB_01db7b86:
                  bVar7 = false;
                }
                else {
                  auVar115 = vfmadd231ss_fma(ZEXT416((uint)(auVar116._0_4_ + auVar268._0_4_)),
                                             local_9b0,ZEXT416(0x36000000));
                  auVar110 = vandps_avx(auVar265,ZEXT416((uint)fVar229));
                  if (auVar115._0_4_ <= auVar110._0_4_) goto LAB_01db7b86;
                  fVar253 = fVar253 + (float)local_9a0._0_4_;
                  bVar7 = true;
                  if ((((fVar230 <= fVar253) &&
                       (fVar258 = *(float *)(ray + k * 4 + 0x200), fVar253 <= fVar258)) &&
                      (0.0 <= fVar262)) && (fVar262 <= 1.0)) {
                    auVar169._16_48_ = auVar170._16_48_;
                    auVar169._0_16_ = ZEXT816(0) << 0x20;
                    auVar168._4_60_ = auVar169._4_60_;
                    auVar168._0_4_ = fVar255;
                    auVar110 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar168._0_16_);
                    fVar255 = auVar110._0_4_;
                    auVar170._0_16_ = vmulss_avx512f(auVar109,ZEXT416(0xbf000000));
                    pGVar4 = (context->scene->geometries).items[uVar104].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      fVar255 = fVar255 * 1.5 + auVar170._0_4_ * fVar255 * fVar255 * fVar255;
                      auVar209._0_4_ = auVar113._0_4_ * fVar255;
                      auVar209._4_4_ = auVar113._4_4_ * fVar255;
                      auVar209._8_4_ = auVar113._8_4_ * fVar255;
                      auVar209._12_4_ = auVar113._12_4_ * fVar255;
                      auVar114 = vfmadd213ps_fma(auVar114,auVar209,auVar112);
                      auVar109 = vshufps_avx(auVar209,auVar209,0xc9);
                      auVar110 = vshufps_avx(auVar112,auVar112,0xc9);
                      auVar210._0_4_ = auVar209._0_4_ * auVar110._0_4_;
                      auVar210._4_4_ = auVar209._4_4_ * auVar110._4_4_;
                      auVar210._8_4_ = auVar209._8_4_ * auVar110._8_4_;
                      auVar210._12_4_ = auVar209._12_4_ * auVar110._12_4_;
                      auVar110 = vfmsub231ps_fma(auVar210,auVar112,auVar109);
                      auVar109 = vshufps_avx(auVar110,auVar110,0xc9);
                      auVar112 = vshufps_avx(auVar114,auVar114,0xc9);
                      auVar110 = vshufps_avx(auVar110,auVar110,0xd2);
                      auVar185._0_4_ = auVar114._0_4_ * auVar110._0_4_;
                      auVar185._4_4_ = auVar114._4_4_ * auVar110._4_4_;
                      auVar185._8_4_ = auVar114._8_4_ * auVar110._8_4_;
                      auVar185._12_4_ = auVar114._12_4_ * auVar110._12_4_;
                      auVar109 = vfmsub231ps_fma(auVar185,auVar109,auVar112);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x200) = fVar253;
                        uVar1 = vextractps_avx(auVar109,1);
                        *(undefined4 *)(ray + k * 4 + 0x300) = uVar1;
                        uVar1 = vextractps_avx(auVar109,2);
                        *(undefined4 *)(ray + k * 4 + 0x340) = uVar1;
                        *(int *)(ray + k * 4 + 0x380) = auVar109._0_4_;
                        *(float *)(ray + k * 4 + 0x3c0) = fVar262;
                        *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                        *(uint *)(ray + k * 4 + 0x440) = uVar3;
                        *(uint *)(ray + k * 4 + 0x480) = uVar104;
                        *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar6 = context->user;
                        auVar112 = ZEXT416((uint)fVar262);
                        local_340 = vbroadcastss_avx512f(auVar112);
                        auVar196 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar196 = vpermps_avx512f(auVar196,ZEXT1664(auVar109));
                        auVar228 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar228,ZEXT1664(auVar109));
                        local_380 = vbroadcastss_avx512f(auVar109);
                        local_400[0] = (RTCHitN)auVar196[0];
                        local_400[1] = (RTCHitN)auVar196[1];
                        local_400[2] = (RTCHitN)auVar196[2];
                        local_400[3] = (RTCHitN)auVar196[3];
                        local_400[4] = (RTCHitN)auVar196[4];
                        local_400[5] = (RTCHitN)auVar196[5];
                        local_400[6] = (RTCHitN)auVar196[6];
                        local_400[7] = (RTCHitN)auVar196[7];
                        local_400[8] = (RTCHitN)auVar196[8];
                        local_400[9] = (RTCHitN)auVar196[9];
                        local_400[10] = (RTCHitN)auVar196[10];
                        local_400[0xb] = (RTCHitN)auVar196[0xb];
                        local_400[0xc] = (RTCHitN)auVar196[0xc];
                        local_400[0xd] = (RTCHitN)auVar196[0xd];
                        local_400[0xe] = (RTCHitN)auVar196[0xe];
                        local_400[0xf] = (RTCHitN)auVar196[0xf];
                        local_400[0x10] = (RTCHitN)auVar196[0x10];
                        local_400[0x11] = (RTCHitN)auVar196[0x11];
                        local_400[0x12] = (RTCHitN)auVar196[0x12];
                        local_400[0x13] = (RTCHitN)auVar196[0x13];
                        local_400[0x14] = (RTCHitN)auVar196[0x14];
                        local_400[0x15] = (RTCHitN)auVar196[0x15];
                        local_400[0x16] = (RTCHitN)auVar196[0x16];
                        local_400[0x17] = (RTCHitN)auVar196[0x17];
                        local_400[0x18] = (RTCHitN)auVar196[0x18];
                        local_400[0x19] = (RTCHitN)auVar196[0x19];
                        local_400[0x1a] = (RTCHitN)auVar196[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar196[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar196[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar196[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar196[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar196[0x1f];
                        local_400[0x20] = (RTCHitN)auVar196[0x20];
                        local_400[0x21] = (RTCHitN)auVar196[0x21];
                        local_400[0x22] = (RTCHitN)auVar196[0x22];
                        local_400[0x23] = (RTCHitN)auVar196[0x23];
                        local_400[0x24] = (RTCHitN)auVar196[0x24];
                        local_400[0x25] = (RTCHitN)auVar196[0x25];
                        local_400[0x26] = (RTCHitN)auVar196[0x26];
                        local_400[0x27] = (RTCHitN)auVar196[0x27];
                        local_400[0x28] = (RTCHitN)auVar196[0x28];
                        local_400[0x29] = (RTCHitN)auVar196[0x29];
                        local_400[0x2a] = (RTCHitN)auVar196[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar196[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar196[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar196[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar196[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar196[0x2f];
                        local_400[0x30] = (RTCHitN)auVar196[0x30];
                        local_400[0x31] = (RTCHitN)auVar196[0x31];
                        local_400[0x32] = (RTCHitN)auVar196[0x32];
                        local_400[0x33] = (RTCHitN)auVar196[0x33];
                        local_400[0x34] = (RTCHitN)auVar196[0x34];
                        local_400[0x35] = (RTCHitN)auVar196[0x35];
                        local_400[0x36] = (RTCHitN)auVar196[0x36];
                        local_400[0x37] = (RTCHitN)auVar196[0x37];
                        local_400[0x38] = (RTCHitN)auVar196[0x38];
                        local_400[0x39] = (RTCHitN)auVar196[0x39];
                        local_400[0x3a] = (RTCHitN)auVar196[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar196[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar196[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar196[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar196[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar196[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_480._0_8_;
                        uStack_2b8 = local_480._8_8_;
                        uStack_2b0 = local_480._16_8_;
                        uStack_2a8 = local_480._24_8_;
                        uStack_2a0 = local_480._32_8_;
                        uStack_298 = local_480._40_8_;
                        uStack_290 = local_480._48_8_;
                        uStack_288 = local_480._56_8_;
                        auVar196 = vmovdqa64_avx512f(local_440);
                        local_280 = vmovdqa64_avx512f(auVar196);
                        auVar126 = vpcmpeqd_avx2(auVar196._0_32_,auVar196._0_32_);
                        local_ae8[3] = auVar126;
                        local_ae8[2] = auVar126;
                        local_ae8[1] = auVar126;
                        *local_ae8 = auVar126;
                        local_240 = vbroadcastss_avx512f(ZEXT416(pRVar6->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(pRVar6->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar253;
                        local_8c0 = local_4c0;
                        local_b70.valid = (int *)local_8c0;
                        local_b70.geometryUserPtr = pGVar4->userPtr;
                        local_b70.context = context->user;
                        local_b70.hit = local_400;
                        local_b70.N = 0x10;
                        local_b70.ray = (RTCRayN *)ray;
                        if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar266 = ZEXT1664(auVar265);
                          auVar275 = ZEXT1664(auVar113);
                          (*pGVar4->intersectionFilterN)(&local_b70);
                          auVar269 = ZEXT1664(auVar112);
                          auVar279 = ZEXT3264(local_ac0);
                          auVar281 = ZEXT3264(local_aa0);
                          auVar280 = ZEXT3264(local_a80);
                        }
                        auVar170 = vmovdqa64_avx512f(local_8c0);
                        uVar22 = vptestmd_avx512f(auVar170,auVar170);
                        if ((short)uVar22 != 0) {
                          p_Var5 = context->args->filter;
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar266 = ZEXT1664(auVar266._0_16_);
                            auVar275 = ZEXT1664(auVar275._0_16_);
                            (*p_Var5)(&local_b70);
                            auVar269 = ZEXT1664(auVar112);
                            auVar279 = ZEXT3264(local_ac0);
                            auVar281 = ZEXT3264(local_aa0);
                            auVar280 = ZEXT3264(local_a80);
                          }
                          auVar170 = vmovdqa64_avx512f(local_8c0);
                          uVar107 = vptestmd_avx512f(auVar170,auVar170);
                          if ((short)uVar107 != 0) {
                            iVar73 = *(int *)(local_b70.hit + 4);
                            iVar74 = *(int *)(local_b70.hit + 8);
                            iVar75 = *(int *)(local_b70.hit + 0xc);
                            iVar76 = *(int *)(local_b70.hit + 0x10);
                            iVar77 = *(int *)(local_b70.hit + 0x14);
                            iVar78 = *(int *)(local_b70.hit + 0x18);
                            iVar79 = *(int *)(local_b70.hit + 0x1c);
                            iVar80 = *(int *)(local_b70.hit + 0x20);
                            iVar81 = *(int *)(local_b70.hit + 0x24);
                            iVar82 = *(int *)(local_b70.hit + 0x28);
                            iVar83 = *(int *)(local_b70.hit + 0x2c);
                            iVar84 = *(int *)(local_b70.hit + 0x30);
                            iVar85 = *(int *)(local_b70.hit + 0x34);
                            iVar86 = *(int *)(local_b70.hit + 0x38);
                            iVar87 = *(int *)(local_b70.hit + 0x3c);
                            bVar101 = (byte)uVar107;
                            bVar106 = (bool)((byte)(uVar107 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar107 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar107 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar107 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar107 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar107 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar107 >> 7) & 1);
                            bVar98 = (byte)(uVar107 >> 8);
                            bVar14 = (bool)((byte)(uVar107 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar107 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar107 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar107 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar107 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar107 >> 0xe) & 1);
                            bVar20 = SUB81(uVar107 >> 0xf,0);
                            *(uint *)(local_b70.ray + 0x300) =
                                 (uint)(bVar101 & 1) * *(int *)local_b70.hit |
                                 (uint)!(bool)(bVar101 & 1) * *(int *)(local_b70.ray + 0x300);
                            *(uint *)(local_b70.ray + 0x304) =
                                 (uint)bVar106 * iVar73 |
                                 (uint)!bVar106 * *(int *)(local_b70.ray + 0x304);
                            *(uint *)(local_b70.ray + 0x308) =
                                 (uint)bVar8 * iVar74 |
                                 (uint)!bVar8 * *(int *)(local_b70.ray + 0x308);
                            *(uint *)(local_b70.ray + 0x30c) =
                                 (uint)bVar9 * iVar75 |
                                 (uint)!bVar9 * *(int *)(local_b70.ray + 0x30c);
                            *(uint *)(local_b70.ray + 0x310) =
                                 (uint)bVar10 * iVar76 |
                                 (uint)!bVar10 * *(int *)(local_b70.ray + 0x310);
                            *(uint *)(local_b70.ray + 0x314) =
                                 (uint)bVar11 * iVar77 |
                                 (uint)!bVar11 * *(int *)(local_b70.ray + 0x314);
                            *(uint *)(local_b70.ray + 0x318) =
                                 (uint)bVar12 * iVar78 |
                                 (uint)!bVar12 * *(int *)(local_b70.ray + 0x318);
                            *(uint *)(local_b70.ray + 0x31c) =
                                 (uint)bVar13 * iVar79 |
                                 (uint)!bVar13 * *(int *)(local_b70.ray + 0x31c);
                            *(uint *)(local_b70.ray + 800) =
                                 (uint)(bVar98 & 1) * iVar80 |
                                 (uint)!(bool)(bVar98 & 1) * *(int *)(local_b70.ray + 800);
                            *(uint *)(local_b70.ray + 0x324) =
                                 (uint)bVar14 * iVar81 |
                                 (uint)!bVar14 * *(int *)(local_b70.ray + 0x324);
                            *(uint *)(local_b70.ray + 0x328) =
                                 (uint)bVar15 * iVar82 |
                                 (uint)!bVar15 * *(int *)(local_b70.ray + 0x328);
                            *(uint *)(local_b70.ray + 0x32c) =
                                 (uint)bVar16 * iVar83 |
                                 (uint)!bVar16 * *(int *)(local_b70.ray + 0x32c);
                            *(uint *)(local_b70.ray + 0x330) =
                                 (uint)bVar17 * iVar84 |
                                 (uint)!bVar17 * *(int *)(local_b70.ray + 0x330);
                            *(uint *)(local_b70.ray + 0x334) =
                                 (uint)bVar18 * iVar85 |
                                 (uint)!bVar18 * *(int *)(local_b70.ray + 0x334);
                            *(uint *)(local_b70.ray + 0x338) =
                                 (uint)bVar19 * iVar86 |
                                 (uint)!bVar19 * *(int *)(local_b70.ray + 0x338);
                            *(uint *)(local_b70.ray + 0x33c) =
                                 (uint)bVar20 * iVar87 |
                                 (uint)!bVar20 * *(int *)(local_b70.ray + 0x33c);
                            iVar73 = *(int *)(local_b70.hit + 0x44);
                            iVar74 = *(int *)(local_b70.hit + 0x48);
                            iVar75 = *(int *)(local_b70.hit + 0x4c);
                            iVar76 = *(int *)(local_b70.hit + 0x50);
                            iVar77 = *(int *)(local_b70.hit + 0x54);
                            iVar78 = *(int *)(local_b70.hit + 0x58);
                            iVar79 = *(int *)(local_b70.hit + 0x5c);
                            iVar80 = *(int *)(local_b70.hit + 0x60);
                            iVar81 = *(int *)(local_b70.hit + 100);
                            iVar82 = *(int *)(local_b70.hit + 0x68);
                            iVar83 = *(int *)(local_b70.hit + 0x6c);
                            iVar84 = *(int *)(local_b70.hit + 0x70);
                            iVar85 = *(int *)(local_b70.hit + 0x74);
                            iVar86 = *(int *)(local_b70.hit + 0x78);
                            iVar87 = *(int *)(local_b70.hit + 0x7c);
                            bVar106 = (bool)((byte)(uVar107 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar107 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar107 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar107 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar107 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar107 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar107 >> 7) & 1);
                            bVar14 = (bool)((byte)(uVar107 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar107 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar107 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar107 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar107 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar107 >> 0xe) & 1);
                            bVar20 = SUB81(uVar107 >> 0xf,0);
                            *(uint *)(local_b70.ray + 0x340) =
                                 (uint)(bVar101 & 1) * *(int *)(local_b70.hit + 0x40) |
                                 (uint)!(bool)(bVar101 & 1) * *(int *)(local_b70.ray + 0x340);
                            *(uint *)(local_b70.ray + 0x344) =
                                 (uint)bVar106 * iVar73 |
                                 (uint)!bVar106 * *(int *)(local_b70.ray + 0x344);
                            *(uint *)(local_b70.ray + 0x348) =
                                 (uint)bVar8 * iVar74 |
                                 (uint)!bVar8 * *(int *)(local_b70.ray + 0x348);
                            *(uint *)(local_b70.ray + 0x34c) =
                                 (uint)bVar9 * iVar75 |
                                 (uint)!bVar9 * *(int *)(local_b70.ray + 0x34c);
                            *(uint *)(local_b70.ray + 0x350) =
                                 (uint)bVar10 * iVar76 |
                                 (uint)!bVar10 * *(int *)(local_b70.ray + 0x350);
                            *(uint *)(local_b70.ray + 0x354) =
                                 (uint)bVar11 * iVar77 |
                                 (uint)!bVar11 * *(int *)(local_b70.ray + 0x354);
                            *(uint *)(local_b70.ray + 0x358) =
                                 (uint)bVar12 * iVar78 |
                                 (uint)!bVar12 * *(int *)(local_b70.ray + 0x358);
                            *(uint *)(local_b70.ray + 0x35c) =
                                 (uint)bVar13 * iVar79 |
                                 (uint)!bVar13 * *(int *)(local_b70.ray + 0x35c);
                            *(uint *)(local_b70.ray + 0x360) =
                                 (uint)(bVar98 & 1) * iVar80 |
                                 (uint)!(bool)(bVar98 & 1) * *(int *)(local_b70.ray + 0x360);
                            *(uint *)(local_b70.ray + 0x364) =
                                 (uint)bVar14 * iVar81 |
                                 (uint)!bVar14 * *(int *)(local_b70.ray + 0x364);
                            *(uint *)(local_b70.ray + 0x368) =
                                 (uint)bVar15 * iVar82 |
                                 (uint)!bVar15 * *(int *)(local_b70.ray + 0x368);
                            *(uint *)(local_b70.ray + 0x36c) =
                                 (uint)bVar16 * iVar83 |
                                 (uint)!bVar16 * *(int *)(local_b70.ray + 0x36c);
                            *(uint *)(local_b70.ray + 0x370) =
                                 (uint)bVar17 * iVar84 |
                                 (uint)!bVar17 * *(int *)(local_b70.ray + 0x370);
                            *(uint *)(local_b70.ray + 0x374) =
                                 (uint)bVar18 * iVar85 |
                                 (uint)!bVar18 * *(int *)(local_b70.ray + 0x374);
                            *(uint *)(local_b70.ray + 0x378) =
                                 (uint)bVar19 * iVar86 |
                                 (uint)!bVar19 * *(int *)(local_b70.ray + 0x378);
                            *(uint *)(local_b70.ray + 0x37c) =
                                 (uint)bVar20 * iVar87 |
                                 (uint)!bVar20 * *(int *)(local_b70.ray + 0x37c);
                            iVar73 = *(int *)(local_b70.hit + 0x84);
                            iVar74 = *(int *)(local_b70.hit + 0x88);
                            iVar75 = *(int *)(local_b70.hit + 0x8c);
                            iVar76 = *(int *)(local_b70.hit + 0x90);
                            iVar77 = *(int *)(local_b70.hit + 0x94);
                            iVar78 = *(int *)(local_b70.hit + 0x98);
                            iVar79 = *(int *)(local_b70.hit + 0x9c);
                            iVar80 = *(int *)(local_b70.hit + 0xa0);
                            iVar81 = *(int *)(local_b70.hit + 0xa4);
                            iVar82 = *(int *)(local_b70.hit + 0xa8);
                            iVar83 = *(int *)(local_b70.hit + 0xac);
                            iVar84 = *(int *)(local_b70.hit + 0xb0);
                            iVar85 = *(int *)(local_b70.hit + 0xb4);
                            iVar86 = *(int *)(local_b70.hit + 0xb8);
                            iVar87 = *(int *)(local_b70.hit + 0xbc);
                            bVar106 = (bool)((byte)(uVar107 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar107 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar107 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar107 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar107 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar107 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar107 >> 7) & 1);
                            bVar14 = (bool)((byte)(uVar107 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar107 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar107 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar107 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar107 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar107 >> 0xe) & 1);
                            bVar20 = SUB81(uVar107 >> 0xf,0);
                            *(uint *)(local_b70.ray + 0x380) =
                                 (uint)(bVar101 & 1) * *(int *)(local_b70.hit + 0x80) |
                                 (uint)!(bool)(bVar101 & 1) * *(int *)(local_b70.ray + 0x380);
                            *(uint *)(local_b70.ray + 900) =
                                 (uint)bVar106 * iVar73 |
                                 (uint)!bVar106 * *(int *)(local_b70.ray + 900);
                            *(uint *)(local_b70.ray + 0x388) =
                                 (uint)bVar8 * iVar74 |
                                 (uint)!bVar8 * *(int *)(local_b70.ray + 0x388);
                            *(uint *)(local_b70.ray + 0x38c) =
                                 (uint)bVar9 * iVar75 |
                                 (uint)!bVar9 * *(int *)(local_b70.ray + 0x38c);
                            *(uint *)(local_b70.ray + 0x390) =
                                 (uint)bVar10 * iVar76 |
                                 (uint)!bVar10 * *(int *)(local_b70.ray + 0x390);
                            *(uint *)(local_b70.ray + 0x394) =
                                 (uint)bVar11 * iVar77 |
                                 (uint)!bVar11 * *(int *)(local_b70.ray + 0x394);
                            *(uint *)(local_b70.ray + 0x398) =
                                 (uint)bVar12 * iVar78 |
                                 (uint)!bVar12 * *(int *)(local_b70.ray + 0x398);
                            *(uint *)(local_b70.ray + 0x39c) =
                                 (uint)bVar13 * iVar79 |
                                 (uint)!bVar13 * *(int *)(local_b70.ray + 0x39c);
                            *(uint *)(local_b70.ray + 0x3a0) =
                                 (uint)(bVar98 & 1) * iVar80 |
                                 (uint)!(bool)(bVar98 & 1) * *(int *)(local_b70.ray + 0x3a0);
                            *(uint *)(local_b70.ray + 0x3a4) =
                                 (uint)bVar14 * iVar81 |
                                 (uint)!bVar14 * *(int *)(local_b70.ray + 0x3a4);
                            *(uint *)(local_b70.ray + 0x3a8) =
                                 (uint)bVar15 * iVar82 |
                                 (uint)!bVar15 * *(int *)(local_b70.ray + 0x3a8);
                            *(uint *)(local_b70.ray + 0x3ac) =
                                 (uint)bVar16 * iVar83 |
                                 (uint)!bVar16 * *(int *)(local_b70.ray + 0x3ac);
                            *(uint *)(local_b70.ray + 0x3b0) =
                                 (uint)bVar17 * iVar84 |
                                 (uint)!bVar17 * *(int *)(local_b70.ray + 0x3b0);
                            *(uint *)(local_b70.ray + 0x3b4) =
                                 (uint)bVar18 * iVar85 |
                                 (uint)!bVar18 * *(int *)(local_b70.ray + 0x3b4);
                            *(uint *)(local_b70.ray + 0x3b8) =
                                 (uint)bVar19 * iVar86 |
                                 (uint)!bVar19 * *(int *)(local_b70.ray + 0x3b8);
                            *(uint *)(local_b70.ray + 0x3bc) =
                                 (uint)bVar20 * iVar87 |
                                 (uint)!bVar20 * *(int *)(local_b70.ray + 0x3bc);
                            iVar73 = *(int *)(local_b70.hit + 0xc4);
                            iVar74 = *(int *)(local_b70.hit + 200);
                            iVar75 = *(int *)(local_b70.hit + 0xcc);
                            iVar76 = *(int *)(local_b70.hit + 0xd0);
                            iVar77 = *(int *)(local_b70.hit + 0xd4);
                            iVar78 = *(int *)(local_b70.hit + 0xd8);
                            iVar79 = *(int *)(local_b70.hit + 0xdc);
                            iVar80 = *(int *)(local_b70.hit + 0xe0);
                            iVar81 = *(int *)(local_b70.hit + 0xe4);
                            iVar82 = *(int *)(local_b70.hit + 0xe8);
                            iVar83 = *(int *)(local_b70.hit + 0xec);
                            iVar84 = *(int *)(local_b70.hit + 0xf0);
                            iVar85 = *(int *)(local_b70.hit + 0xf4);
                            iVar86 = *(int *)(local_b70.hit + 0xf8);
                            iVar87 = *(int *)(local_b70.hit + 0xfc);
                            bVar106 = (bool)((byte)(uVar107 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar107 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar107 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar107 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar107 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar107 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar107 >> 7) & 1);
                            bVar14 = (bool)((byte)(uVar107 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar107 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar107 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar107 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar107 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar107 >> 0xe) & 1);
                            bVar20 = SUB81(uVar107 >> 0xf,0);
                            *(uint *)(local_b70.ray + 0x3c0) =
                                 (uint)(bVar101 & 1) * *(int *)(local_b70.hit + 0xc0) |
                                 (uint)!(bool)(bVar101 & 1) * *(int *)(local_b70.ray + 0x3c0);
                            *(uint *)(local_b70.ray + 0x3c4) =
                                 (uint)bVar106 * iVar73 |
                                 (uint)!bVar106 * *(int *)(local_b70.ray + 0x3c4);
                            *(uint *)(local_b70.ray + 0x3c8) =
                                 (uint)bVar8 * iVar74 |
                                 (uint)!bVar8 * *(int *)(local_b70.ray + 0x3c8);
                            *(uint *)(local_b70.ray + 0x3cc) =
                                 (uint)bVar9 * iVar75 |
                                 (uint)!bVar9 * *(int *)(local_b70.ray + 0x3cc);
                            *(uint *)(local_b70.ray + 0x3d0) =
                                 (uint)bVar10 * iVar76 |
                                 (uint)!bVar10 * *(int *)(local_b70.ray + 0x3d0);
                            *(uint *)(local_b70.ray + 0x3d4) =
                                 (uint)bVar11 * iVar77 |
                                 (uint)!bVar11 * *(int *)(local_b70.ray + 0x3d4);
                            *(uint *)(local_b70.ray + 0x3d8) =
                                 (uint)bVar12 * iVar78 |
                                 (uint)!bVar12 * *(int *)(local_b70.ray + 0x3d8);
                            *(uint *)(local_b70.ray + 0x3dc) =
                                 (uint)bVar13 * iVar79 |
                                 (uint)!bVar13 * *(int *)(local_b70.ray + 0x3dc);
                            *(uint *)(local_b70.ray + 0x3e0) =
                                 (uint)(bVar98 & 1) * iVar80 |
                                 (uint)!(bool)(bVar98 & 1) * *(int *)(local_b70.ray + 0x3e0);
                            *(uint *)(local_b70.ray + 0x3e4) =
                                 (uint)bVar14 * iVar81 |
                                 (uint)!bVar14 * *(int *)(local_b70.ray + 0x3e4);
                            *(uint *)(local_b70.ray + 1000) =
                                 (uint)bVar15 * iVar82 |
                                 (uint)!bVar15 * *(int *)(local_b70.ray + 1000);
                            *(uint *)(local_b70.ray + 0x3ec) =
                                 (uint)bVar16 * iVar83 |
                                 (uint)!bVar16 * *(int *)(local_b70.ray + 0x3ec);
                            *(uint *)(local_b70.ray + 0x3f0) =
                                 (uint)bVar17 * iVar84 |
                                 (uint)!bVar17 * *(int *)(local_b70.ray + 0x3f0);
                            *(uint *)(local_b70.ray + 0x3f4) =
                                 (uint)bVar18 * iVar85 |
                                 (uint)!bVar18 * *(int *)(local_b70.ray + 0x3f4);
                            *(uint *)(local_b70.ray + 0x3f8) =
                                 (uint)bVar19 * iVar86 |
                                 (uint)!bVar19 * *(int *)(local_b70.ray + 0x3f8);
                            *(uint *)(local_b70.ray + 0x3fc) =
                                 (uint)bVar20 * iVar87 |
                                 (uint)!bVar20 * *(int *)(local_b70.ray + 0x3fc);
                            iVar73 = *(int *)(local_b70.hit + 0x104);
                            iVar74 = *(int *)(local_b70.hit + 0x108);
                            iVar75 = *(int *)(local_b70.hit + 0x10c);
                            iVar76 = *(int *)(local_b70.hit + 0x110);
                            iVar77 = *(int *)(local_b70.hit + 0x114);
                            iVar78 = *(int *)(local_b70.hit + 0x118);
                            iVar79 = *(int *)(local_b70.hit + 0x11c);
                            iVar80 = *(int *)(local_b70.hit + 0x120);
                            iVar81 = *(int *)(local_b70.hit + 0x124);
                            iVar82 = *(int *)(local_b70.hit + 0x128);
                            iVar83 = *(int *)(local_b70.hit + 300);
                            iVar84 = *(int *)(local_b70.hit + 0x130);
                            iVar85 = *(int *)(local_b70.hit + 0x134);
                            iVar86 = *(int *)(local_b70.hit + 0x138);
                            iVar87 = *(int *)(local_b70.hit + 0x13c);
                            bVar106 = (bool)((byte)(uVar107 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar107 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar107 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar107 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar107 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar107 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar107 >> 7) & 1);
                            bVar14 = (bool)((byte)(uVar107 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar107 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar107 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar107 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar107 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar107 >> 0xe) & 1);
                            bVar20 = SUB81(uVar107 >> 0xf,0);
                            *(uint *)(local_b70.ray + 0x400) =
                                 (uint)(bVar101 & 1) * *(int *)(local_b70.hit + 0x100) |
                                 (uint)!(bool)(bVar101 & 1) * *(int *)(local_b70.ray + 0x400);
                            *(uint *)(local_b70.ray + 0x404) =
                                 (uint)bVar106 * iVar73 |
                                 (uint)!bVar106 * *(int *)(local_b70.ray + 0x404);
                            *(uint *)(local_b70.ray + 0x408) =
                                 (uint)bVar8 * iVar74 |
                                 (uint)!bVar8 * *(int *)(local_b70.ray + 0x408);
                            *(uint *)(local_b70.ray + 0x40c) =
                                 (uint)bVar9 * iVar75 |
                                 (uint)!bVar9 * *(int *)(local_b70.ray + 0x40c);
                            *(uint *)(local_b70.ray + 0x410) =
                                 (uint)bVar10 * iVar76 |
                                 (uint)!bVar10 * *(int *)(local_b70.ray + 0x410);
                            *(uint *)(local_b70.ray + 0x414) =
                                 (uint)bVar11 * iVar77 |
                                 (uint)!bVar11 * *(int *)(local_b70.ray + 0x414);
                            *(uint *)(local_b70.ray + 0x418) =
                                 (uint)bVar12 * iVar78 |
                                 (uint)!bVar12 * *(int *)(local_b70.ray + 0x418);
                            *(uint *)(local_b70.ray + 0x41c) =
                                 (uint)bVar13 * iVar79 |
                                 (uint)!bVar13 * *(int *)(local_b70.ray + 0x41c);
                            *(uint *)(local_b70.ray + 0x420) =
                                 (uint)(bVar98 & 1) * iVar80 |
                                 (uint)!(bool)(bVar98 & 1) * *(int *)(local_b70.ray + 0x420);
                            *(uint *)(local_b70.ray + 0x424) =
                                 (uint)bVar14 * iVar81 |
                                 (uint)!bVar14 * *(int *)(local_b70.ray + 0x424);
                            *(uint *)(local_b70.ray + 0x428) =
                                 (uint)bVar15 * iVar82 |
                                 (uint)!bVar15 * *(int *)(local_b70.ray + 0x428);
                            *(uint *)(local_b70.ray + 0x42c) =
                                 (uint)bVar16 * iVar83 |
                                 (uint)!bVar16 * *(int *)(local_b70.ray + 0x42c);
                            *(uint *)(local_b70.ray + 0x430) =
                                 (uint)bVar17 * iVar84 |
                                 (uint)!bVar17 * *(int *)(local_b70.ray + 0x430);
                            *(uint *)(local_b70.ray + 0x434) =
                                 (uint)bVar18 * iVar85 |
                                 (uint)!bVar18 * *(int *)(local_b70.ray + 0x434);
                            *(uint *)(local_b70.ray + 0x438) =
                                 (uint)bVar19 * iVar86 |
                                 (uint)!bVar19 * *(int *)(local_b70.ray + 0x438);
                            *(uint *)(local_b70.ray + 0x43c) =
                                 (uint)bVar20 * iVar87 |
                                 (uint)!bVar20 * *(int *)(local_b70.ray + 0x43c);
                            auVar196 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b70.hit + 0x140));
                            auVar196 = vmovdqu32_avx512f(auVar196);
                            *(undefined1 (*) [64])(local_b70.ray + 0x440) = auVar196;
                            auVar196 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b70.hit + 0x180));
                            auVar196 = vmovdqu32_avx512f(auVar196);
                            *(undefined1 (*) [64])(local_b70.ray + 0x480) = auVar196;
                            auVar228 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b70.hit + 0x1c0));
                            auVar196 = vmovdqa32_avx512f(auVar228);
                            *(undefined1 (*) [64])(local_b70.ray + 0x4c0) = auVar196;
                            auVar196 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b70.hit + 0x200));
                            bVar106 = (bool)((byte)(uVar107 >> 1) & 1);
                            auVar69._4_56_ = auVar196._8_56_;
                            auVar69._0_4_ =
                                 (uint)bVar106 * auVar196._4_4_ | (uint)!bVar106 * auVar228._4_4_;
                            auVar170._0_8_ = auVar69._0_8_ << 0x20;
                            bVar106 = (bool)((byte)(uVar107 >> 2) & 1);
                            auVar170._8_4_ =
                                 (uint)bVar106 * auVar196._8_4_ | (uint)!bVar106 * auVar228._8_4_;
                            bVar106 = (bool)((byte)(uVar107 >> 3) & 1);
                            auVar170._12_4_ =
                                 (uint)bVar106 * auVar196._12_4_ | (uint)!bVar106 * auVar228._12_4_;
                            bVar106 = (bool)((byte)(uVar107 >> 4) & 1);
                            auVar170._16_4_ =
                                 (uint)bVar106 * auVar196._16_4_ | (uint)!bVar106 * auVar228._16_4_;
                            bVar106 = (bool)((byte)(uVar107 >> 5) & 1);
                            auVar170._20_4_ =
                                 (uint)bVar106 * auVar196._20_4_ | (uint)!bVar106 * auVar228._20_4_;
                            bVar106 = (bool)((byte)(uVar107 >> 6) & 1);
                            auVar170._24_4_ =
                                 (uint)bVar106 * auVar196._24_4_ | (uint)!bVar106 * auVar228._24_4_;
                            bVar106 = (bool)((byte)(uVar107 >> 7) & 1);
                            auVar170._28_4_ =
                                 (uint)bVar106 * auVar196._28_4_ | (uint)!bVar106 * auVar228._28_4_;
                            auVar170._32_4_ =
                                 (uint)(bVar98 & 1) * auVar196._32_4_ |
                                 (uint)!(bool)(bVar98 & 1) * auVar228._32_4_;
                            bVar106 = (bool)((byte)(uVar107 >> 9) & 1);
                            auVar170._36_4_ =
                                 (uint)bVar106 * auVar196._36_4_ | (uint)!bVar106 * auVar228._36_4_;
                            bVar106 = (bool)((byte)(uVar107 >> 10) & 1);
                            auVar170._40_4_ =
                                 (uint)bVar106 * auVar196._40_4_ | (uint)!bVar106 * auVar228._40_4_;
                            bVar106 = (bool)((byte)(uVar107 >> 0xb) & 1);
                            auVar170._44_4_ =
                                 (uint)bVar106 * auVar196._44_4_ | (uint)!bVar106 * auVar228._44_4_;
                            bVar106 = (bool)((byte)(uVar107 >> 0xc) & 1);
                            auVar170._48_4_ =
                                 (uint)bVar106 * auVar196._48_4_ | (uint)!bVar106 * auVar228._48_4_;
                            bVar106 = (bool)((byte)(uVar107 >> 0xd) & 1);
                            auVar170._52_4_ =
                                 (uint)bVar106 * auVar196._52_4_ | (uint)!bVar106 * auVar228._52_4_;
                            bVar106 = (bool)((byte)(uVar107 >> 0xe) & 1);
                            auVar170._56_4_ =
                                 (uint)bVar106 * auVar196._56_4_ | (uint)!bVar106 * auVar228._56_4_;
                            bVar106 = SUB81(uVar107 >> 0xf,0);
                            auVar170._60_4_ =
                                 (uint)bVar106 * auVar196._60_4_ | (uint)!bVar106 * auVar228._60_4_;
                            auVar196 = vmovdqa32_avx512f(auVar196);
                            *(undefined1 (*) [64])(local_b70.ray + 0x500) = auVar196;
                            goto LAB_01db7b89;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x200) = fVar258;
                      }
                    }
                  }
                }
LAB_01db7b89:
                auVar124 = auVar170._32_32_;
                bVar106 = lVar105 != 0;
                lVar105 = lVar105 + -1;
              } while ((!bVar7) && (bVar106));
              auVar89._4_4_ = fStack_85c;
              auVar89._0_4_ = local_860;
              auVar89._8_4_ = fStack_858;
              auVar89._12_4_ = fStack_854;
              auVar89._16_4_ = fStack_850;
              auVar89._20_4_ = fStack_84c;
              auVar89._24_4_ = fStack_848;
              auVar89._28_4_ = fStack_844;
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar43._4_4_ = uVar1;
              auVar43._0_4_ = uVar1;
              auVar43._8_4_ = uVar1;
              auVar43._12_4_ = uVar1;
              auVar43._16_4_ = uVar1;
              auVar43._20_4_ = uVar1;
              auVar43._24_4_ = uVar1;
              auVar43._28_4_ = uVar1;
              uVar22 = vcmpps_avx512vl(auVar89,auVar43,2);
              bVar102 = ~('\x01' << ((byte)iVar25 & 0x1f)) & bVar102 & (byte)uVar22;
            } while (bVar102 != 0);
          }
          uVar24 = vpcmpd_avx512vl(local_800,_local_880,1);
          uVar23 = vpcmpd_avx512vl(local_800,local_760,1);
          auVar212._0_4_ = (float)local_940._0_4_ + (float)local_500._0_4_;
          auVar212._4_4_ = (float)local_940._4_4_ + (float)local_500._4_4_;
          auVar212._8_4_ = fStack_938 + fStack_4f8;
          auVar212._12_4_ = fStack_934 + fStack_4f4;
          auVar212._16_4_ = fStack_930 + fStack_4f0;
          auVar212._20_4_ = fStack_92c + fStack_4ec;
          auVar212._24_4_ = fStack_928 + fStack_4e8;
          auVar212._28_4_ = fStack_924 + fStack_4e4;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar227._4_4_ = uVar1;
          auVar227._0_4_ = uVar1;
          auVar227._8_4_ = uVar1;
          auVar227._12_4_ = uVar1;
          auVar227._16_4_ = uVar1;
          auVar227._20_4_ = uVar1;
          auVar227._24_4_ = uVar1;
          auVar227._28_4_ = uVar1;
          uVar22 = vcmpps_avx512vl(auVar212,auVar227,2);
          bVar100 = bVar100 & (byte)uVar23 & (byte)uVar22;
          auVar240._0_4_ = (float)local_940._0_4_ + (float)local_7a0._0_4_;
          auVar240._4_4_ = (float)local_940._4_4_ + (float)local_7a0._4_4_;
          auVar240._8_4_ = fStack_938 + fStack_798;
          auVar240._12_4_ = fStack_934 + fStack_794;
          auVar240._16_4_ = fStack_930 + fStack_790;
          auVar240._20_4_ = fStack_92c + fStack_78c;
          auVar240._24_4_ = fStack_928 + fStack_788;
          auVar240._28_4_ = fStack_924 + fStack_784;
          auVar241 = ZEXT3264(auVar240);
          uVar22 = vcmpps_avx512vl(auVar240,auVar227,2);
          bVar96 = bVar96 & (byte)uVar24 & (byte)uVar22 | bVar100;
          prim = local_ae0;
          if (bVar96 == 0) {
            auVar126 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar196 = ZEXT3264(auVar126);
          }
          else {
            uVar107 = local_ad0 & 0xffffffff;
            abStack_1a0[uVar107 * 0x60] = bVar96;
            bVar7 = (bool)(bVar100 >> 1 & 1);
            bVar106 = (bool)(bVar100 >> 2 & 1);
            bVar8 = (bool)(bVar100 >> 3 & 1);
            bVar9 = (bool)(bVar100 >> 4 & 1);
            bVar10 = (bool)(bVar100 >> 5 & 1);
            auStack_180[uVar107 * 0x18] =
                 (uint)(bVar100 & 1) * local_500._0_4_ |
                 (uint)!(bool)(bVar100 & 1) * local_7a0._0_4_;
            auStack_180[uVar107 * 0x18 + 1] =
                 (uint)bVar7 * local_500._4_4_ | (uint)!bVar7 * local_7a0._4_4_;
            auStack_180[uVar107 * 0x18 + 2] =
                 (uint)bVar106 * (int)fStack_4f8 | (uint)!bVar106 * (int)fStack_798;
            auStack_180[uVar107 * 0x18 + 3] =
                 (uint)bVar8 * (int)fStack_4f4 | (uint)!bVar8 * (int)fStack_794;
            auStack_180[uVar107 * 0x18 + 4] =
                 (uint)bVar9 * (int)fStack_4f0 | (uint)!bVar9 * (int)fStack_790;
            auStack_180[uVar107 * 0x18 + 5] =
                 (uint)bVar10 * (int)fStack_4ec | (uint)!bVar10 * (int)fStack_78c;
            auStack_180[uVar107 * 0x18 + 6] =
                 (uint)(bVar100 >> 6) * (int)fStack_4e8 |
                 (uint)!(bool)(bVar100 >> 6) * (int)fStack_788;
            (&fStack_164)[uVar107 * 0x18] = fStack_784;
            uVar22 = vmovlps_avx(local_b00);
            (&uStack_160)[uVar107 * 0xc] = uVar22;
            afStack_158[uVar107 * 0x18] = (float)((int)local_ad8 + 1);
            local_ad0 = (ulong)((int)local_ad0 + 1);
            auVar126 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar196 = ZEXT3264(auVar126);
          }
        }
      }
    }
    auVar228 = ZEXT1664(local_b00);
    local_ad0 = local_ad0 & 0xffffffff;
    do {
      if ((int)local_ad0 == 0) {
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar45._4_4_ = uVar1;
        auVar45._0_4_ = uVar1;
        auVar45._8_4_ = uVar1;
        auVar45._12_4_ = uVar1;
        auVar45._16_4_ = uVar1;
        auVar45._20_4_ = uVar1;
        auVar45._24_4_ = uVar1;
        auVar45._28_4_ = uVar1;
        uVar22 = vcmpps_avx512vl(local_740,auVar45,2);
        uVar104 = (uint)local_ac8 & (uint)uVar22;
        local_ac8 = (ulong)uVar104;
        if (uVar104 == 0) {
          return;
        }
        goto LAB_01db569f;
      }
      uVar107 = (ulong)((int)local_ad0 - 1);
      auVar126 = *(undefined1 (*) [32])(auStack_180 + uVar107 * 0x18);
      auVar213._0_4_ = auVar126._0_4_ + (float)local_940._0_4_;
      auVar213._4_4_ = auVar126._4_4_ + (float)local_940._4_4_;
      auVar213._8_4_ = auVar126._8_4_ + fStack_938;
      auVar213._12_4_ = auVar126._12_4_ + fStack_934;
      auVar213._16_4_ = auVar126._16_4_ + fStack_930;
      auVar213._20_4_ = auVar126._20_4_ + fStack_92c;
      auVar213._24_4_ = auVar126._24_4_ + fStack_928;
      auVar213._28_4_ = auVar126._28_4_ + fStack_924;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar44._4_4_ = uVar1;
      auVar44._0_4_ = uVar1;
      auVar44._8_4_ = uVar1;
      auVar44._12_4_ = uVar1;
      auVar44._16_4_ = uVar1;
      auVar44._20_4_ = uVar1;
      auVar44._24_4_ = uVar1;
      auVar44._28_4_ = uVar1;
      uVar22 = vcmpps_avx512vl(auVar213,auVar44,2);
      uVar108 = (uint)uVar22 & (uint)abStack_1a0[uVar107 * 0x60];
      bVar96 = (byte)uVar108;
      if (uVar108 != 0) {
        auVar214._8_4_ = 0x7f800000;
        auVar214._0_8_ = 0x7f8000007f800000;
        auVar214._12_4_ = 0x7f800000;
        auVar214._16_4_ = 0x7f800000;
        auVar214._20_4_ = 0x7f800000;
        auVar214._24_4_ = 0x7f800000;
        auVar214._28_4_ = 0x7f800000;
        auVar127 = vblendmps_avx512vl(auVar214,auVar126);
        auVar162._0_4_ =
             (uint)(bVar96 & 1) * auVar127._0_4_ | (uint)!(bool)(bVar96 & 1) * (int)auVar126._0_4_;
        bVar7 = (bool)((byte)(uVar108 >> 1) & 1);
        auVar162._4_4_ = (uint)bVar7 * auVar127._4_4_ | (uint)!bVar7 * (int)auVar126._4_4_;
        bVar7 = (bool)((byte)(uVar108 >> 2) & 1);
        auVar162._8_4_ = (uint)bVar7 * auVar127._8_4_ | (uint)!bVar7 * (int)auVar126._8_4_;
        bVar7 = (bool)((byte)(uVar108 >> 3) & 1);
        auVar162._12_4_ = (uint)bVar7 * auVar127._12_4_ | (uint)!bVar7 * (int)auVar126._12_4_;
        bVar7 = (bool)((byte)(uVar108 >> 4) & 1);
        auVar162._16_4_ = (uint)bVar7 * auVar127._16_4_ | (uint)!bVar7 * (int)auVar126._16_4_;
        bVar7 = (bool)((byte)(uVar108 >> 5) & 1);
        auVar162._20_4_ = (uint)bVar7 * auVar127._20_4_ | (uint)!bVar7 * (int)auVar126._20_4_;
        bVar7 = (bool)((byte)(uVar108 >> 6) & 1);
        auVar162._24_4_ = (uint)bVar7 * auVar127._24_4_ | (uint)!bVar7 * (int)auVar126._24_4_;
        auVar162._28_4_ =
             (uVar108 >> 7) * auVar127._28_4_ | (uint)!SUB41(uVar108 >> 7,0) * (int)auVar126._28_4_;
        auVar126 = vshufps_avx(auVar162,auVar162,0xb1);
        auVar126 = vminps_avx(auVar162,auVar126);
        auVar127 = vshufpd_avx(auVar126,auVar126,5);
        auVar126 = vminps_avx(auVar126,auVar127);
        auVar127 = vpermpd_avx2(auVar126,0x4e);
        auVar126 = vminps_avx(auVar126,auVar127);
        uVar22 = vcmpps_avx512vl(auVar162,auVar126,0);
        bVar102 = (byte)uVar22 & bVar96;
        if (bVar102 != 0) {
          uVar108 = (uint)bVar102;
        }
        fVar178 = afStack_158[uVar107 * 0x18 + -1];
        uVar171 = 0;
        for (; (uVar108 & 1) == 0; uVar108 = uVar108 >> 1 | 0x80000000) {
          uVar171 = uVar171 + 1;
        }
        local_ad8 = (ulong)(uint)afStack_158[uVar107 * 0x18];
        bVar102 = ~('\x01' << ((byte)uVar171 & 0x1f)) & bVar96;
        abStack_1a0[uVar107 * 0x60] = bVar102;
        uVar99 = uVar107;
        if (bVar102 != 0) {
          uVar99 = local_ad0;
        }
        fVar253 = *(float *)(&uStack_160 + uVar107 * 0xc);
        auVar215._4_4_ = fVar253;
        auVar215._0_4_ = fVar253;
        auVar215._8_4_ = fVar253;
        auVar215._12_4_ = fVar253;
        auVar215._16_4_ = fVar253;
        auVar215._20_4_ = fVar253;
        auVar215._24_4_ = fVar253;
        auVar215._28_4_ = fVar253;
        fVar178 = fVar178 - fVar253;
        auVar195._4_4_ = fVar178;
        auVar195._0_4_ = fVar178;
        auVar195._8_4_ = fVar178;
        auVar195._12_4_ = fVar178;
        auVar195._16_4_ = fVar178;
        auVar195._20_4_ = fVar178;
        auVar195._24_4_ = fVar178;
        auVar195._28_4_ = fVar178;
        auVar109 = vfmadd132ps_fma(auVar195,auVar215,_DAT_02020f20);
        auVar126 = ZEXT1632(auVar109);
        local_400[0] = (RTCHitN)auVar126[0];
        local_400[1] = (RTCHitN)auVar126[1];
        local_400[2] = (RTCHitN)auVar126[2];
        local_400[3] = (RTCHitN)auVar126[3];
        local_400[4] = (RTCHitN)auVar126[4];
        local_400[5] = (RTCHitN)auVar126[5];
        local_400[6] = (RTCHitN)auVar126[6];
        local_400[7] = (RTCHitN)auVar126[7];
        local_400[8] = (RTCHitN)auVar126[8];
        local_400[9] = (RTCHitN)auVar126[9];
        local_400[10] = (RTCHitN)auVar126[10];
        local_400[0xb] = (RTCHitN)auVar126[0xb];
        local_400[0xc] = (RTCHitN)auVar126[0xc];
        local_400[0xd] = (RTCHitN)auVar126[0xd];
        local_400[0xe] = (RTCHitN)auVar126[0xe];
        local_400[0xf] = (RTCHitN)auVar126[0xf];
        local_400[0x10] = (RTCHitN)auVar126[0x10];
        local_400[0x11] = (RTCHitN)auVar126[0x11];
        local_400[0x12] = (RTCHitN)auVar126[0x12];
        local_400[0x13] = (RTCHitN)auVar126[0x13];
        local_400[0x14] = (RTCHitN)auVar126[0x14];
        local_400[0x15] = (RTCHitN)auVar126[0x15];
        local_400[0x16] = (RTCHitN)auVar126[0x16];
        local_400[0x17] = (RTCHitN)auVar126[0x17];
        local_400[0x18] = (RTCHitN)auVar126[0x18];
        local_400[0x19] = (RTCHitN)auVar126[0x19];
        local_400[0x1a] = (RTCHitN)auVar126[0x1a];
        local_400[0x1b] = (RTCHitN)auVar126[0x1b];
        local_400[0x1c] = (RTCHitN)auVar126[0x1c];
        local_400[0x1d] = (RTCHitN)auVar126[0x1d];
        local_400[0x1e] = (RTCHitN)auVar126[0x1e];
        local_400[0x1f] = (RTCHitN)auVar126[0x1f];
        auVar228 = ZEXT864(*(ulong *)(local_400 + (ulong)uVar171 * 4));
        uVar107 = uVar99;
      }
      local_ad0 = uVar107;
    } while (bVar96 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }